

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  undefined8 uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  uint uVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [12];
  uint uVar83;
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  uint uVar87;
  long lVar88;
  byte bVar90;
  uint uVar91;
  long lVar92;
  undefined4 uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar107 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar177;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar150 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar214;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float t1;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar233;
  undefined1 auVar231 [32];
  float fVar258;
  float fVar259;
  vfloat4 a0_1;
  float fVar260;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar264;
  float fVar280;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar285;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar284;
  undefined1 auVar277 [32];
  float fVar286;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar298;
  float fVar300;
  float fVar301;
  undefined1 auVar299 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar312;
  float fVar313;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar329;
  float fVar331;
  float fVar333;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar330;
  float fVar332;
  undefined1 auVar328 [32];
  float fVar334;
  float fVar345;
  float fVar346;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar347;
  undefined1 auVar344 [32];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [64];
  float fVar376;
  float fVar385;
  float fVar386;
  vfloat4 a0;
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  float fVar387;
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  float fVar388;
  float fVar389;
  float fVar390;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  float fVar391;
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  float fVar398;
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [32];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  float fVar411;
  undefined1 auVar409 [32];
  undefined1 auVar410 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  uint auStack_4a0 [4];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  float afStack_360 [8];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar89;
  undefined1 auVar294 [32];
  undefined1 auVar405 [32];
  
  PVar16 = prim[1];
  uVar85 = (ulong)(byte)PVar16;
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 10)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 10)));
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 10)));
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xf + 6)));
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xf + 10)));
  lVar88 = uVar85 * 0x25;
  auVar299 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar16 * 0x10 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar16 * 0x10 + 10)));
  fVar285 = *(float *)(prim + lVar88 + 0x12);
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar237 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar237 = vinsertps_avx(auVar237,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar111 = vsubps_avx(auVar111,*(undefined1 (*) [16])(prim + lVar88 + 6));
  local_720._4_4_ = fVar285 * auVar111._4_4_;
  local_720._0_4_ = fVar285 * auVar111._0_4_;
  fStack_718 = fVar285 * auVar111._8_4_;
  fStack_714 = fVar285 * auVar111._12_4_;
  auVar335._0_4_ = fVar285 * auVar237._0_4_;
  auVar335._4_4_ = fVar285 * auVar237._4_4_;
  auVar335._8_4_ = fVar285 * auVar237._8_4_;
  auVar335._12_4_ = fVar285 * auVar237._12_4_;
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x11 + 6)));
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x11 + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1a + 6)));
  auVar364 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1a + 10)));
  auVar207._16_16_ = auVar316;
  auVar207._0_16_ = auVar206;
  auVar228._16_16_ = auVar33;
  auVar228._0_16_ = auVar32;
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1b + 6)));
  auVar316 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1b + 10)));
  auVar167._16_16_ = auVar152;
  auVar167._0_16_ = auVar164;
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1c + 6)));
  auVar325._16_16_ = auVar153;
  auVar325._0_16_ = auVar192;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x1c + 10)));
  auVar124 = vcvtdq2ps_avx(auVar228);
  auVar24 = vcvtdq2ps_avx(auVar167);
  auVar168._16_16_ = auVar34;
  auVar168._0_16_ = auVar299;
  auVar25 = vcvtdq2ps_avx(auVar168);
  auVar169._16_16_ = auVar237;
  auVar169._0_16_ = auVar111;
  auVar26 = vcvtdq2ps_avx(auVar169);
  auVar229._16_16_ = auVar364;
  auVar229._0_16_ = auVar35;
  auVar254._16_16_ = auVar316;
  auVar254._0_16_ = auVar206;
  auVar122._16_16_ = auVar33;
  auVar122._0_16_ = auVar32;
  auVar111 = vshufps_avx(auVar335,auVar335,0x55);
  auVar237 = vshufps_avx(auVar335,auVar335,0xaa);
  fVar259 = auVar237._0_4_;
  fVar279 = auVar237._4_4_;
  fVar296 = auVar237._8_4_;
  fVar137 = auVar237._12_4_;
  fVar258 = auVar111._0_4_;
  fVar278 = auVar111._4_4_;
  fVar295 = auVar111._8_4_;
  fVar214 = auVar111._12_4_;
  auVar27 = vcvtdq2ps_avx(auVar207);
  auVar28 = vcvtdq2ps_avx(auVar325);
  auVar29 = vcvtdq2ps_avx(auVar229);
  auVar30 = vcvtdq2ps_avx(auVar254);
  auVar31 = vcvtdq2ps_avx(auVar122);
  auVar111 = vshufps_avx(auVar335,auVar335,0);
  fVar285 = auVar111._0_4_;
  fVar264 = auVar111._4_4_;
  fVar286 = auVar111._8_4_;
  fVar177 = auVar111._12_4_;
  auVar396._0_4_ = fVar285 * auVar27._0_4_ + fVar258 * auVar124._0_4_ + fVar259 * auVar24._0_4_;
  auVar396._4_4_ = fVar264 * auVar27._4_4_ + fVar278 * auVar124._4_4_ + fVar279 * auVar24._4_4_;
  auVar396._8_4_ = fVar286 * auVar27._8_4_ + fVar295 * auVar124._8_4_ + fVar296 * auVar24._8_4_;
  auVar396._12_4_ = fVar177 * auVar27._12_4_ + fVar214 * auVar124._12_4_ + fVar137 * auVar24._12_4_;
  auVar396._16_4_ = fVar285 * auVar27._16_4_ + fVar258 * auVar124._16_4_ + fVar259 * auVar24._16_4_;
  auVar396._20_4_ = fVar264 * auVar27._20_4_ + fVar278 * auVar124._20_4_ + fVar279 * auVar24._20_4_;
  auVar396._24_4_ = fVar286 * auVar27._24_4_ + fVar295 * auVar124._24_4_ + fVar296 * auVar24._24_4_;
  auVar396._28_4_ = fVar214 + 0.0;
  auVar383._0_4_ = fVar285 * auVar28._0_4_ + fVar258 * auVar25._0_4_ + fVar259 * auVar26._0_4_;
  auVar383._4_4_ = fVar264 * auVar28._4_4_ + fVar278 * auVar25._4_4_ + fVar279 * auVar26._4_4_;
  auVar383._8_4_ = fVar286 * auVar28._8_4_ + fVar295 * auVar25._8_4_ + fVar296 * auVar26._8_4_;
  auVar383._12_4_ = fVar177 * auVar28._12_4_ + fVar214 * auVar25._12_4_ + fVar137 * auVar26._12_4_;
  auVar383._16_4_ = fVar285 * auVar28._16_4_ + fVar258 * auVar25._16_4_ + fVar259 * auVar26._16_4_;
  auVar383._20_4_ = fVar264 * auVar28._20_4_ + fVar278 * auVar25._20_4_ + fVar279 * auVar26._20_4_;
  auVar383._24_4_ = fVar286 * auVar28._24_4_ + fVar295 * auVar25._24_4_ + fVar296 * auVar26._24_4_;
  auVar383._28_4_ = fVar214 + 0.0;
  auVar255._0_4_ = fVar258 * auVar30._0_4_ + fVar259 * auVar31._0_4_ + fVar285 * auVar29._0_4_;
  auVar255._4_4_ = fVar278 * auVar30._4_4_ + fVar279 * auVar31._4_4_ + fVar264 * auVar29._4_4_;
  auVar255._8_4_ = fVar295 * auVar30._8_4_ + fVar296 * auVar31._8_4_ + fVar286 * auVar29._8_4_;
  auVar255._12_4_ = fVar214 * auVar30._12_4_ + fVar137 * auVar31._12_4_ + fVar177 * auVar29._12_4_;
  auVar255._16_4_ = fVar258 * auVar30._16_4_ + fVar259 * auVar31._16_4_ + fVar285 * auVar29._16_4_;
  auVar255._20_4_ = fVar278 * auVar30._20_4_ + fVar279 * auVar31._20_4_ + fVar264 * auVar29._20_4_;
  auVar255._24_4_ = fVar295 * auVar30._24_4_ + fVar296 * auVar31._24_4_ + fVar286 * auVar29._24_4_;
  auVar255._28_4_ = fVar214 + 0.0 + fVar177;
  auVar111 = vshufps_avx(_local_720,_local_720,0x55);
  auVar237 = vshufps_avx(_local_720,_local_720,0xaa);
  fVar264 = auVar237._0_4_;
  fVar286 = auVar237._4_4_;
  fVar177 = auVar237._8_4_;
  fVar258 = auVar237._12_4_;
  fVar278 = auVar111._0_4_;
  fVar214 = auVar111._4_4_;
  fVar279 = auVar111._8_4_;
  fVar137 = auVar111._12_4_;
  fVar285 = auVar124._28_4_ + auVar24._28_4_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar111 = vpmovsxwd_avx(auVar111);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + uVar85 * 7 + 0xe);
  auVar237 = vpmovsxwd_avx(auVar237);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar206 = vpmovsxwd_avx(auVar206);
  auVar316._8_8_ = 0;
  auVar316._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 0xe);
  auVar316 = vpmovsxwd_avx(auVar316);
  auVar32 = vshufps_avx(_local_720,_local_720,0);
  fVar295 = auVar32._0_4_;
  fVar259 = auVar32._4_4_;
  fVar296 = auVar32._8_4_;
  fVar260 = auVar32._12_4_;
  auVar208._0_4_ = fVar295 * auVar27._0_4_ + fVar278 * auVar124._0_4_ + fVar264 * auVar24._0_4_;
  auVar208._4_4_ = fVar259 * auVar27._4_4_ + fVar214 * auVar124._4_4_ + fVar286 * auVar24._4_4_;
  auVar208._8_4_ = fVar296 * auVar27._8_4_ + fVar279 * auVar124._8_4_ + fVar177 * auVar24._8_4_;
  auVar208._12_4_ = fVar260 * auVar27._12_4_ + fVar137 * auVar124._12_4_ + fVar258 * auVar24._12_4_;
  auVar208._16_4_ = fVar295 * auVar27._16_4_ + fVar278 * auVar124._16_4_ + fVar264 * auVar24._16_4_;
  auVar208._20_4_ = fVar259 * auVar27._20_4_ + fVar214 * auVar124._20_4_ + fVar286 * auVar24._20_4_;
  auVar208._24_4_ = fVar296 * auVar27._24_4_ + fVar279 * auVar124._24_4_ + fVar177 * auVar24._24_4_;
  auVar208._28_4_ = auVar27._28_4_ + fVar285;
  auVar409._0_4_ = fVar278 * auVar25._0_4_ + fVar264 * auVar26._0_4_ + fVar295 * auVar28._0_4_;
  auVar409._4_4_ = fVar214 * auVar25._4_4_ + fVar286 * auVar26._4_4_ + fVar259 * auVar28._4_4_;
  auVar409._8_4_ = fVar279 * auVar25._8_4_ + fVar177 * auVar26._8_4_ + fVar296 * auVar28._8_4_;
  auVar409._12_4_ = fVar137 * auVar25._12_4_ + fVar258 * auVar26._12_4_ + fVar260 * auVar28._12_4_;
  auVar409._16_4_ = fVar278 * auVar25._16_4_ + fVar264 * auVar26._16_4_ + fVar295 * auVar28._16_4_;
  auVar409._20_4_ = fVar214 * auVar25._20_4_ + fVar286 * auVar26._20_4_ + fVar259 * auVar28._20_4_;
  auVar409._24_4_ = fVar279 * auVar25._24_4_ + fVar177 * auVar26._24_4_ + fVar296 * auVar28._24_4_;
  auVar409._28_4_ = auVar25._28_4_ + auVar26._28_4_ + fVar285;
  auVar275._8_4_ = 0x7fffffff;
  auVar275._0_8_ = 0x7fffffff7fffffff;
  auVar275._12_4_ = 0x7fffffff;
  auVar275._16_4_ = 0x7fffffff;
  auVar275._20_4_ = 0x7fffffff;
  auVar275._24_4_ = 0x7fffffff;
  auVar275._28_4_ = 0x7fffffff;
  auVar124 = vandps_avx(auVar396,auVar275);
  auVar326._8_4_ = 0x219392ef;
  auVar326._0_8_ = 0x219392ef219392ef;
  auVar326._12_4_ = 0x219392ef;
  auVar326._16_4_ = 0x219392ef;
  auVar326._20_4_ = 0x219392ef;
  auVar326._24_4_ = 0x219392ef;
  auVar326._28_4_ = 0x219392ef;
  auVar124 = vcmpps_avx(auVar124,auVar326,1);
  auVar24 = vblendvps_avx(auVar396,auVar326,auVar124);
  auVar124 = vandps_avx(auVar383,auVar275);
  auVar124 = vcmpps_avx(auVar124,auVar326,1);
  auVar25 = vblendvps_avx(auVar383,auVar326,auVar124);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar32 = vpmovsxwd_avx(auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar85 * 9 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar124 = vandps_avx(auVar255,auVar275);
  auVar124 = vcmpps_avx(auVar124,auVar326,1);
  auVar124 = vblendvps_avx(auVar255,auVar326,auVar124);
  auVar230._0_4_ = fVar295 * auVar29._0_4_ + fVar278 * auVar30._0_4_ + fVar264 * auVar31._0_4_;
  auVar230._4_4_ = fVar259 * auVar29._4_4_ + fVar214 * auVar30._4_4_ + fVar286 * auVar31._4_4_;
  auVar230._8_4_ = fVar296 * auVar29._8_4_ + fVar279 * auVar30._8_4_ + fVar177 * auVar31._8_4_;
  auVar230._12_4_ = fVar260 * auVar29._12_4_ + fVar137 * auVar30._12_4_ + fVar258 * auVar31._12_4_;
  auVar230._16_4_ = fVar295 * auVar29._16_4_ + fVar278 * auVar30._16_4_ + fVar264 * auVar31._16_4_;
  auVar230._20_4_ = fVar259 * auVar29._20_4_ + fVar214 * auVar30._20_4_ + fVar286 * auVar31._20_4_;
  auVar230._24_4_ = fVar296 * auVar29._24_4_ + fVar279 * auVar30._24_4_ + fVar177 * auVar31._24_4_;
  auVar230._28_4_ = auVar29._28_4_ + auVar30._28_4_ + auVar31._28_4_;
  auVar26 = vrcpps_avx(auVar24);
  fVar285 = auVar26._0_4_;
  fVar258 = auVar26._4_4_;
  auVar27._4_4_ = auVar24._4_4_ * fVar258;
  auVar27._0_4_ = auVar24._0_4_ * fVar285;
  fVar259 = auVar26._8_4_;
  auVar27._8_4_ = auVar24._8_4_ * fVar259;
  fVar260 = auVar26._12_4_;
  auVar27._12_4_ = auVar24._12_4_ * fVar260;
  fVar261 = auVar26._16_4_;
  auVar27._16_4_ = auVar24._16_4_ * fVar261;
  fVar262 = auVar26._20_4_;
  auVar27._20_4_ = auVar24._20_4_ * fVar262;
  fVar263 = auVar26._24_4_;
  auVar27._24_4_ = auVar24._24_4_ * fVar263;
  auVar27._28_4_ = auVar255._28_4_;
  auVar170._8_4_ = 0x3f800000;
  auVar170._0_8_ = 0x3f8000003f800000;
  auVar170._12_4_ = 0x3f800000;
  auVar170._16_4_ = 0x3f800000;
  auVar170._20_4_ = 0x3f800000;
  auVar170._24_4_ = 0x3f800000;
  auVar170._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar170,auVar27);
  auVar27 = vrcpps_avx(auVar25);
  fVar285 = fVar285 + fVar285 * auVar28._0_4_;
  fVar258 = fVar258 + fVar258 * auVar28._4_4_;
  fVar259 = fVar259 + fVar259 * auVar28._8_4_;
  fVar260 = fVar260 + fVar260 * auVar28._12_4_;
  fVar261 = fVar261 + fVar261 * auVar28._16_4_;
  fVar262 = fVar262 + fVar262 * auVar28._20_4_;
  fVar263 = fVar263 + fVar263 * auVar28._24_4_;
  fVar264 = auVar27._0_4_;
  fVar278 = auVar27._4_4_;
  auVar29._4_4_ = auVar25._4_4_ * fVar278;
  auVar29._0_4_ = auVar25._0_4_ * fVar264;
  fVar279 = auVar27._8_4_;
  auVar29._8_4_ = auVar25._8_4_ * fVar279;
  fVar280 = auVar27._12_4_;
  auVar29._12_4_ = auVar25._12_4_ * fVar280;
  fVar281 = auVar27._16_4_;
  auVar29._16_4_ = auVar25._16_4_ * fVar281;
  fVar282 = auVar27._20_4_;
  auVar29._20_4_ = auVar25._20_4_ * fVar282;
  fVar283 = auVar27._24_4_;
  auVar29._24_4_ = auVar25._24_4_ * fVar283;
  auVar29._28_4_ = auVar26._28_4_;
  auVar29 = vsubps_avx(auVar170,auVar29);
  fVar264 = fVar264 + fVar264 * auVar29._0_4_;
  fVar278 = fVar278 + fVar278 * auVar29._4_4_;
  fVar279 = fVar279 + fVar279 * auVar29._8_4_;
  fVar280 = fVar280 + fVar280 * auVar29._12_4_;
  fVar281 = fVar281 + fVar281 * auVar29._16_4_;
  fVar282 = fVar282 + fVar282 * auVar29._20_4_;
  fVar283 = fVar283 + fVar283 * auVar29._24_4_;
  auVar25 = vrcpps_avx(auVar124);
  fVar286 = auVar25._0_4_;
  fVar295 = auVar25._4_4_;
  auVar30._4_4_ = auVar124._4_4_ * fVar295;
  auVar30._0_4_ = auVar124._0_4_ * fVar286;
  fVar296 = auVar25._8_4_;
  auVar30._8_4_ = auVar124._8_4_ * fVar296;
  fVar297 = auVar25._12_4_;
  auVar30._12_4_ = auVar124._12_4_ * fVar297;
  fVar298 = auVar25._16_4_;
  auVar30._16_4_ = auVar124._16_4_ * fVar298;
  fVar300 = auVar25._20_4_;
  auVar30._20_4_ = auVar124._20_4_ * fVar300;
  fVar301 = auVar25._24_4_;
  auVar30._24_4_ = auVar124._24_4_ * fVar301;
  auVar30._28_4_ = auVar24._28_4_;
  auVar124 = vsubps_avx(auVar170,auVar30);
  fVar286 = fVar286 + fVar286 * auVar124._0_4_;
  fVar295 = fVar295 + fVar295 * auVar124._4_4_;
  fVar296 = fVar296 + fVar296 * auVar124._8_4_;
  fVar297 = fVar297 + fVar297 * auVar124._12_4_;
  fVar298 = fVar298 + fVar298 * auVar124._16_4_;
  fVar300 = fVar300 + fVar300 * auVar124._20_4_;
  fVar301 = fVar301 + fVar301 * auVar124._24_4_;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar85 * 0xd + 6);
  auVar164 = vpmovsxwd_avx(auVar164);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar85 * 0xd + 0xe);
  auVar152 = vpmovsxwd_avx(auVar152);
  auVar309._16_16_ = auVar237;
  auVar309._0_16_ = auVar111;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar85 * 0x12 + 6);
  auVar111 = vpmovsxwd_avx(auVar192);
  auVar356._16_16_ = auVar316;
  auVar356._0_16_ = auVar206;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = *(ulong *)(prim + uVar85 * 0x12 + 0xe);
  auVar237 = vpmovsxwd_avx(auVar153);
  auVar206 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                          *(float *)(prim + lVar88 + 0x16)) *
                                         *(float *)(prim + lVar88 + 0x1a))),0);
  auVar124 = vcvtdq2ps_avx(auVar309);
  auVar24 = vcvtdq2ps_avx(auVar356);
  auVar24 = vsubps_avx(auVar24,auVar124);
  fVar177 = auVar206._0_4_;
  fVar214 = auVar206._4_4_;
  fVar137 = auVar206._8_4_;
  fVar232 = auVar206._12_4_;
  auVar310._0_4_ = auVar24._0_4_ * fVar177 + auVar124._0_4_;
  auVar310._4_4_ = auVar24._4_4_ * fVar214 + auVar124._4_4_;
  auVar310._8_4_ = auVar24._8_4_ * fVar137 + auVar124._8_4_;
  auVar310._12_4_ = auVar24._12_4_ * fVar232 + auVar124._12_4_;
  auVar310._16_4_ = auVar24._16_4_ * fVar177 + auVar124._16_4_;
  auVar310._20_4_ = auVar24._20_4_ * fVar214 + auVar124._20_4_;
  auVar310._24_4_ = auVar24._24_4_ * fVar137 + auVar124._24_4_;
  auVar310._28_4_ = auVar24._28_4_ + auVar124._28_4_;
  auVar357._16_16_ = auVar33;
  auVar357._0_16_ = auVar32;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = *(ulong *)(prim + uVar85 * 0x16 + 6);
  auVar206 = vpmovsxwd_avx(auVar299);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar85 * 0x16 + 0xe);
  auVar316 = vpmovsxwd_avx(auVar34);
  auVar124 = vcvtdq2ps_avx(auVar357);
  auVar123._16_16_ = auVar152;
  auVar123._0_16_ = auVar164;
  auVar24 = vcvtdq2ps_avx(auVar123);
  auVar24 = vsubps_avx(auVar24,auVar124);
  auVar327._0_4_ = auVar124._0_4_ + fVar177 * auVar24._0_4_;
  auVar327._4_4_ = auVar124._4_4_ + fVar214 * auVar24._4_4_;
  auVar327._8_4_ = auVar124._8_4_ + fVar137 * auVar24._8_4_;
  auVar327._12_4_ = auVar124._12_4_ + fVar232 * auVar24._12_4_;
  auVar327._16_4_ = auVar124._16_4_ + fVar177 * auVar24._16_4_;
  auVar327._20_4_ = auVar124._20_4_ + fVar214 * auVar24._20_4_;
  auVar327._24_4_ = auVar124._24_4_ + fVar137 * auVar24._24_4_;
  auVar327._28_4_ = auVar124._28_4_ + auVar24._28_4_;
  auVar124._16_16_ = auVar237;
  auVar124._0_16_ = auVar111;
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar341._16_16_ = auVar316;
  auVar341._0_16_ = auVar206;
  auVar24 = vcvtdq2ps_avx(auVar341);
  auVar24 = vsubps_avx(auVar24,auVar124);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar85 * 0x14 + 6);
  auVar111 = vpmovsxwd_avx(auVar35);
  auVar364._8_8_ = 0;
  auVar364._0_8_ = *(ulong *)(prim + uVar85 * 0x14 + 0xe);
  auVar237 = vpmovsxwd_avx(auVar364);
  auVar342._0_4_ = auVar24._0_4_ * fVar177 + auVar124._0_4_;
  auVar342._4_4_ = auVar24._4_4_ * fVar214 + auVar124._4_4_;
  auVar342._8_4_ = auVar24._8_4_ * fVar137 + auVar124._8_4_;
  auVar342._12_4_ = auVar24._12_4_ * fVar232 + auVar124._12_4_;
  auVar342._16_4_ = auVar24._16_4_ * fVar177 + auVar124._16_4_;
  auVar342._20_4_ = auVar24._20_4_ * fVar214 + auVar124._20_4_;
  auVar342._24_4_ = auVar24._24_4_ * fVar137 + auVar124._24_4_;
  auVar342._28_4_ = auVar24._28_4_ + auVar124._28_4_;
  auVar125._16_16_ = auVar237;
  auVar125._0_16_ = auVar111;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar85 * 0x18 + 6);
  auVar111 = vpmovsxwd_avx(auVar241);
  auVar124 = vcvtdq2ps_avx(auVar125);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar85 * 0x18 + 0xe);
  auVar237 = vpmovsxwd_avx(auVar7);
  auVar358._16_16_ = auVar237;
  auVar358._0_16_ = auVar111;
  auVar24 = vcvtdq2ps_avx(auVar358);
  auVar24 = vsubps_avx(auVar24,auVar124);
  auVar126._0_4_ = auVar24._0_4_ * fVar177 + auVar124._0_4_;
  auVar126._4_4_ = auVar24._4_4_ * fVar214 + auVar124._4_4_;
  auVar126._8_4_ = auVar24._8_4_ * fVar137 + auVar124._8_4_;
  auVar126._12_4_ = auVar24._12_4_ * fVar232 + auVar124._12_4_;
  auVar126._16_4_ = auVar24._16_4_ * fVar177 + auVar124._16_4_;
  auVar126._20_4_ = auVar24._20_4_ * fVar214 + auVar124._20_4_;
  auVar126._24_4_ = auVar24._24_4_ * fVar137 + auVar124._24_4_;
  auVar126._28_4_ = auVar24._28_4_ + auVar124._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar85 * 0x1d + 6);
  auVar111 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar85 * 0x1d + 0xe);
  auVar237 = vpmovsxwd_avx(auVar9);
  auVar359._16_16_ = auVar237;
  auVar359._0_16_ = auVar111;
  auVar124 = vcvtdq2ps_avx(auVar359);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar85 * 0x21 + 6);
  auVar111 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar85 * 0x21 + 0xe);
  auVar237 = vpmovsxwd_avx(auVar11);
  auVar370._16_16_ = auVar237;
  auVar370._0_16_ = auVar111;
  auVar24 = vcvtdq2ps_avx(auVar370);
  auVar24 = vsubps_avx(auVar24,auVar124);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar85 * 0x1f + 6);
  auVar111 = vpmovsxwd_avx(auVar12);
  auVar360._0_4_ = auVar124._0_4_ + auVar24._0_4_ * fVar177;
  auVar360._4_4_ = auVar124._4_4_ + auVar24._4_4_ * fVar214;
  auVar360._8_4_ = auVar124._8_4_ + auVar24._8_4_ * fVar137;
  auVar360._12_4_ = auVar124._12_4_ + auVar24._12_4_ * fVar232;
  auVar360._16_4_ = auVar124._16_4_ + auVar24._16_4_ * fVar177;
  auVar360._20_4_ = auVar124._20_4_ + auVar24._20_4_ * fVar214;
  auVar360._24_4_ = auVar124._24_4_ + auVar24._24_4_ * fVar137;
  auVar360._28_4_ = auVar124._28_4_ + auVar24._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar85 * 0x1f + 0xe);
  auVar237 = vpmovsxwd_avx(auVar13);
  auVar371._16_16_ = auVar237;
  auVar371._0_16_ = auVar111;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar85 * 0x23 + 6);
  auVar111 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar85 * 0x23 + 0xe);
  auVar237 = vpmovsxwd_avx(auVar15);
  auVar124 = vcvtdq2ps_avx(auVar371);
  auVar384._16_16_ = auVar237;
  auVar384._0_16_ = auVar111;
  auVar24 = vcvtdq2ps_avx(auVar384);
  auVar24 = vsubps_avx(auVar24,auVar124);
  auVar372._0_4_ = auVar124._0_4_ + auVar24._0_4_ * fVar177;
  auVar372._4_4_ = auVar124._4_4_ + auVar24._4_4_ * fVar214;
  auVar372._8_4_ = auVar124._8_4_ + auVar24._8_4_ * fVar137;
  auVar372._12_4_ = auVar124._12_4_ + auVar24._12_4_ * fVar232;
  auVar372._16_4_ = auVar124._16_4_ + auVar24._16_4_ * fVar177;
  auVar372._20_4_ = auVar124._20_4_ + auVar24._20_4_ * fVar214;
  auVar372._24_4_ = auVar124._24_4_ + auVar24._24_4_ * fVar137;
  auVar372._28_4_ = auVar124._28_4_ + fVar232;
  auVar124 = vsubps_avx(auVar310,auVar208);
  auVar141._0_4_ = fVar285 * auVar124._0_4_;
  auVar141._4_4_ = fVar258 * auVar124._4_4_;
  auVar141._8_4_ = fVar259 * auVar124._8_4_;
  auVar141._12_4_ = fVar260 * auVar124._12_4_;
  auVar25._16_4_ = fVar261 * auVar124._16_4_;
  auVar25._0_16_ = auVar141;
  auVar25._20_4_ = fVar262 * auVar124._20_4_;
  auVar25._24_4_ = fVar263 * auVar124._24_4_;
  auVar25._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar327,auVar208);
  auVar234._0_4_ = fVar285 * auVar124._0_4_;
  auVar234._4_4_ = fVar258 * auVar124._4_4_;
  auVar234._8_4_ = fVar259 * auVar124._8_4_;
  auVar234._12_4_ = fVar260 * auVar124._12_4_;
  auVar31._16_4_ = fVar261 * auVar124._16_4_;
  auVar31._0_16_ = auVar234;
  auVar31._20_4_ = fVar262 * auVar124._20_4_;
  auVar31._24_4_ = fVar263 * auVar124._24_4_;
  auVar31._28_4_ = auVar26._28_4_ + auVar28._28_4_;
  auVar124 = vsubps_avx(auVar342,auVar409);
  auVar178._0_4_ = fVar264 * auVar124._0_4_;
  auVar178._4_4_ = fVar278 * auVar124._4_4_;
  auVar178._8_4_ = fVar279 * auVar124._8_4_;
  auVar178._12_4_ = fVar280 * auVar124._12_4_;
  auVar26._16_4_ = fVar281 * auVar124._16_4_;
  auVar26._0_16_ = auVar178;
  auVar26._20_4_ = fVar282 * auVar124._20_4_;
  auVar26._24_4_ = fVar283 * auVar124._24_4_;
  auVar26._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar126,auVar409);
  auVar265._0_4_ = fVar264 * auVar124._0_4_;
  auVar265._4_4_ = fVar278 * auVar124._4_4_;
  auVar265._8_4_ = fVar279 * auVar124._8_4_;
  auVar265._12_4_ = fVar280 * auVar124._12_4_;
  auVar28._16_4_ = fVar281 * auVar124._16_4_;
  auVar28._0_16_ = auVar265;
  auVar28._20_4_ = fVar282 * auVar124._20_4_;
  auVar28._24_4_ = fVar283 * auVar124._24_4_;
  auVar28._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar124 = vsubps_avx(auVar360,auVar230);
  auVar94._0_4_ = fVar286 * auVar124._0_4_;
  auVar94._4_4_ = fVar295 * auVar124._4_4_;
  auVar94._8_4_ = fVar296 * auVar124._8_4_;
  auVar94._12_4_ = fVar297 * auVar124._12_4_;
  auVar36._16_4_ = fVar298 * auVar124._16_4_;
  auVar36._0_16_ = auVar94;
  auVar36._20_4_ = fVar300 * auVar124._20_4_;
  auVar36._24_4_ = fVar301 * auVar124._24_4_;
  auVar36._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar372,auVar230);
  auVar215._0_4_ = fVar286 * auVar124._0_4_;
  auVar215._4_4_ = fVar295 * auVar124._4_4_;
  auVar215._8_4_ = fVar296 * auVar124._8_4_;
  auVar215._12_4_ = fVar297 * auVar124._12_4_;
  auVar37._16_4_ = fVar298 * auVar124._16_4_;
  auVar37._0_16_ = auVar215;
  auVar37._20_4_ = fVar300 * auVar124._20_4_;
  auVar37._24_4_ = fVar301 * auVar124._24_4_;
  auVar37._28_4_ = auVar124._28_4_;
  auVar111 = vpminsd_avx(auVar25._16_16_,auVar31._16_16_);
  auVar237 = vpminsd_avx(auVar141,auVar234);
  auVar361._16_16_ = auVar111;
  auVar361._0_16_ = auVar237;
  auVar111 = vpminsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar237 = vpminsd_avx(auVar178,auVar265);
  auVar373._16_16_ = auVar111;
  auVar373._0_16_ = auVar237;
  auVar124 = vmaxps_avx(auVar361,auVar373);
  auVar111 = vpminsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar237 = vpminsd_avx(auVar94,auVar215);
  auVar397._16_16_ = auVar111;
  auVar397._0_16_ = auVar237;
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar404._4_4_ = uVar93;
  auVar404._0_4_ = uVar93;
  auVar404._8_4_ = uVar93;
  auVar404._12_4_ = uVar93;
  auVar404._16_4_ = uVar93;
  auVar404._20_4_ = uVar93;
  auVar404._24_4_ = uVar93;
  auVar404._28_4_ = uVar93;
  auVar24 = vmaxps_avx(auVar397,auVar404);
  auVar124 = vmaxps_avx(auVar124,auVar24);
  local_300._4_4_ = auVar124._4_4_ * 0.99999964;
  local_300._0_4_ = auVar124._0_4_ * 0.99999964;
  local_300._8_4_ = auVar124._8_4_ * 0.99999964;
  local_300._12_4_ = auVar124._12_4_ * 0.99999964;
  local_300._16_4_ = auVar124._16_4_ * 0.99999964;
  local_300._20_4_ = auVar124._20_4_ * 0.99999964;
  local_300._24_4_ = auVar124._24_4_ * 0.99999964;
  local_300._28_4_ = auVar124._28_4_;
  auVar111 = vpmaxsd_avx(auVar25._16_16_,auVar31._16_16_);
  auVar237 = vpmaxsd_avx(auVar141,auVar234);
  auVar171._16_16_ = auVar111;
  auVar171._0_16_ = auVar237;
  auVar111 = vpmaxsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar237 = vpmaxsd_avx(auVar178,auVar265);
  auVar209._16_16_ = auVar111;
  auVar209._0_16_ = auVar237;
  auVar124 = vminps_avx(auVar171,auVar209);
  auVar111 = vpmaxsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar237 = vpmaxsd_avx(auVar94,auVar215);
  auVar127._16_16_ = auVar111;
  auVar127._0_16_ = auVar237;
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar210._4_4_ = uVar93;
  auVar210._0_4_ = uVar93;
  auVar210._8_4_ = uVar93;
  auVar210._12_4_ = uVar93;
  auVar210._16_4_ = uVar93;
  auVar210._20_4_ = uVar93;
  auVar210._24_4_ = uVar93;
  auVar210._28_4_ = uVar93;
  auVar24 = vminps_avx(auVar127,auVar210);
  auVar124 = vminps_avx(auVar124,auVar24);
  auVar24._4_4_ = auVar124._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar124._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar124._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar124._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar124._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar124._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar124._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar124._28_4_;
  auVar124 = vcmpps_avx(local_300,auVar24,2);
  auVar111 = vpshufd_avx(ZEXT116((byte)PVar16),0);
  auVar172._16_16_ = auVar111;
  auVar172._0_16_ = auVar111;
  auVar24 = vcvtdq2ps_avx(auVar172);
  auVar24 = vcmpps_avx(_DAT_01f7b060,auVar24,1);
  auVar124 = vandps_avx(auVar124,auVar24);
  uVar93 = vmovmskps_avx(auVar124);
  uVar85 = CONCAT44((int)((ulong)prim >> 0x20),uVar93);
  auVar128._16_16_ = mm_lookupmask_ps._240_16_;
  auVar128._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar128,ZEXT832(0) << 0x20,0x80);
  uVar91 = 1 << ((byte)k & 0x1f);
  auVar111 = (undefined1  [16])0x0;
LAB_00af5627:
  if (uVar85 == 0) {
    return;
  }
  lVar88 = 0;
  if (uVar85 != 0) {
    for (; (uVar85 >> lVar88 & 1) == 0; lVar88 = lVar88 + 1) {
    }
  }
  uVar84 = *(uint *)(prim + 2);
  pGVar18 = (context->scene->geometries).items[uVar84].ptr;
  fVar285 = (pGVar18->time_range).lower;
  fVar285 = pGVar18->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar285) / ((pGVar18->time_range).upper - fVar285));
  auVar237 = vroundss_avx(ZEXT416((uint)fVar285),ZEXT416((uint)fVar285),9);
  auVar237 = vminss_avx(auVar237,ZEXT416((uint)(pGVar18->fnumTimeSegments + -1.0)));
  auVar111 = vmaxss_avx(auVar111,auVar237);
  uVar17 = *(uint *)(prim + lVar88 * 4 + 6);
  uVar86 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                           (ulong)uVar17 *
                           pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar92 = (long)(int)auVar111._0_4_ * 0x38;
  lVar20 = *(long *)(_Var19 + lVar92);
  lVar21 = *(long *)(_Var19 + 0x10 + lVar92);
  pfVar3 = (float *)(lVar20 + lVar21 * uVar86);
  fVar264 = *pfVar3;
  fVar286 = pfVar3[1];
  fVar177 = pfVar3[2];
  fVar258 = pfVar3[3];
  lVar88 = uVar86 + 1;
  pfVar3 = (float *)(lVar20 + lVar21 * lVar88);
  fVar278 = *pfVar3;
  fVar295 = pfVar3[1];
  fVar214 = pfVar3[2];
  fVar259 = pfVar3[3];
  lVar1 = uVar86 + 2;
  pfVar3 = (float *)(lVar20 + lVar21 * lVar1);
  fVar279 = *pfVar3;
  fVar296 = pfVar3[1];
  fVar137 = pfVar3[2];
  fVar260 = pfVar3[3];
  lVar2 = uVar86 + 3;
  pfVar3 = (float *)(lVar20 + lVar21 * lVar2);
  fVar280 = *pfVar3;
  fVar297 = pfVar3[1];
  fVar232 = pfVar3[2];
  fVar261 = pfVar3[3];
  lVar20 = *(long *)&pGVar18[4].fnumTimeSegments;
  lVar21 = *(long *)(lVar20 + lVar92);
  lVar22 = *(long *)(lVar20 + 0x10 + lVar92);
  pfVar3 = (float *)(lVar21 + lVar22 * uVar86);
  fVar281 = *pfVar3;
  fVar298 = pfVar3[1];
  fVar262 = pfVar3[2];
  fVar282 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar88);
  fVar300 = *pfVar3;
  fVar263 = pfVar3[1];
  fVar283 = pfVar3[2];
  fVar301 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar1);
  fVar138 = *pfVar3;
  fVar139 = pfVar3[1];
  fVar140 = pfVar3[2];
  fVar233 = pfVar3[3];
  fVar285 = fVar285 - auVar111._0_4_;
  pfVar3 = (float *)(lVar21 + lVar22 * lVar2);
  fVar284 = *pfVar3;
  fVar312 = pfVar3[1];
  fVar313 = pfVar3[2];
  fVar329 = pfVar3[3];
  local_720._0_4_ =
       fVar264 * 0.16666667 + fVar278 * 0.6666667 + fVar279 * 0.16666667 + fVar280 * 0.0;
  local_720._4_4_ =
       fVar286 * 0.16666667 + fVar295 * 0.6666667 + fVar296 * 0.16666667 + fVar297 * 0.0;
  fStack_718 = fVar177 * 0.16666667 + fVar214 * 0.6666667 + fVar137 * 0.16666667 + fVar232 * 0.0;
  fStack_714 = fVar258 * 0.16666667 + fVar259 * 0.6666667 + fVar260 * 0.16666667 + fVar261 * 0.0;
  auVar95._0_4_ = fVar279 * 0.5 + fVar280 * 0.0;
  auVar95._4_4_ = fVar296 * 0.5 + fVar297 * 0.0;
  auVar95._8_4_ = fVar137 * 0.5 + fVar232 * 0.0;
  auVar95._12_4_ = fVar260 * 0.5 + fVar261 * 0.0;
  auVar179._0_4_ = fVar278 * 0.0;
  auVar179._4_4_ = fVar295 * 0.0;
  auVar179._8_4_ = fVar214 * 0.0;
  auVar179._12_4_ = fVar259 * 0.0;
  auVar111 = vsubps_avx(auVar95,auVar179);
  auVar180._0_4_ = fVar264 * 0.5;
  auVar180._4_4_ = fVar286 * 0.5;
  auVar180._8_4_ = fVar177 * 0.5;
  auVar180._12_4_ = fVar258 * 0.5;
  auVar152 = vsubps_avx(auVar111,auVar180);
  auVar96._0_4_ = fVar281 * 0.16666667 + fVar300 * 0.6666667 + fVar138 * 0.16666667 + fVar284 * 0.0;
  auVar96._4_4_ = fVar298 * 0.16666667 + fVar263 * 0.6666667 + fVar139 * 0.16666667 + fVar312 * 0.0;
  auVar96._8_4_ = fVar262 * 0.16666667 + fVar283 * 0.6666667 + fVar140 * 0.16666667 + fVar313 * 0.0;
  auVar96._12_4_ = fVar282 * 0.16666667 + fVar301 * 0.6666667 + fVar233 * 0.16666667 + fVar329 * 0.0
  ;
  auVar287._0_4_ = fVar138 * 0.5 + fVar284 * 0.0;
  auVar287._4_4_ = fVar139 * 0.5 + fVar312 * 0.0;
  auVar287._8_4_ = fVar140 * 0.5 + fVar313 * 0.0;
  auVar287._12_4_ = fVar233 * 0.5 + fVar329 * 0.0;
  auVar377._0_4_ = fVar300 * 0.0;
  auVar377._4_4_ = fVar263 * 0.0;
  auVar377._8_4_ = fVar283 * 0.0;
  auVar377._12_4_ = fVar301 * 0.0;
  auVar111 = vsubps_avx(auVar287,auVar377);
  auVar378._0_4_ = fVar281 * 0.5;
  auVar378._4_4_ = fVar298 * 0.5;
  auVar378._8_4_ = fVar262 * 0.5;
  auVar378._12_4_ = fVar282 * 0.5;
  auVar316 = vsubps_avx(auVar111,auVar378);
  auVar235._0_4_ = fVar264 * 0.0;
  auVar235._4_4_ = fVar286 * 0.0;
  auVar235._8_4_ = fVar177 * 0.0;
  auVar235._12_4_ = fVar258 * 0.0;
  auVar288._0_4_ =
       auVar235._0_4_ + fVar278 * 0.16666667 + fVar279 * 0.6666667 + fVar280 * 0.16666667;
  auVar288._4_4_ =
       auVar235._4_4_ + fVar295 * 0.16666667 + fVar296 * 0.6666667 + fVar297 * 0.16666667;
  auVar288._8_4_ =
       auVar235._8_4_ + fVar214 * 0.16666667 + fVar137 * 0.6666667 + fVar232 * 0.16666667;
  auVar288._12_4_ =
       auVar235._12_4_ + fVar259 * 0.16666667 + fVar260 * 0.6666667 + fVar261 * 0.16666667;
  auVar302._0_4_ = fVar280 * 0.5 + fVar279 * 0.0;
  auVar302._4_4_ = fVar297 * 0.5 + fVar296 * 0.0;
  auVar302._8_4_ = fVar232 * 0.5 + fVar137 * 0.0;
  auVar302._12_4_ = fVar261 * 0.5 + fVar260 * 0.0;
  auVar216._0_4_ = fVar278 * 0.5;
  auVar216._4_4_ = fVar295 * 0.5;
  auVar216._8_4_ = fVar214 * 0.5;
  auVar216._12_4_ = fVar259 * 0.5;
  auVar111 = vsubps_avx(auVar302,auVar216);
  auVar192 = vsubps_avx(auVar111,auVar235);
  auVar236._0_4_ = fVar281 * 0.0;
  auVar236._4_4_ = fVar298 * 0.0;
  auVar236._8_4_ = fVar262 * 0.0;
  auVar236._12_4_ = fVar282 * 0.0;
  auVar217._0_4_ =
       auVar236._0_4_ + fVar300 * 0.16666667 + fVar138 * 0.6666667 + fVar284 * 0.16666667;
  auVar217._4_4_ =
       auVar236._4_4_ + fVar263 * 0.16666667 + fVar139 * 0.6666667 + fVar312 * 0.16666667;
  auVar217._8_4_ =
       auVar236._8_4_ + fVar283 * 0.16666667 + fVar140 * 0.6666667 + fVar313 * 0.16666667;
  auVar217._12_4_ =
       auVar236._12_4_ + fVar301 * 0.16666667 + fVar233 * 0.6666667 + fVar329 * 0.16666667;
  auVar303._0_4_ = fVar138 * 0.0 + fVar284 * 0.5;
  auVar303._4_4_ = fVar139 * 0.0 + fVar312 * 0.5;
  auVar303._8_4_ = fVar140 * 0.0 + fVar313 * 0.5;
  auVar303._12_4_ = fVar233 * 0.0 + fVar329 * 0.5;
  auVar266._0_4_ = fVar300 * 0.5;
  auVar266._4_4_ = fVar263 * 0.5;
  auVar266._8_4_ = fVar283 * 0.5;
  auVar266._12_4_ = fVar301 * 0.5;
  auVar111 = vsubps_avx(auVar303,auVar266);
  auVar33 = vsubps_avx(auVar111,auVar236);
  auVar111 = vshufps_avx(auVar152,auVar152,0xc9);
  auVar237 = vshufps_avx(auVar96,auVar96,0xc9);
  fVar139 = auVar152._0_4_;
  auVar267._0_4_ = fVar139 * auVar237._0_4_;
  fVar140 = auVar152._4_4_;
  auVar267._4_4_ = fVar140 * auVar237._4_4_;
  fVar233 = auVar152._8_4_;
  auVar267._8_4_ = fVar233 * auVar237._8_4_;
  fVar284 = auVar152._12_4_;
  auVar267._12_4_ = fVar284 * auVar237._12_4_;
  auVar97._0_4_ = auVar111._0_4_ * auVar96._0_4_;
  auVar97._4_4_ = auVar111._4_4_ * auVar96._4_4_;
  auVar97._8_4_ = auVar111._8_4_ * auVar96._8_4_;
  auVar97._12_4_ = auVar111._12_4_ * auVar96._12_4_;
  auVar237 = vsubps_avx(auVar97,auVar267);
  auVar206 = vshufps_avx(auVar237,auVar237,0xc9);
  auVar237 = vshufps_avx(auVar316,auVar316,0xc9);
  auVar98._0_4_ = fVar139 * auVar237._0_4_;
  auVar98._4_4_ = fVar140 * auVar237._4_4_;
  auVar98._8_4_ = fVar233 * auVar237._8_4_;
  auVar98._12_4_ = fVar284 * auVar237._12_4_;
  auVar304._0_4_ = auVar316._0_4_ * auVar111._0_4_;
  auVar304._4_4_ = auVar316._4_4_ * auVar111._4_4_;
  auVar304._8_4_ = auVar316._8_4_ * auVar111._8_4_;
  auVar304._12_4_ = auVar316._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar304,auVar98);
  auVar316 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar111 = vshufps_avx(auVar192,auVar192,0xc9);
  auVar237 = vshufps_avx(auVar217,auVar217,0xc9);
  fVar312 = auVar192._0_4_;
  auVar314._0_4_ = fVar312 * auVar237._0_4_;
  fVar313 = auVar192._4_4_;
  auVar314._4_4_ = fVar313 * auVar237._4_4_;
  fVar329 = auVar192._8_4_;
  auVar314._8_4_ = fVar329 * auVar237._8_4_;
  fVar330 = auVar192._12_4_;
  auVar314._12_4_ = fVar330 * auVar237._12_4_;
  auVar218._0_4_ = auVar111._0_4_ * auVar217._0_4_;
  auVar218._4_4_ = auVar111._4_4_ * auVar217._4_4_;
  auVar218._8_4_ = auVar111._8_4_ * auVar217._8_4_;
  auVar218._12_4_ = auVar111._12_4_ * auVar217._12_4_;
  auVar237 = vsubps_avx(auVar218,auVar314);
  auVar32 = vshufps_avx(auVar237,auVar237,0xc9);
  auVar237 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar315._0_4_ = fVar312 * auVar237._0_4_;
  auVar315._4_4_ = fVar313 * auVar237._4_4_;
  auVar315._8_4_ = fVar329 * auVar237._8_4_;
  auVar315._12_4_ = fVar330 * auVar237._12_4_;
  auVar99._0_4_ = auVar111._0_4_ * auVar33._0_4_;
  auVar99._4_4_ = auVar111._4_4_ * auVar33._4_4_;
  auVar99._8_4_ = auVar111._8_4_ * auVar33._8_4_;
  auVar99._12_4_ = auVar111._12_4_ * auVar33._12_4_;
  auVar111 = vdpps_avx(auVar206,auVar206,0x7f);
  auVar237 = vsubps_avx(auVar99,auVar315);
  auVar33 = vshufps_avx(auVar237,auVar237,0xc9);
  fVar286 = auVar111._0_4_;
  auVar299 = ZEXT416((uint)fVar286);
  auVar237 = vrsqrtss_avx(auVar299,auVar299);
  fVar264 = auVar237._0_4_;
  auVar237 = ZEXT416((uint)(fVar264 * 1.5 - fVar286 * 0.5 * fVar264 * fVar264 * fVar264));
  auVar164 = vshufps_avx(auVar237,auVar237,0);
  fVar298 = auVar164._0_4_ * auVar206._0_4_;
  fVar262 = auVar164._4_4_ * auVar206._4_4_;
  fVar282 = auVar164._8_4_ * auVar206._8_4_;
  fVar300 = auVar164._12_4_ * auVar206._12_4_;
  auVar237 = vdpps_avx(auVar206,auVar316,0x7f);
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar305._0_4_ = auVar111._0_4_ * auVar316._0_4_;
  auVar305._4_4_ = auVar111._4_4_ * auVar316._4_4_;
  auVar305._8_4_ = auVar111._8_4_ * auVar316._8_4_;
  auVar305._12_4_ = auVar111._12_4_ * auVar316._12_4_;
  auVar111 = vshufps_avx(auVar237,auVar237,0);
  auVar268._0_4_ = auVar111._0_4_ * auVar206._0_4_;
  auVar268._4_4_ = auVar111._4_4_ * auVar206._4_4_;
  auVar268._8_4_ = auVar111._8_4_ * auVar206._8_4_;
  auVar268._12_4_ = auVar111._12_4_ * auVar206._12_4_;
  auVar153 = vsubps_avx(auVar305,auVar268);
  auVar111 = vrcpss_avx(auVar299,auVar299);
  auVar111 = ZEXT416((uint)((2.0 - fVar286 * auVar111._0_4_) * auVar111._0_4_));
  auVar206 = vshufps_avx(auVar111,auVar111,0);
  auVar111 = vdpps_avx(auVar32,auVar32,0x7f);
  fVar263 = auVar111._0_4_;
  auVar316 = ZEXT416((uint)fVar263);
  auVar237 = vrsqrtss_avx(auVar316,auVar316);
  fVar297 = auVar237._0_4_;
  auVar237 = vdpps_avx(auVar32,auVar33,0x7f);
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar406._0_4_ = auVar111._0_4_ * auVar33._0_4_;
  auVar406._4_4_ = auVar111._4_4_ * auVar33._4_4_;
  auVar406._8_4_ = auVar111._8_4_ * auVar33._8_4_;
  auVar406._12_4_ = auVar111._12_4_ * auVar33._12_4_;
  lVar21 = *(long *)(_Var19 + 0x38 + lVar92);
  lVar22 = *(long *)(_Var19 + 0x48 + lVar92);
  pauVar4 = (undefined1 (*) [12])(lVar21 + lVar22 * uVar86);
  auVar82 = *pauVar4;
  fVar264 = *(float *)pauVar4[1];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar88);
  fVar286 = *pfVar3;
  fVar177 = pfVar3[1];
  fVar258 = pfVar3[2];
  fVar278 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + lVar22 * lVar1);
  fVar295 = *pfVar3;
  fVar214 = pfVar3[1];
  fVar259 = pfVar3[2];
  fVar279 = pfVar3[3];
  auVar111 = vshufps_avx(auVar237,auVar237,0);
  auVar100._0_4_ = auVar111._0_4_ * auVar32._0_4_;
  auVar100._4_4_ = auVar111._4_4_ * auVar32._4_4_;
  auVar100._8_4_ = auVar111._8_4_ * auVar32._8_4_;
  auVar100._12_4_ = auVar111._12_4_ * auVar32._12_4_;
  auVar33 = vsubps_avx(auVar406,auVar100);
  pfVar3 = (float *)(lVar21 + lVar22 * lVar2);
  fVar296 = *pfVar3;
  fVar137 = pfVar3[1];
  fVar260 = pfVar3[2];
  fVar280 = pfVar3[3];
  lVar21 = *(long *)(lVar20 + 0x38 + lVar92);
  lVar20 = *(long *)(lVar20 + 0x48 + lVar92);
  auVar111 = ZEXT416((uint)(fVar297 * 1.5 - fVar263 * 0.5 * fVar297 * fVar297 * fVar297));
  auVar237 = vshufps_avx(auVar111,auVar111,0);
  fVar297 = auVar237._0_4_ * auVar32._0_4_;
  fVar232 = auVar237._4_4_ * auVar32._4_4_;
  fVar261 = auVar237._8_4_ * auVar32._8_4_;
  fVar281 = auVar237._12_4_ * auVar32._12_4_;
  auVar111 = vrcpss_avx(auVar316,auVar316);
  auVar111 = ZEXT416((uint)(auVar111._0_4_ * (2.0 - auVar111._0_4_ * fVar263)));
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar316 = vshufps_avx(_local_720,_local_720,0xff);
  auVar351._0_4_ = auVar316._0_4_ * fVar298;
  auVar351._4_4_ = auVar316._4_4_ * fVar262;
  auVar351._8_4_ = auVar316._8_4_ * fVar282;
  auVar351._12_4_ = auVar316._12_4_ * fVar300;
  auVar32 = vshufps_avx(auVar152,auVar152,0xff);
  auVar299 = vsubps_avx(_local_720,auVar351);
  auVar238._0_4_ =
       auVar32._0_4_ * fVar298 + auVar316._0_4_ * auVar164._0_4_ * auVar153._0_4_ * auVar206._0_4_;
  auVar238._4_4_ =
       auVar32._4_4_ * fVar262 + auVar316._4_4_ * auVar164._4_4_ * auVar153._4_4_ * auVar206._4_4_;
  auVar238._8_4_ =
       auVar32._8_4_ * fVar282 + auVar316._8_4_ * auVar164._8_4_ * auVar153._8_4_ * auVar206._8_4_;
  auVar238._12_4_ =
       auVar32._12_4_ * fVar300 +
       auVar316._12_4_ * auVar164._12_4_ * auVar153._12_4_ * auVar206._12_4_;
  auVar164 = vsubps_avx(auVar152,auVar238);
  local_720._0_4_ = (float)local_720._0_4_ + auVar351._0_4_;
  local_720._4_4_ = (float)local_720._4_4_ + auVar351._4_4_;
  fStack_718 = fStack_718 + auVar351._8_4_;
  fStack_714 = fStack_714 + auVar351._12_4_;
  auVar206 = vshufps_avx(auVar288,auVar288,0xff);
  auVar181._0_4_ = auVar206._0_4_ * fVar297;
  auVar181._4_4_ = auVar206._4_4_ * fVar232;
  auVar181._8_4_ = auVar206._8_4_ * fVar261;
  auVar181._12_4_ = auVar206._12_4_ * fVar281;
  auVar316 = vshufps_avx(auVar192,auVar192,0xff);
  auVar152 = vsubps_avx(auVar288,auVar181);
  auVar101._0_4_ =
       auVar316._0_4_ * fVar297 + auVar206._0_4_ * auVar237._0_4_ * auVar33._0_4_ * auVar111._0_4_;
  auVar101._4_4_ =
       auVar316._4_4_ * fVar232 + auVar206._4_4_ * auVar237._4_4_ * auVar33._4_4_ * auVar111._4_4_;
  auVar101._8_4_ =
       auVar316._8_4_ * fVar261 + auVar206._8_4_ * auVar237._8_4_ * auVar33._8_4_ * auVar111._8_4_;
  auVar101._12_4_ =
       auVar316._12_4_ * fVar281 +
       auVar206._12_4_ * auVar237._12_4_ * auVar33._12_4_ * auVar111._12_4_;
  auVar192 = vsubps_avx(auVar192,auVar101);
  local_6d0._4_4_ = auVar288._4_4_ + auVar181._4_4_;
  local_6d0._0_4_ = auVar288._0_4_ + auVar181._0_4_;
  fStack_6c8 = auVar288._8_4_ + auVar181._8_4_;
  fStack_6c4 = auVar288._12_4_ + auVar181._12_4_;
  local_6e0._0_4_ =
       *(float *)*pauVar4 * 0.16666667 + fVar286 * 0.6666667 + fVar295 * 0.16666667 + fVar296 * 0.0;
  local_6e0._4_4_ =
       *(float *)(*pauVar4 + 4) * 0.16666667 +
       fVar177 * 0.6666667 + fVar214 * 0.16666667 + fVar137 * 0.0;
  fStack_6d8 = *(float *)(*pauVar4 + 8) * 0.16666667 +
               fVar258 * 0.6666667 + fVar259 * 0.16666667 + fVar260 * 0.0;
  fStack_6d4 = fVar264 * 0.16666667 + fVar278 * 0.6666667 + fVar279 * 0.16666667 + fVar280 * 0.0;
  auVar102._0_4_ = fVar295 * 0.5 + fVar296 * 0.0;
  auVar102._4_4_ = fVar214 * 0.5 + fVar137 * 0.0;
  auVar102._8_4_ = fVar259 * 0.5 + fVar260 * 0.0;
  auVar102._12_4_ = fVar279 * 0.5 + fVar280 * 0.0;
  auVar142._0_4_ = fVar286 * 0.0;
  auVar142._4_4_ = fVar177 * 0.0;
  auVar142._8_4_ = fVar258 * 0.0;
  auVar142._12_4_ = fVar278 * 0.0;
  auVar111 = vsubps_avx(auVar102,auVar142);
  auVar143._0_4_ = *(float *)*pauVar4 * 0.5;
  auVar143._4_4_ = *(float *)(*pauVar4 + 4) * 0.5;
  auVar143._8_4_ = *(float *)(*pauVar4 + 8) * 0.5;
  auVar143._12_4_ = fVar264 * 0.5;
  auVar153 = vsubps_avx(auVar111,auVar143);
  auVar111 = *(undefined1 (*) [16])(lVar21 + lVar1 * lVar20);
  pfVar3 = (float *)(lVar21 + lVar20 * lVar2);
  fVar297 = *pfVar3;
  fVar232 = pfVar3[1];
  fVar261 = pfVar3[2];
  fVar281 = pfVar3[3];
  fVar376 = auVar111._0_4_;
  fVar331 = auVar111._4_4_;
  fVar385 = auVar111._8_4_;
  fVar332 = auVar111._12_4_;
  pfVar3 = (float *)(lVar21 + lVar88 * lVar20);
  fVar298 = *pfVar3;
  fVar262 = pfVar3[1];
  fVar282 = pfVar3[2];
  fVar300 = pfVar3[3];
  pfVar3 = (float *)(lVar21 + uVar86 * lVar20);
  fVar263 = *pfVar3;
  fVar283 = pfVar3[1];
  fVar301 = pfVar3[2];
  fVar138 = pfVar3[3];
  auVar239._0_4_ = fVar263 * 0.16666667 + fVar298 * 0.6666667 + fVar376 * 0.16666667 + fVar297 * 0.0
  ;
  auVar239._4_4_ = fVar283 * 0.16666667 + fVar262 * 0.6666667 + fVar331 * 0.16666667 + fVar232 * 0.0
  ;
  auVar239._8_4_ = fVar301 * 0.16666667 + fVar282 * 0.6666667 + fVar385 * 0.16666667 + fVar261 * 0.0
  ;
  auVar239._12_4_ =
       fVar138 * 0.16666667 + fVar300 * 0.6666667 + fVar332 * 0.16666667 + fVar281 * 0.0;
  auVar219._0_4_ = fVar376 * 0.5 + fVar297 * 0.0;
  auVar219._4_4_ = fVar331 * 0.5 + fVar232 * 0.0;
  auVar219._8_4_ = fVar385 * 0.5 + fVar261 * 0.0;
  auVar219._12_4_ = fVar332 * 0.5 + fVar281 * 0.0;
  auVar317._0_4_ = fVar298 * 0.0;
  auVar317._4_4_ = fVar262 * 0.0;
  auVar317._8_4_ = fVar282 * 0.0;
  auVar317._12_4_ = fVar300 * 0.0;
  auVar111 = vsubps_avx(auVar219,auVar317);
  auVar318._0_4_ = fVar263 * 0.5;
  auVar318._4_4_ = fVar283 * 0.5;
  auVar318._8_4_ = fVar301 * 0.5;
  auVar318._12_4_ = fVar138 * 0.5;
  auVar237 = vsubps_avx(auVar111,auVar318);
  auVar319._0_4_ = fVar295 * 0.0 + fVar296 * 0.5;
  auVar319._4_4_ = fVar214 * 0.0 + fVar137 * 0.5;
  auVar319._8_4_ = fVar259 * 0.0 + fVar260 * 0.5;
  auVar319._12_4_ = fVar279 * 0.0 + fVar280 * 0.5;
  auVar379._0_4_ = fVar286 * 0.5;
  auVar379._4_4_ = fVar177 * 0.5;
  auVar379._8_4_ = fVar258 * 0.5;
  auVar379._12_4_ = fVar278 * 0.5;
  auVar111 = vsubps_avx(auVar319,auVar379);
  local_6f0 = auVar82._0_4_;
  fStack_6ec = auVar82._4_4_;
  fStack_6e8 = auVar82._8_4_;
  auVar363._0_4_ = local_6f0 * 0.0;
  auVar363._4_4_ = fStack_6ec * 0.0;
  auVar363._8_4_ = fStack_6e8 * 0.0;
  auVar363._12_4_ = fVar264 * 0.0;
  auVar380._0_4_ =
       auVar363._0_4_ + fVar286 * 0.16666667 + fVar296 * 0.16666667 + fVar295 * 0.6666667;
  auVar380._4_4_ =
       auVar363._4_4_ + fVar177 * 0.16666667 + fVar137 * 0.16666667 + fVar214 * 0.6666667;
  auVar380._8_4_ =
       auVar363._8_4_ + fVar258 * 0.16666667 + fVar260 * 0.16666667 + fVar259 * 0.6666667;
  auVar380._12_4_ =
       auVar363._12_4_ + fVar278 * 0.16666667 + fVar280 * 0.16666667 + fVar279 * 0.6666667;
  auVar34 = vsubps_avx(auVar111,auVar363);
  auVar182._0_4_ = fVar376 * 0.0 + fVar297 * 0.5;
  auVar182._4_4_ = fVar331 * 0.0 + fVar232 * 0.5;
  auVar182._8_4_ = fVar385 * 0.0 + fVar261 * 0.5;
  auVar182._12_4_ = fVar332 * 0.0 + fVar281 * 0.5;
  auVar103._0_4_ = fVar298 * 0.5;
  auVar103._4_4_ = fVar262 * 0.5;
  auVar103._8_4_ = fVar282 * 0.5;
  auVar103._12_4_ = fVar300 * 0.5;
  auVar111 = vsubps_avx(auVar182,auVar103);
  auVar144._0_4_ = fVar263 * 0.0;
  auVar144._4_4_ = fVar283 * 0.0;
  auVar144._8_4_ = fVar301 * 0.0;
  auVar144._12_4_ = fVar138 * 0.0;
  auVar183._0_4_ =
       auVar144._0_4_ + fVar298 * 0.16666667 + fVar376 * 0.6666667 + fVar297 * 0.16666667;
  auVar183._4_4_ =
       auVar144._4_4_ + fVar262 * 0.16666667 + fVar331 * 0.6666667 + fVar232 * 0.16666667;
  auVar183._8_4_ =
       auVar144._8_4_ + fVar282 * 0.16666667 + fVar385 * 0.6666667 + fVar261 * 0.16666667;
  auVar183._12_4_ =
       auVar144._12_4_ + fVar300 * 0.16666667 + fVar332 * 0.6666667 + fVar281 * 0.16666667;
  auVar206 = vsubps_avx(auVar111,auVar144);
  auVar111 = vshufps_avx(auVar239,auVar239,0xc9);
  fVar279 = auVar153._0_4_;
  auVar145._0_4_ = fVar279 * auVar111._0_4_;
  fVar296 = auVar153._4_4_;
  auVar145._4_4_ = fVar296 * auVar111._4_4_;
  fVar137 = auVar153._8_4_;
  auVar145._8_4_ = fVar137 * auVar111._8_4_;
  fVar280 = auVar153._12_4_;
  auVar145._12_4_ = fVar280 * auVar111._12_4_;
  auVar111 = vshufps_avx(auVar153,auVar153,0xc9);
  auVar240._0_4_ = auVar111._0_4_ * auVar239._0_4_;
  auVar240._4_4_ = auVar111._4_4_ * auVar239._4_4_;
  auVar240._8_4_ = auVar111._8_4_ * auVar239._8_4_;
  auVar240._12_4_ = auVar111._12_4_ * auVar239._12_4_;
  auVar316 = vsubps_avx(auVar240,auVar145);
  auVar146._0_4_ = auVar111._0_4_ * auVar237._0_4_;
  auVar146._4_4_ = auVar111._4_4_ * auVar237._4_4_;
  auVar146._8_4_ = auVar111._8_4_ * auVar237._8_4_;
  auVar146._12_4_ = auVar111._12_4_ * auVar237._12_4_;
  auVar111 = vshufps_avx(auVar237,auVar237,0xc9);
  auVar220._0_4_ = fVar279 * auVar111._0_4_;
  auVar220._4_4_ = fVar296 * auVar111._4_4_;
  auVar220._8_4_ = fVar137 * auVar111._8_4_;
  auVar220._12_4_ = fVar280 * auVar111._12_4_;
  auVar32 = vsubps_avx(auVar146,auVar220);
  auVar111 = vshufps_avx(auVar183,auVar183,0xc9);
  fVar260 = auVar34._0_4_;
  auVar147._0_4_ = fVar260 * auVar111._0_4_;
  fVar297 = auVar34._4_4_;
  auVar147._4_4_ = fVar297 * auVar111._4_4_;
  fVar232 = auVar34._8_4_;
  auVar147._8_4_ = fVar232 * auVar111._8_4_;
  fVar261 = auVar34._12_4_;
  auVar147._12_4_ = fVar261 * auVar111._12_4_;
  auVar111 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar184._0_4_ = auVar111._0_4_ * auVar183._0_4_;
  auVar184._4_4_ = auVar111._4_4_ * auVar183._4_4_;
  auVar184._8_4_ = auVar111._8_4_ * auVar183._8_4_;
  auVar184._12_4_ = auVar111._12_4_ * auVar183._12_4_;
  auVar33 = vsubps_avx(auVar184,auVar147);
  auVar185._0_4_ = auVar111._0_4_ * auVar206._0_4_;
  auVar185._4_4_ = auVar111._4_4_ * auVar206._4_4_;
  auVar185._8_4_ = auVar111._8_4_ * auVar206._8_4_;
  auVar185._12_4_ = auVar111._12_4_ * auVar206._12_4_;
  auVar111 = vshufps_avx(auVar206,auVar206,0xc9);
  auVar104._0_4_ = fVar260 * auVar111._0_4_;
  auVar104._4_4_ = fVar297 * auVar111._4_4_;
  auVar104._8_4_ = fVar232 * auVar111._8_4_;
  auVar104._12_4_ = fVar261 * auVar111._12_4_;
  auVar35 = vsubps_avx(auVar185,auVar104);
  auVar206 = vshufps_avx(auVar316,auVar316,0xc9);
  auVar111 = vdpps_avx(auVar206,auVar206,0x7f);
  fVar264 = auVar111._0_4_;
  auVar241 = ZEXT416((uint)fVar264);
  auVar237 = vrsqrtss_avx(auVar241,auVar241);
  fVar286 = auVar237._0_4_;
  auVar316 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar237 = vdpps_avx(auVar206,auVar316,0x7f);
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar221._0_4_ = auVar111._0_4_ * auVar316._0_4_;
  auVar221._4_4_ = auVar111._4_4_ * auVar316._4_4_;
  auVar221._8_4_ = auVar111._8_4_ * auVar316._8_4_;
  auVar221._12_4_ = auVar111._12_4_ * auVar316._12_4_;
  auVar111 = vshufps_avx(auVar237,auVar237,0);
  auVar392._0_4_ = auVar111._0_4_ * auVar206._0_4_;
  auVar392._4_4_ = auVar111._4_4_ * auVar206._4_4_;
  auVar392._8_4_ = auVar111._8_4_ * auVar206._8_4_;
  auVar392._12_4_ = auVar111._12_4_ * auVar206._12_4_;
  auVar364 = vsubps_avx(auVar221,auVar392);
  auVar111 = vrcpss_avx(auVar241,auVar241);
  auVar111 = ZEXT416((uint)(auVar111._0_4_ * (2.0 - fVar264 * auVar111._0_4_)));
  auVar316 = vshufps_avx(auVar111,auVar111,0);
  auVar111 = ZEXT416((uint)(fVar286 * 1.5 - fVar264 * 0.5 * fVar286 * fVar286 * fVar286));
  auVar32 = vshufps_avx(auVar111,auVar111,0);
  fVar278 = auVar206._0_4_ * auVar32._0_4_;
  fVar295 = auVar206._4_4_ * auVar32._4_4_;
  fVar214 = auVar206._8_4_ * auVar32._8_4_;
  fVar259 = auVar206._12_4_ * auVar32._12_4_;
  auVar206 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar111 = vdpps_avx(auVar206,auVar206,0x7f);
  fVar264 = auVar111._0_4_;
  auVar241 = ZEXT416((uint)fVar264);
  auVar237 = vrsqrtss_avx(auVar241,auVar241);
  fVar286 = auVar237._0_4_;
  auVar33 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar237 = vdpps_avx(auVar206,auVar33,0x7f);
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar105._0_4_ = auVar111._0_4_ * auVar33._0_4_;
  auVar105._4_4_ = auVar111._4_4_ * auVar33._4_4_;
  auVar105._8_4_ = auVar111._8_4_ * auVar33._8_4_;
  auVar105._12_4_ = auVar111._12_4_ * auVar33._12_4_;
  auVar111 = vshufps_avx(auVar237,auVar237,0);
  auVar320._0_4_ = auVar111._0_4_ * auVar206._0_4_;
  auVar320._4_4_ = auVar111._4_4_ * auVar206._4_4_;
  auVar320._8_4_ = auVar111._8_4_ * auVar206._8_4_;
  auVar320._12_4_ = auVar111._12_4_ * auVar206._12_4_;
  auVar35 = vsubps_avx(auVar105,auVar320);
  auVar111 = vrcpss_avx(auVar241,auVar241);
  auVar111 = ZEXT416((uint)(auVar111._0_4_ * (2.0 - fVar264 * auVar111._0_4_)));
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar237 = ZEXT416((uint)(fVar286 * 1.5 - fVar264 * 0.5 * fVar286 * fVar286 * fVar286));
  auVar237 = vshufps_avx(auVar237,auVar237,0);
  fVar264 = auVar206._0_4_ * auVar237._0_4_;
  fVar286 = auVar206._4_4_ * auVar237._4_4_;
  fVar177 = auVar206._8_4_ * auVar237._8_4_;
  fVar258 = auVar206._12_4_ * auVar237._12_4_;
  auVar206 = vshufps_avx(auVar153,auVar153,0xff);
  auVar33 = vshufps_avx(_local_6e0,_local_6e0,0xff);
  auVar186._0_4_ = auVar33._0_4_ * fVar278;
  auVar186._4_4_ = auVar33._4_4_ * fVar295;
  auVar186._8_4_ = auVar33._8_4_ * fVar214;
  auVar186._12_4_ = auVar33._12_4_ * fVar259;
  auVar222._0_4_ =
       auVar206._0_4_ * fVar278 + auVar32._0_4_ * auVar364._0_4_ * auVar316._0_4_ * auVar33._0_4_;
  auVar222._4_4_ =
       auVar206._4_4_ * fVar295 + auVar32._4_4_ * auVar364._4_4_ * auVar316._4_4_ * auVar33._4_4_;
  auVar222._8_4_ =
       auVar206._8_4_ * fVar214 + auVar32._8_4_ * auVar364._8_4_ * auVar316._8_4_ * auVar33._8_4_;
  auVar222._12_4_ =
       auVar206._12_4_ * fVar259 +
       auVar32._12_4_ * auVar364._12_4_ * auVar316._12_4_ * auVar33._12_4_;
  auVar32 = vsubps_avx(_local_6e0,auVar186);
  local_6e0._0_4_ = (float)local_6e0._0_4_ + auVar186._0_4_;
  local_6e0._4_4_ = (float)local_6e0._4_4_ + auVar186._4_4_;
  fStack_6d8 = fStack_6d8 + auVar186._8_4_;
  fStack_6d4 = fStack_6d4 + auVar186._12_4_;
  auVar33 = vsubps_avx(auVar153,auVar222);
  auVar206 = vshufps_avx(auVar34,auVar34,0xff);
  auVar316 = vshufps_avx(auVar380,auVar380,0xff);
  auVar148._0_4_ = auVar316._0_4_ * fVar264;
  auVar148._4_4_ = auVar316._4_4_ * fVar286;
  auVar148._8_4_ = auVar316._8_4_ * fVar177;
  auVar148._12_4_ = auVar316._12_4_ * fVar258;
  auVar187._0_4_ =
       auVar206._0_4_ * fVar264 + auVar316._0_4_ * auVar237._0_4_ * auVar35._0_4_ * auVar111._0_4_;
  auVar187._4_4_ =
       auVar206._4_4_ * fVar286 + auVar316._4_4_ * auVar237._4_4_ * auVar35._4_4_ * auVar111._4_4_;
  auVar187._8_4_ =
       auVar206._8_4_ * fVar177 + auVar316._8_4_ * auVar237._8_4_ * auVar35._8_4_ * auVar111._8_4_;
  auVar187._12_4_ =
       auVar206._12_4_ * fVar258 +
       auVar316._12_4_ * auVar237._12_4_ * auVar35._12_4_ * auVar111._12_4_;
  auVar206 = vsubps_avx(auVar380,auVar148);
  auVar393._0_4_ = auVar380._0_4_ + auVar148._0_4_;
  auVar393._4_4_ = auVar380._4_4_ + auVar148._4_4_;
  auVar393._8_4_ = auVar380._8_4_ + auVar148._8_4_;
  auVar393._12_4_ = auVar380._12_4_ + auVar148._12_4_;
  auVar316 = vsubps_avx(auVar34,auVar187);
  local_640 = auVar164._0_4_;
  fStack_63c = auVar164._4_4_;
  fStack_638 = auVar164._8_4_;
  fStack_634 = auVar164._12_4_;
  local_620 = auVar299._0_4_;
  fStack_61c = auVar299._4_4_;
  fStack_618 = auVar299._8_4_;
  fStack_614 = auVar299._12_4_;
  auVar111 = vshufps_avx(ZEXT416((uint)fVar285),ZEXT416((uint)fVar285),0);
  auVar237 = vshufps_avx(ZEXT416((uint)(1.0 - fVar285)),ZEXT416((uint)(1.0 - fVar285)),0);
  fVar258 = auVar111._0_4_;
  fVar278 = auVar111._4_4_;
  fVar295 = auVar111._8_4_;
  fVar214 = auVar111._12_4_;
  fVar285 = auVar237._0_4_;
  fVar264 = auVar237._4_4_;
  fVar286 = auVar237._8_4_;
  fVar177 = auVar237._12_4_;
  local_4b0._0_4_ = fVar285 * local_620 + fVar258 * auVar32._0_4_;
  local_4b0._4_4_ = fVar264 * fStack_61c + fVar278 * auVar32._4_4_;
  fStack_4a8 = fVar286 * fStack_618 + fVar295 * auVar32._8_4_;
  fStack_4a4 = fVar177 * fStack_614 + fVar214 * auVar32._12_4_;
  fVar282 = (local_620 + local_640 * 0.33333334) * fVar285 +
            fVar258 * (auVar32._0_4_ + auVar33._0_4_ * 0.33333334);
  fVar300 = (fStack_61c + fStack_63c * 0.33333334) * fVar264 +
            fVar278 * (auVar32._4_4_ + auVar33._4_4_ * 0.33333334);
  fVar263 = (fStack_618 + fStack_638 * 0.33333334) * fVar286 +
            fVar295 * (auVar32._8_4_ + auVar33._8_4_ * 0.33333334);
  fVar283 = (fStack_614 + fStack_634 * 0.33333334) * fVar177 +
            fVar214 * (auVar32._12_4_ + auVar33._12_4_ * 0.33333334);
  local_680 = auVar192._0_4_;
  fStack_67c = auVar192._4_4_;
  fStack_678 = auVar192._8_4_;
  fStack_674 = auVar192._12_4_;
  auVar242._0_4_ = local_680 * 0.33333334;
  auVar242._4_4_ = fStack_67c * 0.33333334;
  auVar242._8_4_ = fStack_678 * 0.33333334;
  auVar242._12_4_ = fStack_674 * 0.33333334;
  auVar111 = vsubps_avx(auVar152,auVar242);
  auVar289._0_4_ = (fVar312 + auVar101._0_4_) * 0.33333334;
  auVar289._4_4_ = (fVar313 + auVar101._4_4_) * 0.33333334;
  auVar289._8_4_ = (fVar329 + auVar101._8_4_) * 0.33333334;
  auVar289._12_4_ = (fVar330 + auVar101._12_4_) * 0.33333334;
  auVar237 = vsubps_avx(_local_6d0,auVar289);
  auVar321._0_4_ = auVar316._0_4_ * 0.33333334;
  auVar321._4_4_ = auVar316._4_4_ * 0.33333334;
  auVar321._8_4_ = auVar316._8_4_ * 0.33333334;
  auVar321._12_4_ = auVar316._12_4_ * 0.33333334;
  auVar316 = vsubps_avx(auVar206,auVar321);
  auVar188._0_4_ = (fVar260 + auVar187._0_4_) * 0.33333334;
  auVar188._4_4_ = (fVar297 + auVar187._4_4_) * 0.33333334;
  auVar188._8_4_ = (fVar232 + auVar187._8_4_) * 0.33333334;
  auVar188._12_4_ = (fVar261 + auVar187._12_4_) * 0.33333334;
  auVar32 = vsubps_avx(auVar393,auVar188);
  local_4c0._0_4_ = auVar316._0_4_ * fVar258 + fVar285 * auVar111._0_4_;
  local_4c0._4_4_ = auVar316._4_4_ * fVar278 + fVar264 * auVar111._4_4_;
  fStack_4b8 = auVar316._8_4_ * fVar295 + fVar286 * auVar111._8_4_;
  fStack_4b4 = auVar316._12_4_ * fVar214 + fVar177 * auVar111._12_4_;
  fVar260 = fVar285 * auVar152._0_4_ + fVar258 * auVar206._0_4_;
  fVar297 = fVar264 * auVar152._4_4_ + fVar278 * auVar206._4_4_;
  fVar261 = fVar286 * auVar152._8_4_ + fVar295 * auVar206._8_4_;
  fVar298 = fVar177 * auVar152._12_4_ + fVar214 * auVar206._12_4_;
  local_4d0._0_4_ = (float)local_720._0_4_ * fVar285 + fVar258 * (float)local_6e0._0_4_;
  local_4d0._4_4_ = (float)local_720._4_4_ * fVar264 + fVar278 * (float)local_6e0._4_4_;
  fStack_4c8 = fStack_718 * fVar286 + fVar295 * fStack_6d8;
  fStack_4c4 = fStack_714 * fVar177 + fVar214 * fStack_6d4;
  local_4e0._0_4_ =
       ((float)local_720._0_4_ + (fVar139 + auVar238._0_4_) * 0.33333334) * fVar285 +
       ((fVar279 + auVar222._0_4_) * 0.33333334 + (float)local_6e0._0_4_) * fVar258;
  local_4e0._4_4_ =
       ((float)local_720._4_4_ + (fVar140 + auVar238._4_4_) * 0.33333334) * fVar264 +
       ((fVar296 + auVar222._4_4_) * 0.33333334 + (float)local_6e0._4_4_) * fVar278;
  fStack_4d8 = (fStack_718 + (fVar233 + auVar238._8_4_) * 0.33333334) * fVar286 +
               ((fVar137 + auVar222._8_4_) * 0.33333334 + fStack_6d8) * fVar295;
  fStack_4d4 = (fStack_714 + (fVar284 + auVar238._12_4_) * 0.33333334) * fVar177 +
               ((fVar280 + auVar222._12_4_) * 0.33333334 + fStack_6d4) * fVar214;
  fVar280 = fVar285 * auVar237._0_4_ + fVar258 * auVar32._0_4_;
  fVar232 = fVar264 * auVar237._4_4_ + fVar278 * auVar32._4_4_;
  fVar281 = fVar286 * auVar237._8_4_ + fVar295 * auVar32._8_4_;
  fVar262 = fVar177 * auVar237._12_4_ + fVar214 * auVar32._12_4_;
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  local_450._0_4_ = (auVar288._0_4_ + auVar181._0_4_) * fVar285 + auVar393._0_4_ * fVar258;
  local_450._4_4_ = (auVar288._4_4_ + auVar181._4_4_) * fVar264 + auVar393._4_4_ * fVar278;
  fStack_448 = (auVar288._8_4_ + auVar181._8_4_) * fVar286 + auVar393._8_4_ * fVar295;
  fStack_444 = (auVar288._12_4_ + auVar181._12_4_) * fVar177 + auVar393._12_4_ * fVar214;
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_3c0 = vsubps_avx(_local_4b0,auVar111);
  auVar206 = vmovsldup_avx(local_3c0);
  auVar237 = vmovshdup_avx(local_3c0);
  auVar316 = vshufps_avx(local_3c0,local_3c0,0xaa);
  fVar285 = pre->ray_space[k].vx.field_0.m128[0];
  fVar264 = pre->ray_space[k].vx.field_0.m128[1];
  fVar286 = pre->ray_space[k].vx.field_0.m128[2];
  fVar177 = pre->ray_space[k].vx.field_0.m128[3];
  fVar258 = pre->ray_space[k].vy.field_0.m128[0];
  fVar278 = pre->ray_space[k].vy.field_0.m128[1];
  fVar295 = pre->ray_space[k].vy.field_0.m128[2];
  fVar214 = pre->ray_space[k].vy.field_0.m128[3];
  fVar259 = pre->ray_space[k].vz.field_0.m128[0];
  fVar279 = pre->ray_space[k].vz.field_0.m128[1];
  fVar296 = pre->ray_space[k].vz.field_0.m128[2];
  fVar137 = pre->ray_space[k].vz.field_0.m128[3];
  auVar399._0_4_ = fVar285 * auVar206._0_4_ + fVar258 * auVar237._0_4_ + fVar259 * auVar316._0_4_;
  auVar399._4_4_ = fVar264 * auVar206._4_4_ + fVar278 * auVar237._4_4_ + fVar279 * auVar316._4_4_;
  auVar399._8_4_ = fVar286 * auVar206._8_4_ + fVar295 * auVar237._8_4_ + fVar296 * auVar316._8_4_;
  auVar399._12_4_ =
       fVar177 * auVar206._12_4_ + fVar214 * auVar237._12_4_ + fVar137 * auVar316._12_4_;
  auVar80._4_4_ = fVar300;
  auVar80._0_4_ = fVar282;
  auVar80._8_4_ = fVar263;
  auVar80._12_4_ = fVar283;
  local_3d0 = vsubps_avx(auVar80,auVar111);
  auVar316 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar237 = vmovshdup_avx(local_3d0);
  auVar206 = vmovsldup_avx(local_3d0);
  auVar394._0_4_ = fVar285 * auVar206._0_4_ + fVar258 * auVar237._0_4_ + fVar259 * auVar316._0_4_;
  auVar394._4_4_ = fVar264 * auVar206._4_4_ + fVar278 * auVar237._4_4_ + fVar279 * auVar316._4_4_;
  auVar394._8_4_ = fVar286 * auVar206._8_4_ + fVar295 * auVar237._8_4_ + fVar296 * auVar316._8_4_;
  auVar394._12_4_ =
       fVar177 * auVar206._12_4_ + fVar214 * auVar237._12_4_ + fVar137 * auVar316._12_4_;
  local_3e0 = vsubps_avx(_local_4c0,auVar111);
  auVar316 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar237 = vmovshdup_avx(local_3e0);
  auVar206 = vmovsldup_avx(local_3e0);
  auVar223._0_4_ = fVar285 * auVar206._0_4_ + fVar258 * auVar237._0_4_ + fVar259 * auVar316._0_4_;
  auVar223._4_4_ = fVar264 * auVar206._4_4_ + fVar278 * auVar237._4_4_ + fVar279 * auVar316._4_4_;
  auVar223._8_4_ = fVar286 * auVar206._8_4_ + fVar295 * auVar237._8_4_ + fVar296 * auVar316._8_4_;
  auVar223._12_4_ =
       fVar177 * auVar206._12_4_ + fVar214 * auVar237._12_4_ + fVar137 * auVar316._12_4_;
  auVar78._4_4_ = fVar297;
  auVar78._0_4_ = fVar260;
  auVar78._8_4_ = fVar261;
  auVar78._12_4_ = fVar298;
  local_3f0 = vsubps_avx(auVar78,auVar111);
  auVar316 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar237 = vmovshdup_avx(local_3f0);
  auVar206 = vmovsldup_avx(local_3f0);
  auVar149._0_4_ = auVar206._0_4_ * fVar285 + auVar237._0_4_ * fVar258 + fVar259 * auVar316._0_4_;
  auVar149._4_4_ = auVar206._4_4_ * fVar264 + auVar237._4_4_ * fVar278 + fVar279 * auVar316._4_4_;
  auVar149._8_4_ = auVar206._8_4_ * fVar286 + auVar237._8_4_ * fVar295 + fVar296 * auVar316._8_4_;
  auVar149._12_4_ =
       auVar206._12_4_ * fVar177 + auVar237._12_4_ * fVar214 + fVar137 * auVar316._12_4_;
  local_400 = vsubps_avx(_local_4d0,auVar111);
  auVar316 = vshufps_avx(local_400,local_400,0xaa);
  auVar237 = vmovshdup_avx(local_400);
  auVar206 = vmovsldup_avx(local_400);
  auVar322._0_4_ = auVar206._0_4_ * fVar285 + auVar237._0_4_ * fVar258 + auVar316._0_4_ * fVar259;
  auVar322._4_4_ = auVar206._4_4_ * fVar264 + auVar237._4_4_ * fVar278 + auVar316._4_4_ * fVar279;
  auVar322._8_4_ = auVar206._8_4_ * fVar286 + auVar237._8_4_ * fVar295 + auVar316._8_4_ * fVar296;
  auVar322._12_4_ =
       auVar206._12_4_ * fVar177 + auVar237._12_4_ * fVar214 + auVar316._12_4_ * fVar137;
  local_410 = vsubps_avx(_local_4e0,auVar111);
  auVar316 = vshufps_avx(local_410,local_410,0xaa);
  auVar237 = vmovshdup_avx(local_410);
  auVar206 = vmovsldup_avx(local_410);
  auVar336._0_4_ = auVar206._0_4_ * fVar285 + auVar237._0_4_ * fVar258 + auVar316._0_4_ * fVar259;
  auVar336._4_4_ = auVar206._4_4_ * fVar264 + auVar237._4_4_ * fVar278 + auVar316._4_4_ * fVar279;
  auVar336._8_4_ = auVar206._8_4_ * fVar286 + auVar237._8_4_ * fVar295 + auVar316._8_4_ * fVar296;
  auVar336._12_4_ =
       auVar206._12_4_ * fVar177 + auVar237._12_4_ * fVar214 + auVar316._12_4_ * fVar137;
  auVar76._4_4_ = fVar232;
  auVar76._0_4_ = fVar280;
  auVar76._8_4_ = fVar281;
  auVar76._12_4_ = fVar262;
  local_420 = vsubps_avx(auVar76,auVar111);
  auVar316 = vshufps_avx(local_420,local_420,0xaa);
  auVar237 = vmovshdup_avx(local_420);
  auVar206 = vmovsldup_avx(local_420);
  auVar352._0_4_ = auVar206._0_4_ * fVar285 + auVar237._0_4_ * fVar258 + auVar316._0_4_ * fVar259;
  auVar352._4_4_ = auVar206._4_4_ * fVar264 + auVar237._4_4_ * fVar278 + auVar316._4_4_ * fVar279;
  auVar352._8_4_ = auVar206._8_4_ * fVar286 + auVar237._8_4_ * fVar295 + auVar316._8_4_ * fVar296;
  auVar352._12_4_ =
       auVar206._12_4_ * fVar177 + auVar237._12_4_ * fVar214 + auVar316._12_4_ * fVar137;
  local_430 = vsubps_avx(_local_450,auVar111);
  auVar206 = vshufps_avx(local_430,local_430,0xaa);
  auVar111 = vmovshdup_avx(local_430);
  auVar237 = vmovsldup_avx(local_430);
  auVar106._0_4_ = fVar285 * auVar237._0_4_ + fVar258 * auVar111._0_4_ + fVar259 * auVar206._0_4_;
  auVar106._4_4_ = fVar264 * auVar237._4_4_ + fVar278 * auVar111._4_4_ + fVar279 * auVar206._4_4_;
  auVar106._8_4_ = fVar286 * auVar237._8_4_ + fVar295 * auVar111._8_4_ + fVar296 * auVar206._8_4_;
  auVar106._12_4_ =
       fVar177 * auVar237._12_4_ + fVar214 * auVar111._12_4_ + fVar137 * auVar206._12_4_;
  auVar316 = vmovlhps_avx(auVar399,auVar322);
  auVar32 = vmovlhps_avx(auVar394,auVar336);
  auVar33 = vmovlhps_avx(auVar223,auVar352);
  _local_3a0 = vmovlhps_avx(auVar149,auVar106);
  auVar111 = vminps_avx(auVar316,auVar32);
  auVar237 = vminps_avx(auVar33,_local_3a0);
  auVar206 = vminps_avx(auVar111,auVar237);
  auVar111 = vmaxps_avx(auVar316,auVar32);
  auVar237 = vmaxps_avx(auVar33,_local_3a0);
  auVar111 = vmaxps_avx(auVar111,auVar237);
  auVar237 = vshufpd_avx(auVar206,auVar206,3);
  auVar206 = vminps_avx(auVar206,auVar237);
  auVar237 = vshufpd_avx(auVar111,auVar111,3);
  auVar237 = vmaxps_avx(auVar111,auVar237);
  auVar290._8_4_ = 0x7fffffff;
  auVar290._0_8_ = 0x7fffffff7fffffff;
  auVar290._12_4_ = 0x7fffffff;
  auVar111 = vandps_avx(auVar206,auVar290);
  auVar237 = vandps_avx(auVar237,auVar290);
  auVar111 = vmaxps_avx(auVar111,auVar237);
  auVar237 = vmovshdup_avx(auVar111);
  auVar111 = vmaxss_avx(auVar237,auVar111);
  fVar285 = auVar111._0_4_ * 9.536743e-07;
  local_3b0 = ZEXT416((uint)fVar285);
  auVar111 = vshufps_avx(ZEXT416((uint)fVar285),ZEXT416((uint)fVar285),0);
  local_1c0._16_16_ = auVar111;
  local_1c0._0_16_ = auVar111;
  auVar107._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
  auVar107._8_4_ = auVar111._8_4_ ^ 0x80000000;
  auVar107._12_4_ = auVar111._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar107;
  local_1e0._0_16_ = auVar107;
  auVar111 = vpshufd_avx(ZEXT416(uVar84),0);
  local_320._16_16_ = auVar111;
  local_320._0_16_ = auVar111;
  auVar111 = vpshufd_avx(ZEXT416(uVar17),0);
  local_340._16_16_ = auVar111;
  local_340._0_16_ = auVar111;
  uVar86 = 0;
  fVar285 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar32,auVar316);
  _local_380 = vsubps_avx(auVar33,auVar32);
  _local_390 = vsubps_avx(_local_3a0,auVar33);
  _local_460 = vsubps_avx(_local_4d0,_local_4b0);
  auVar81._4_4_ = fVar300;
  auVar81._0_4_ = fVar282;
  auVar81._8_4_ = fVar263;
  auVar81._12_4_ = fVar283;
  _local_470 = vsubps_avx(_local_4e0,auVar81);
  auVar77._4_4_ = fVar232;
  auVar77._0_4_ = fVar280;
  auVar77._8_4_ = fVar281;
  auVar77._12_4_ = fVar262;
  _local_480 = vsubps_avx(auVar77,_local_4c0);
  auVar79._4_4_ = fVar297;
  auVar79._0_4_ = fVar260;
  auVar79._8_4_ = fVar261;
  auVar79._12_4_ = fVar298;
  _local_490 = vsubps_avx(_local_450,auVar79);
  auVar375 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar410 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00af62fd:
  do {
    local_440 = auVar410._0_16_;
    auVar364 = auVar375._0_16_;
    auVar111 = vshufps_avx(auVar364,auVar364,0x50);
    auVar400._8_4_ = 0x3f800000;
    auVar400._0_8_ = 0x3f8000003f800000;
    auVar400._12_4_ = 0x3f800000;
    auVar405._16_4_ = 0x3f800000;
    auVar405._0_16_ = auVar400;
    auVar405._20_4_ = 0x3f800000;
    auVar405._24_4_ = 0x3f800000;
    auVar405._28_4_ = 0x3f800000;
    auVar237 = vsubps_avx(auVar400,auVar111);
    fVar264 = auVar111._0_4_;
    fVar286 = auVar111._4_4_;
    fVar177 = auVar111._8_4_;
    fVar258 = auVar111._12_4_;
    fVar278 = auVar237._0_4_;
    fVar295 = auVar237._4_4_;
    fVar214 = auVar237._8_4_;
    fVar259 = auVar237._12_4_;
    auVar224._0_4_ = auVar322._0_4_ * fVar264 + fVar278 * auVar399._0_4_;
    auVar224._4_4_ = auVar322._4_4_ * fVar286 + fVar295 * auVar399._4_4_;
    auVar224._8_4_ = auVar322._0_4_ * fVar177 + fVar214 * auVar399._0_4_;
    auVar224._12_4_ = auVar322._4_4_ * fVar258 + fVar259 * auVar399._4_4_;
    auVar189._0_4_ = auVar336._0_4_ * fVar264 + auVar394._0_4_ * fVar278;
    auVar189._4_4_ = auVar336._4_4_ * fVar286 + auVar394._4_4_ * fVar295;
    auVar189._8_4_ = auVar336._0_4_ * fVar177 + auVar394._0_4_ * fVar214;
    auVar189._12_4_ = auVar336._4_4_ * fVar258 + auVar394._4_4_ * fVar259;
    auVar306._0_4_ = auVar352._0_4_ * fVar264 + auVar223._0_4_ * fVar278;
    auVar306._4_4_ = auVar352._4_4_ * fVar286 + auVar223._4_4_ * fVar295;
    auVar306._8_4_ = auVar352._0_4_ * fVar177 + auVar223._0_4_ * fVar214;
    auVar306._12_4_ = auVar352._4_4_ * fVar258 + auVar223._4_4_ * fVar259;
    auVar243._0_4_ = auVar106._0_4_ * fVar264 + auVar149._0_4_ * fVar278;
    auVar243._4_4_ = auVar106._4_4_ * fVar286 + auVar149._4_4_ * fVar295;
    auVar243._8_4_ = auVar106._0_4_ * fVar177 + auVar149._0_4_ * fVar214;
    auVar243._12_4_ = auVar106._4_4_ * fVar258 + auVar149._4_4_ * fVar259;
    auVar111 = vmovshdup_avx(local_440);
    auVar237 = vshufps_avx(local_440,local_440,0);
    auVar343._16_16_ = auVar237;
    auVar343._0_16_ = auVar237;
    auVar206 = vshufps_avx(local_440,local_440,0x55);
    auVar129._16_16_ = auVar206;
    auVar129._0_16_ = auVar206;
    auVar124 = vsubps_avx(auVar129,auVar343);
    auVar206 = vshufps_avx(auVar224,auVar224,0);
    auVar164 = vshufps_avx(auVar224,auVar224,0x55);
    auVar152 = vshufps_avx(auVar189,auVar189,0);
    auVar192 = vshufps_avx(auVar189,auVar189,0x55);
    auVar153 = vshufps_avx(auVar306,auVar306,0);
    auVar299 = vshufps_avx(auVar306,auVar306,0x55);
    auVar34 = vshufps_avx(auVar243,auVar243,0);
    auVar35 = vshufps_avx(auVar243,auVar243,0x55);
    auVar111 = ZEXT416((uint)((auVar111._0_4_ - auVar410._0_4_) * 0.04761905));
    auVar111 = vshufps_avx(auVar111,auVar111,0);
    auVar362._0_4_ = auVar237._0_4_ + auVar124._0_4_ * 0.0;
    auVar362._4_4_ = auVar237._4_4_ + auVar124._4_4_ * 0.14285715;
    auVar362._8_4_ = auVar237._8_4_ + auVar124._8_4_ * 0.2857143;
    auVar362._12_4_ = auVar237._12_4_ + auVar124._12_4_ * 0.42857146;
    auVar362._16_4_ = auVar237._0_4_ + auVar124._16_4_ * 0.5714286;
    auVar362._20_4_ = auVar237._4_4_ + auVar124._20_4_ * 0.71428573;
    auVar362._24_4_ = auVar237._8_4_ + auVar124._24_4_ * 0.8571429;
    auVar362._28_4_ = auVar237._12_4_ + auVar124._28_4_;
    auVar26 = vsubps_avx(auVar405,auVar362);
    fVar264 = auVar152._0_4_;
    fVar177 = auVar152._4_4_;
    fVar278 = auVar152._8_4_;
    fVar214 = auVar152._12_4_;
    fVar334 = auVar26._0_4_;
    fVar345 = auVar26._4_4_;
    fVar346 = auVar26._8_4_;
    fVar347 = auVar26._12_4_;
    fVar348 = auVar26._16_4_;
    fVar349 = auVar26._20_4_;
    fVar350 = auVar26._24_4_;
    fVar330 = auVar192._0_4_;
    fVar331 = auVar192._4_4_;
    fVar332 = auVar192._8_4_;
    fVar333 = auVar192._12_4_;
    fVar398 = auVar164._12_4_ + 1.0;
    fVar284 = auVar153._0_4_;
    fVar312 = auVar153._4_4_;
    fVar313 = auVar153._8_4_;
    fVar329 = auVar153._12_4_;
    fVar279 = fVar284 * auVar362._0_4_ + fVar334 * fVar264;
    fVar296 = fVar312 * auVar362._4_4_ + fVar345 * fVar177;
    fVar137 = fVar313 * auVar362._8_4_ + fVar346 * fVar278;
    fVar301 = fVar329 * auVar362._12_4_ + fVar347 * fVar214;
    fVar138 = fVar284 * auVar362._16_4_ + fVar348 * fVar264;
    fVar139 = fVar312 * auVar362._20_4_ + fVar349 * fVar177;
    fVar140 = fVar313 * auVar362._24_4_ + fVar350 * fVar278;
    fVar286 = auVar299._0_4_;
    fVar258 = auVar299._4_4_;
    fVar295 = auVar299._8_4_;
    fVar259 = auVar299._12_4_;
    fVar376 = fVar330 * fVar334 + auVar362._0_4_ * fVar286;
    fVar385 = fVar331 * fVar345 + auVar362._4_4_ * fVar258;
    fVar386 = fVar332 * fVar346 + auVar362._8_4_ * fVar295;
    fVar387 = fVar333 * fVar347 + auVar362._12_4_ * fVar259;
    fVar388 = fVar330 * fVar348 + auVar362._16_4_ * fVar286;
    fVar389 = fVar331 * fVar349 + auVar362._20_4_ * fVar258;
    fVar390 = fVar332 * fVar350 + auVar362._24_4_ * fVar295;
    fVar391 = fVar333 + fVar214;
    auVar237 = vshufps_avx(auVar224,auVar224,0xaa);
    auVar152 = vshufps_avx(auVar224,auVar224,0xff);
    fVar233 = fVar329 + 0.0;
    auVar192 = vshufps_avx(auVar189,auVar189,0xaa);
    auVar153 = vshufps_avx(auVar189,auVar189,0xff);
    auVar256._0_4_ =
         fVar334 * (auVar362._0_4_ * fVar264 + fVar334 * auVar206._0_4_) + auVar362._0_4_ * fVar279;
    auVar256._4_4_ =
         fVar345 * (auVar362._4_4_ * fVar177 + fVar345 * auVar206._4_4_) + auVar362._4_4_ * fVar296;
    auVar256._8_4_ =
         fVar346 * (auVar362._8_4_ * fVar278 + fVar346 * auVar206._8_4_) + auVar362._8_4_ * fVar137;
    auVar256._12_4_ =
         fVar347 * (auVar362._12_4_ * fVar214 + fVar347 * auVar206._12_4_) +
         auVar362._12_4_ * fVar301;
    auVar256._16_4_ =
         fVar348 * (auVar362._16_4_ * fVar264 + fVar348 * auVar206._0_4_) +
         auVar362._16_4_ * fVar138;
    auVar256._20_4_ =
         fVar349 * (auVar362._20_4_ * fVar177 + fVar349 * auVar206._4_4_) +
         auVar362._20_4_ * fVar139;
    auVar256._24_4_ =
         fVar350 * (auVar362._24_4_ * fVar278 + fVar350 * auVar206._8_4_) +
         auVar362._24_4_ * fVar140;
    auVar256._28_4_ = auVar206._12_4_ + 1.0 + fVar259;
    auVar276._0_4_ =
         fVar334 * (fVar330 * auVar362._0_4_ + auVar164._0_4_ * fVar334) + auVar362._0_4_ * fVar376;
    auVar276._4_4_ =
         fVar345 * (fVar331 * auVar362._4_4_ + auVar164._4_4_ * fVar345) + auVar362._4_4_ * fVar385;
    auVar276._8_4_ =
         fVar346 * (fVar332 * auVar362._8_4_ + auVar164._8_4_ * fVar346) + auVar362._8_4_ * fVar386;
    auVar276._12_4_ =
         fVar347 * (fVar333 * auVar362._12_4_ + auVar164._12_4_ * fVar347) +
         auVar362._12_4_ * fVar387;
    auVar276._16_4_ =
         fVar348 * (fVar330 * auVar362._16_4_ + auVar164._0_4_ * fVar348) +
         auVar362._16_4_ * fVar388;
    auVar276._20_4_ =
         fVar349 * (fVar331 * auVar362._20_4_ + auVar164._4_4_ * fVar349) +
         auVar362._20_4_ * fVar389;
    auVar276._24_4_ =
         fVar350 * (fVar332 * auVar362._24_4_ + auVar164._8_4_ * fVar350) +
         auVar362._24_4_ * fVar390;
    auVar276._28_4_ = auVar35._12_4_ + fVar259;
    auVar130._0_4_ =
         fVar334 * fVar279 + auVar362._0_4_ * (fVar284 * fVar334 + auVar34._0_4_ * auVar362._0_4_);
    auVar130._4_4_ =
         fVar345 * fVar296 + auVar362._4_4_ * (fVar312 * fVar345 + auVar34._4_4_ * auVar362._4_4_);
    auVar130._8_4_ =
         fVar346 * fVar137 + auVar362._8_4_ * (fVar313 * fVar346 + auVar34._8_4_ * auVar362._8_4_);
    auVar130._12_4_ =
         fVar347 * fVar301 +
         auVar362._12_4_ * (fVar329 * fVar347 + auVar34._12_4_ * auVar362._12_4_);
    auVar130._16_4_ =
         fVar348 * fVar138 + auVar362._16_4_ * (fVar284 * fVar348 + auVar34._0_4_ * auVar362._16_4_)
    ;
    auVar130._20_4_ =
         fVar349 * fVar139 + auVar362._20_4_ * (fVar312 * fVar349 + auVar34._4_4_ * auVar362._20_4_)
    ;
    auVar130._24_4_ =
         fVar350 * fVar140 + auVar362._24_4_ * (fVar313 * fVar350 + auVar34._8_4_ * auVar362._24_4_)
    ;
    auVar130._28_4_ = fVar214 + 1.0 + fVar233;
    auVar374._0_4_ =
         fVar334 * fVar376 + auVar362._0_4_ * (auVar35._0_4_ * auVar362._0_4_ + fVar334 * fVar286);
    auVar374._4_4_ =
         fVar345 * fVar385 + auVar362._4_4_ * (auVar35._4_4_ * auVar362._4_4_ + fVar345 * fVar258);
    auVar374._8_4_ =
         fVar346 * fVar386 + auVar362._8_4_ * (auVar35._8_4_ * auVar362._8_4_ + fVar346 * fVar295);
    auVar374._12_4_ =
         fVar347 * fVar387 +
         auVar362._12_4_ * (auVar35._12_4_ * auVar362._12_4_ + fVar347 * fVar259);
    auVar374._16_4_ =
         fVar348 * fVar388 + auVar362._16_4_ * (auVar35._0_4_ * auVar362._16_4_ + fVar348 * fVar286)
    ;
    auVar374._20_4_ =
         fVar349 * fVar389 + auVar362._20_4_ * (auVar35._4_4_ * auVar362._20_4_ + fVar349 * fVar258)
    ;
    auVar374._24_4_ =
         fVar350 * fVar390 + auVar362._24_4_ * (auVar35._8_4_ * auVar362._24_4_ + fVar350 * fVar295)
    ;
    auVar374._28_4_ = fVar233 + fVar259 + 0.0;
    local_220._0_4_ = fVar334 * auVar256._0_4_ + auVar362._0_4_ * auVar130._0_4_;
    local_220._4_4_ = fVar345 * auVar256._4_4_ + auVar362._4_4_ * auVar130._4_4_;
    local_220._8_4_ = fVar346 * auVar256._8_4_ + auVar362._8_4_ * auVar130._8_4_;
    local_220._12_4_ = fVar347 * auVar256._12_4_ + auVar362._12_4_ * auVar130._12_4_;
    local_220._16_4_ = fVar348 * auVar256._16_4_ + auVar362._16_4_ * auVar130._16_4_;
    local_220._20_4_ = fVar349 * auVar256._20_4_ + auVar362._20_4_ * auVar130._20_4_;
    local_220._24_4_ = fVar350 * auVar256._24_4_ + auVar362._24_4_ * auVar130._24_4_;
    local_220._28_4_ = fVar391 + fVar259 + 0.0;
    auVar231._0_4_ = fVar334 * auVar276._0_4_ + auVar362._0_4_ * auVar374._0_4_;
    auVar231._4_4_ = fVar345 * auVar276._4_4_ + auVar362._4_4_ * auVar374._4_4_;
    auVar231._8_4_ = fVar346 * auVar276._8_4_ + auVar362._8_4_ * auVar374._8_4_;
    auVar231._12_4_ = fVar347 * auVar276._12_4_ + auVar362._12_4_ * auVar374._12_4_;
    auVar231._16_4_ = fVar348 * auVar276._16_4_ + auVar362._16_4_ * auVar374._16_4_;
    auVar231._20_4_ = fVar349 * auVar276._20_4_ + auVar362._20_4_ * auVar374._20_4_;
    auVar231._24_4_ = fVar350 * auVar276._24_4_ + auVar362._24_4_ * auVar374._24_4_;
    auVar231._28_4_ = fVar391 + fVar233;
    auVar27 = vsubps_avx(auVar130,auVar256);
    auVar124 = vsubps_avx(auVar374,auVar276);
    local_640 = auVar111._0_4_;
    fStack_63c = auVar111._4_4_;
    fStack_638 = auVar111._8_4_;
    fStack_634 = auVar111._12_4_;
    local_260 = local_640 * auVar27._0_4_ * 3.0;
    fStack_25c = fStack_63c * auVar27._4_4_ * 3.0;
    auVar38._4_4_ = fStack_25c;
    auVar38._0_4_ = local_260;
    fStack_258 = fStack_638 * auVar27._8_4_ * 3.0;
    auVar38._8_4_ = fStack_258;
    fStack_254 = fStack_634 * auVar27._12_4_ * 3.0;
    auVar38._12_4_ = fStack_254;
    fStack_250 = local_640 * auVar27._16_4_ * 3.0;
    auVar38._16_4_ = fStack_250;
    fStack_24c = fStack_63c * auVar27._20_4_ * 3.0;
    auVar38._20_4_ = fStack_24c;
    fStack_248 = fStack_638 * auVar27._24_4_ * 3.0;
    auVar38._24_4_ = fStack_248;
    auVar38._28_4_ = auVar27._28_4_;
    local_280 = local_640 * auVar124._0_4_ * 3.0;
    fStack_27c = fStack_63c * auVar124._4_4_ * 3.0;
    auVar39._4_4_ = fStack_27c;
    auVar39._0_4_ = local_280;
    fStack_278 = fStack_638 * auVar124._8_4_ * 3.0;
    auVar39._8_4_ = fStack_278;
    fStack_274 = fStack_634 * auVar124._12_4_ * 3.0;
    auVar39._12_4_ = fStack_274;
    fStack_270 = local_640 * auVar124._16_4_ * 3.0;
    auVar39._16_4_ = fStack_270;
    fStack_26c = fStack_63c * auVar124._20_4_ * 3.0;
    auVar39._20_4_ = fStack_26c;
    fStack_268 = fStack_638 * auVar124._24_4_ * 3.0;
    auVar39._24_4_ = fStack_268;
    auVar39._28_4_ = fVar391;
    auVar24 = vsubps_avx(local_220,auVar38);
    auVar124 = vperm2f128_avx(auVar24,auVar24,1);
    auVar124 = vshufps_avx(auVar124,auVar24,0x30);
    auVar124 = vshufps_avx(auVar24,auVar124,0x29);
    auVar25 = vsubps_avx(auVar231,auVar39);
    auVar24 = vperm2f128_avx(auVar25,auVar25,1);
    auVar24 = vshufps_avx(auVar24,auVar25,0x30);
    auVar25 = vshufps_avx(auVar25,auVar24,0x29);
    fVar389 = auVar192._0_4_;
    fVar390 = auVar192._4_4_;
    fVar411 = auVar192._8_4_;
    fVar214 = auVar237._12_4_;
    fVar312 = auVar153._0_4_;
    fVar329 = auVar153._4_4_;
    fVar376 = auVar153._8_4_;
    fVar385 = auVar153._12_4_;
    auVar111 = vshufps_avx(auVar306,auVar306,0xaa);
    fVar264 = auVar111._0_4_;
    fVar177 = auVar111._4_4_;
    fVar278 = auVar111._8_4_;
    fVar259 = auVar111._12_4_;
    fVar137 = auVar362._0_4_ * fVar264 + fVar389 * fVar334;
    fVar301 = auVar362._4_4_ * fVar177 + fVar390 * fVar345;
    fVar138 = auVar362._8_4_ * fVar278 + fVar411 * fVar346;
    fVar139 = auVar362._12_4_ * fVar259 + auVar192._12_4_ * fVar347;
    fVar140 = auVar362._16_4_ * fVar264 + fVar389 * fVar348;
    fVar233 = auVar362._20_4_ * fVar177 + fVar390 * fVar349;
    fVar284 = auVar362._24_4_ * fVar278 + fVar411 * fVar350;
    auVar111 = vshufps_avx(auVar306,auVar306,0xff);
    fVar286 = auVar111._0_4_;
    fVar258 = auVar111._4_4_;
    fVar295 = auVar111._8_4_;
    fVar279 = auVar111._12_4_;
    fVar313 = auVar362._0_4_ * fVar286 + fVar312 * fVar334;
    fVar330 = auVar362._4_4_ * fVar258 + fVar329 * fVar345;
    fVar331 = auVar362._8_4_ * fVar295 + fVar376 * fVar346;
    fVar332 = auVar362._12_4_ * fVar279 + fVar385 * fVar347;
    fVar386 = auVar362._16_4_ * fVar286 + fVar312 * fVar348;
    fVar333 = auVar362._20_4_ * fVar258 + fVar329 * fVar349;
    fVar387 = auVar362._24_4_ * fVar295 + fVar376 * fVar350;
    auVar111 = vshufps_avx(auVar243,auVar243,0xaa);
    fVar388 = auVar111._12_4_ + fVar259;
    auVar206 = vshufps_avx(auVar243,auVar243,0xff);
    fVar296 = auVar206._12_4_;
    auVar131._0_4_ =
         fVar334 * (fVar389 * auVar362._0_4_ + fVar334 * auVar237._0_4_) + auVar362._0_4_ * fVar137;
    auVar131._4_4_ =
         fVar345 * (fVar390 * auVar362._4_4_ + fVar345 * auVar237._4_4_) + auVar362._4_4_ * fVar301;
    auVar131._8_4_ =
         fVar346 * (fVar411 * auVar362._8_4_ + fVar346 * auVar237._8_4_) + auVar362._8_4_ * fVar138;
    auVar131._12_4_ =
         fVar347 * (auVar192._12_4_ * auVar362._12_4_ + fVar347 * fVar214) +
         auVar362._12_4_ * fVar139;
    auVar131._16_4_ =
         fVar348 * (fVar389 * auVar362._16_4_ + fVar348 * auVar237._0_4_) +
         auVar362._16_4_ * fVar140;
    auVar131._20_4_ =
         fVar349 * (fVar390 * auVar362._20_4_ + fVar349 * auVar237._4_4_) +
         auVar362._20_4_ * fVar233;
    auVar131._24_4_ =
         fVar350 * (fVar411 * auVar362._24_4_ + fVar350 * auVar237._8_4_) +
         auVar362._24_4_ * fVar284;
    auVar131._28_4_ = auVar25._28_4_ + fVar214 + fVar296;
    auVar173._0_4_ =
         fVar334 * (fVar312 * auVar362._0_4_ + auVar152._0_4_ * fVar334) + auVar362._0_4_ * fVar313;
    auVar173._4_4_ =
         fVar345 * (fVar329 * auVar362._4_4_ + auVar152._4_4_ * fVar345) + auVar362._4_4_ * fVar330;
    auVar173._8_4_ =
         fVar346 * (fVar376 * auVar362._8_4_ + auVar152._8_4_ * fVar346) + auVar362._8_4_ * fVar331;
    auVar173._12_4_ =
         fVar347 * (fVar385 * auVar362._12_4_ + auVar152._12_4_ * fVar347) +
         auVar362._12_4_ * fVar332;
    auVar173._16_4_ =
         fVar348 * (fVar312 * auVar362._16_4_ + auVar152._0_4_ * fVar348) +
         auVar362._16_4_ * fVar386;
    auVar173._20_4_ =
         fVar349 * (fVar329 * auVar362._20_4_ + auVar152._4_4_ * fVar349) +
         auVar362._20_4_ * fVar333;
    auVar173._24_4_ =
         fVar350 * (fVar376 * auVar362._24_4_ + auVar152._8_4_ * fVar350) +
         auVar362._24_4_ * fVar387;
    auVar173._28_4_ = fVar214 + auVar24._28_4_ + fVar296;
    auVar24 = vperm2f128_avx(local_220,local_220,1);
    auVar24 = vshufps_avx(auVar24,local_220,0x30);
    auVar28 = vshufps_avx(local_220,auVar24,0x29);
    auVar277._0_4_ =
         auVar362._0_4_ * (auVar111._0_4_ * auVar362._0_4_ + fVar334 * fVar264) + fVar334 * fVar137;
    auVar277._4_4_ =
         auVar362._4_4_ * (auVar111._4_4_ * auVar362._4_4_ + fVar345 * fVar177) + fVar345 * fVar301;
    auVar277._8_4_ =
         auVar362._8_4_ * (auVar111._8_4_ * auVar362._8_4_ + fVar346 * fVar278) + fVar346 * fVar138;
    auVar277._12_4_ =
         auVar362._12_4_ * (auVar111._12_4_ * auVar362._12_4_ + fVar347 * fVar259) +
         fVar347 * fVar139;
    auVar277._16_4_ =
         auVar362._16_4_ * (auVar111._0_4_ * auVar362._16_4_ + fVar348 * fVar264) +
         fVar348 * fVar140;
    auVar277._20_4_ =
         auVar362._20_4_ * (auVar111._4_4_ * auVar362._20_4_ + fVar349 * fVar177) +
         fVar349 * fVar233;
    auVar277._24_4_ =
         auVar362._24_4_ * (auVar111._8_4_ * auVar362._24_4_ + fVar350 * fVar278) +
         fVar350 * fVar284;
    auVar277._28_4_ = fVar388 + fVar398 + auVar276._28_4_;
    auVar328._0_4_ =
         fVar334 * fVar313 + auVar362._0_4_ * (auVar362._0_4_ * auVar206._0_4_ + fVar334 * fVar286);
    auVar328._4_4_ =
         fVar345 * fVar330 + auVar362._4_4_ * (auVar362._4_4_ * auVar206._4_4_ + fVar345 * fVar258);
    auVar328._8_4_ =
         fVar346 * fVar331 + auVar362._8_4_ * (auVar362._8_4_ * auVar206._8_4_ + fVar346 * fVar295);
    auVar328._12_4_ =
         fVar347 * fVar332 + auVar362._12_4_ * (auVar362._12_4_ * fVar296 + fVar347 * fVar279);
    auVar328._16_4_ =
         fVar348 * fVar386 +
         auVar362._16_4_ * (auVar362._16_4_ * auVar206._0_4_ + fVar348 * fVar286);
    auVar328._20_4_ =
         fVar349 * fVar333 +
         auVar362._20_4_ * (auVar362._20_4_ * auVar206._4_4_ + fVar349 * fVar258);
    auVar328._24_4_ =
         fVar350 * fVar387 +
         auVar362._24_4_ * (auVar362._24_4_ * auVar206._8_4_ + fVar350 * fVar295);
    auVar328._28_4_ = fVar398 + fVar385 + fVar296 + fVar279;
    auVar311._0_4_ = fVar334 * auVar131._0_4_ + auVar362._0_4_ * auVar277._0_4_;
    auVar311._4_4_ = fVar345 * auVar131._4_4_ + auVar362._4_4_ * auVar277._4_4_;
    auVar311._8_4_ = fVar346 * auVar131._8_4_ + auVar362._8_4_ * auVar277._8_4_;
    auVar311._12_4_ = fVar347 * auVar131._12_4_ + auVar362._12_4_ * auVar277._12_4_;
    auVar311._16_4_ = fVar348 * auVar131._16_4_ + auVar362._16_4_ * auVar277._16_4_;
    auVar311._20_4_ = fVar349 * auVar131._20_4_ + auVar362._20_4_ * auVar277._20_4_;
    auVar311._24_4_ = fVar350 * auVar131._24_4_ + auVar362._24_4_ * auVar277._24_4_;
    auVar311._28_4_ = fVar388 + fVar296 + fVar279;
    auVar344._0_4_ = fVar334 * auVar173._0_4_ + auVar362._0_4_ * auVar328._0_4_;
    auVar344._4_4_ = fVar345 * auVar173._4_4_ + auVar362._4_4_ * auVar328._4_4_;
    auVar344._8_4_ = fVar346 * auVar173._8_4_ + auVar362._8_4_ * auVar328._8_4_;
    auVar344._12_4_ = fVar347 * auVar173._12_4_ + auVar362._12_4_ * auVar328._12_4_;
    auVar344._16_4_ = fVar348 * auVar173._16_4_ + auVar362._16_4_ * auVar328._16_4_;
    auVar344._20_4_ = fVar349 * auVar173._20_4_ + auVar362._20_4_ * auVar328._20_4_;
    auVar344._24_4_ = fVar350 * auVar173._24_4_ + auVar362._24_4_ * auVar328._24_4_;
    auVar344._28_4_ = auVar26._28_4_ + auVar362._28_4_;
    auVar31 = vsubps_avx(auVar277,auVar131);
    auVar24 = vsubps_avx(auVar328,auVar173);
    local_2a0 = local_640 * auVar31._0_4_ * 3.0;
    fStack_29c = fStack_63c * auVar31._4_4_ * 3.0;
    auVar40._4_4_ = fStack_29c;
    auVar40._0_4_ = local_2a0;
    fStack_298 = fStack_638 * auVar31._8_4_ * 3.0;
    auVar40._8_4_ = fStack_298;
    fStack_294 = fStack_634 * auVar31._12_4_ * 3.0;
    auVar40._12_4_ = fStack_294;
    fStack_290 = local_640 * auVar31._16_4_ * 3.0;
    auVar40._16_4_ = fStack_290;
    fStack_28c = fStack_63c * auVar31._20_4_ * 3.0;
    auVar40._20_4_ = fStack_28c;
    fStack_288 = fStack_638 * auVar31._24_4_ * 3.0;
    auVar40._24_4_ = fStack_288;
    auVar40._28_4_ = auVar31._28_4_;
    local_2c0 = local_640 * auVar24._0_4_ * 3.0;
    fStack_2bc = fStack_63c * auVar24._4_4_ * 3.0;
    auVar41._4_4_ = fStack_2bc;
    auVar41._0_4_ = local_2c0;
    fStack_2b8 = fStack_638 * auVar24._8_4_ * 3.0;
    auVar41._8_4_ = fStack_2b8;
    fStack_2b4 = fStack_634 * auVar24._12_4_ * 3.0;
    auVar41._12_4_ = fStack_2b4;
    fStack_2b0 = local_640 * auVar24._16_4_ * 3.0;
    auVar41._16_4_ = fStack_2b0;
    fStack_2ac = fStack_63c * auVar24._20_4_ * 3.0;
    auVar41._20_4_ = fStack_2ac;
    fStack_2a8 = fStack_638 * auVar24._24_4_ * 3.0;
    auVar41._24_4_ = fStack_2a8;
    auVar41._28_4_ = auVar277._28_4_;
    auVar24 = vperm2f128_avx(auVar311,auVar311,1);
    auVar24 = vshufps_avx(auVar24,auVar311,0x30);
    auVar29 = vshufps_avx(auVar311,auVar24,0x29);
    auVar26 = vsubps_avx(auVar311,auVar40);
    auVar24 = vperm2f128_avx(auVar26,auVar26,1);
    auVar24 = vshufps_avx(auVar24,auVar26,0x30);
    auVar24 = vshufps_avx(auVar26,auVar24,0x29);
    auVar30 = vsubps_avx(auVar344,auVar41);
    auVar26 = vperm2f128_avx(auVar30,auVar30,1);
    auVar26 = vshufps_avx(auVar26,auVar30,0x30);
    local_200 = vshufps_avx(auVar30,auVar26,0x29);
    auVar36 = vsubps_avx(auVar311,local_220);
    auVar37 = vsubps_avx(auVar29,auVar28);
    fVar264 = auVar37._0_4_ + auVar36._0_4_;
    fVar286 = auVar37._4_4_ + auVar36._4_4_;
    fVar177 = auVar37._8_4_ + auVar36._8_4_;
    fVar258 = auVar37._12_4_ + auVar36._12_4_;
    fVar278 = auVar37._16_4_ + auVar36._16_4_;
    fVar295 = auVar37._20_4_ + auVar36._20_4_;
    fVar214 = auVar37._24_4_ + auVar36._24_4_;
    auVar26 = vperm2f128_avx(auVar231,auVar231,1);
    auVar26 = vshufps_avx(auVar26,auVar231,0x30);
    local_240 = vshufps_avx(auVar231,auVar26,0x29);
    auVar26 = vperm2f128_avx(auVar344,auVar344,1);
    auVar26 = vshufps_avx(auVar26,auVar344,0x30);
    auVar30 = vshufps_avx(auVar344,auVar26,0x29);
    auVar26 = vsubps_avx(auVar344,auVar231);
    auVar122 = vsubps_avx(auVar30,local_240);
    fVar259 = auVar122._0_4_ + auVar26._0_4_;
    fVar279 = auVar122._4_4_ + auVar26._4_4_;
    fVar296 = auVar122._8_4_ + auVar26._8_4_;
    fVar137 = auVar122._12_4_ + auVar26._12_4_;
    fVar301 = auVar122._16_4_ + auVar26._16_4_;
    fVar138 = auVar122._20_4_ + auVar26._20_4_;
    fVar139 = auVar122._24_4_ + auVar26._24_4_;
    auVar42._4_4_ = fVar286 * auVar231._4_4_;
    auVar42._0_4_ = fVar264 * auVar231._0_4_;
    auVar42._8_4_ = fVar177 * auVar231._8_4_;
    auVar42._12_4_ = fVar258 * auVar231._12_4_;
    auVar42._16_4_ = fVar278 * auVar231._16_4_;
    auVar42._20_4_ = fVar295 * auVar231._20_4_;
    auVar42._24_4_ = fVar214 * auVar231._24_4_;
    auVar42._28_4_ = auVar26._28_4_;
    auVar43._4_4_ = fVar279 * local_220._4_4_;
    auVar43._0_4_ = fVar259 * local_220._0_4_;
    auVar43._8_4_ = fVar296 * local_220._8_4_;
    auVar43._12_4_ = fVar137 * local_220._12_4_;
    auVar43._16_4_ = fVar301 * local_220._16_4_;
    auVar43._20_4_ = fVar138 * local_220._20_4_;
    auVar43._24_4_ = fVar139 * local_220._24_4_;
    auVar43._28_4_ = fVar388;
    auVar123 = vsubps_avx(auVar42,auVar43);
    local_260 = local_220._0_4_ + local_260;
    fStack_25c = local_220._4_4_ + fStack_25c;
    fStack_258 = local_220._8_4_ + fStack_258;
    fStack_254 = local_220._12_4_ + fStack_254;
    fStack_250 = local_220._16_4_ + fStack_250;
    fStack_24c = local_220._20_4_ + fStack_24c;
    fStack_248 = local_220._24_4_ + fStack_248;
    fStack_244 = local_220._28_4_ + auVar27._28_4_;
    local_280 = local_280 + auVar231._0_4_;
    fStack_27c = fStack_27c + auVar231._4_4_;
    fStack_278 = fStack_278 + auVar231._8_4_;
    fStack_274 = fStack_274 + auVar231._12_4_;
    fStack_270 = fStack_270 + auVar231._16_4_;
    fStack_26c = fStack_26c + auVar231._20_4_;
    fStack_268 = fStack_268 + auVar231._24_4_;
    fStack_264 = fVar391 + auVar231._28_4_;
    auVar44._4_4_ = fVar286 * fStack_27c;
    auVar44._0_4_ = fVar264 * local_280;
    auVar44._8_4_ = fVar177 * fStack_278;
    auVar44._12_4_ = fVar258 * fStack_274;
    auVar44._16_4_ = fVar278 * fStack_270;
    auVar44._20_4_ = fVar295 * fStack_26c;
    auVar44._24_4_ = fVar214 * fStack_268;
    auVar44._28_4_ = fVar391;
    auVar45._4_4_ = fVar279 * fStack_25c;
    auVar45._0_4_ = fVar259 * local_260;
    auVar45._8_4_ = fVar296 * fStack_258;
    auVar45._12_4_ = fVar137 * fStack_254;
    auVar45._16_4_ = fVar301 * fStack_250;
    auVar45._20_4_ = fVar138 * fStack_24c;
    auVar45._24_4_ = fVar139 * fStack_248;
    auVar45._28_4_ = fVar391 + auVar231._28_4_;
    auVar27 = vsubps_avx(auVar44,auVar45);
    local_6a0 = auVar25._0_4_;
    fStack_69c = auVar25._4_4_;
    fStack_698 = auVar25._8_4_;
    fStack_694 = auVar25._12_4_;
    fStack_690 = auVar25._16_4_;
    fStack_68c = auVar25._20_4_;
    fStack_688 = auVar25._24_4_;
    auVar46._4_4_ = fVar286 * fStack_69c;
    auVar46._0_4_ = fVar264 * local_6a0;
    auVar46._8_4_ = fVar177 * fStack_698;
    auVar46._12_4_ = fVar258 * fStack_694;
    auVar46._16_4_ = fVar278 * fStack_690;
    auVar46._20_4_ = fVar295 * fStack_68c;
    auVar46._24_4_ = fVar214 * fStack_688;
    auVar46._28_4_ = fVar391;
    local_720._0_4_ = auVar124._0_4_;
    local_720._4_4_ = auVar124._4_4_;
    fStack_718 = auVar124._8_4_;
    fStack_714 = auVar124._12_4_;
    fStack_710 = auVar124._16_4_;
    fStack_70c = auVar124._20_4_;
    fStack_708 = auVar124._24_4_;
    auVar47._4_4_ = fVar279 * (float)local_720._4_4_;
    auVar47._0_4_ = fVar259 * (float)local_720._0_4_;
    auVar47._8_4_ = fVar296 * fStack_718;
    auVar47._12_4_ = fVar137 * fStack_714;
    auVar47._16_4_ = fVar301 * fStack_710;
    auVar47._20_4_ = fVar138 * fStack_70c;
    auVar47._24_4_ = fVar139 * fStack_708;
    auVar47._28_4_ = local_220._28_4_;
    auVar125 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = local_240._4_4_ * fVar286;
    auVar48._0_4_ = local_240._0_4_ * fVar264;
    auVar48._8_4_ = local_240._8_4_ * fVar177;
    auVar48._12_4_ = local_240._12_4_ * fVar258;
    auVar48._16_4_ = local_240._16_4_ * fVar278;
    auVar48._20_4_ = local_240._20_4_ * fVar295;
    auVar48._24_4_ = local_240._24_4_ * fVar214;
    auVar48._28_4_ = fVar391;
    auVar49._4_4_ = auVar28._4_4_ * fVar279;
    auVar49._0_4_ = auVar28._0_4_ * fVar259;
    auVar49._8_4_ = auVar28._8_4_ * fVar296;
    auVar49._12_4_ = auVar28._12_4_ * fVar137;
    auVar49._16_4_ = auVar28._16_4_ * fVar301;
    auVar49._20_4_ = auVar28._20_4_ * fVar138;
    auVar49._24_4_ = auVar28._24_4_ * fVar139;
    auVar49._28_4_ = local_240._28_4_;
    local_640 = auVar24._0_4_;
    fStack_63c = auVar24._4_4_;
    fStack_638 = auVar24._8_4_;
    fStack_634 = auVar24._12_4_;
    fStack_630 = auVar24._16_4_;
    fStack_62c = auVar24._20_4_;
    fStack_628 = auVar24._24_4_;
    auVar126 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = auVar344._4_4_ * fVar286;
    auVar50._0_4_ = auVar344._0_4_ * fVar264;
    auVar50._8_4_ = auVar344._8_4_ * fVar177;
    auVar50._12_4_ = auVar344._12_4_ * fVar258;
    auVar50._16_4_ = auVar344._16_4_ * fVar278;
    auVar50._20_4_ = auVar344._20_4_ * fVar295;
    auVar50._24_4_ = auVar344._24_4_ * fVar214;
    auVar50._28_4_ = fVar391;
    auVar51._4_4_ = fVar279 * auVar311._4_4_;
    auVar51._0_4_ = fVar259 * auVar311._0_4_;
    auVar51._8_4_ = fVar296 * auVar311._8_4_;
    auVar51._12_4_ = fVar137 * auVar311._12_4_;
    auVar51._16_4_ = fVar301 * auVar311._16_4_;
    auVar51._20_4_ = fVar138 * auVar311._20_4_;
    auVar51._24_4_ = fVar139 * auVar311._24_4_;
    auVar51._28_4_ = fStack_244;
    auVar127 = vsubps_avx(auVar50,auVar51);
    local_2a0 = auVar311._0_4_ + local_2a0;
    fStack_29c = auVar311._4_4_ + fStack_29c;
    fStack_298 = auVar311._8_4_ + fStack_298;
    fStack_294 = auVar311._12_4_ + fStack_294;
    fStack_290 = auVar311._16_4_ + fStack_290;
    fStack_28c = auVar311._20_4_ + fStack_28c;
    fStack_288 = auVar311._24_4_ + fStack_288;
    fStack_284 = auVar311._28_4_ + auVar31._28_4_;
    local_2c0 = auVar344._0_4_ + local_2c0;
    fStack_2bc = auVar344._4_4_ + fStack_2bc;
    fStack_2b8 = auVar344._8_4_ + fStack_2b8;
    fStack_2b4 = auVar344._12_4_ + fStack_2b4;
    fStack_2b0 = auVar344._16_4_ + fStack_2b0;
    fStack_2ac = auVar344._20_4_ + fStack_2ac;
    fStack_2a8 = auVar344._24_4_ + fStack_2a8;
    fStack_2a4 = auVar344._28_4_ + auVar277._28_4_;
    auVar52._4_4_ = fVar286 * fStack_2bc;
    auVar52._0_4_ = fVar264 * local_2c0;
    auVar52._8_4_ = fVar177 * fStack_2b8;
    auVar52._12_4_ = fVar258 * fStack_2b4;
    auVar52._16_4_ = fVar278 * fStack_2b0;
    auVar52._20_4_ = fVar295 * fStack_2ac;
    auVar52._24_4_ = fVar214 * fStack_2a8;
    auVar52._28_4_ = auVar344._28_4_ + auVar277._28_4_;
    auVar53._4_4_ = fStack_29c * fVar279;
    auVar53._0_4_ = local_2a0 * fVar259;
    auVar53._8_4_ = fStack_298 * fVar296;
    auVar53._12_4_ = fStack_294 * fVar137;
    auVar53._16_4_ = fStack_290 * fVar301;
    auVar53._20_4_ = fStack_28c * fVar138;
    auVar53._24_4_ = fStack_288 * fVar139;
    auVar53._28_4_ = fStack_284;
    auVar31 = vsubps_avx(auVar52,auVar53);
    auVar54._4_4_ = fVar286 * local_200._4_4_;
    auVar54._0_4_ = fVar264 * local_200._0_4_;
    auVar54._8_4_ = fVar177 * local_200._8_4_;
    auVar54._12_4_ = fVar258 * local_200._12_4_;
    auVar54._16_4_ = fVar278 * local_200._16_4_;
    auVar54._20_4_ = fVar295 * local_200._20_4_;
    auVar54._24_4_ = fVar214 * local_200._24_4_;
    auVar54._28_4_ = fStack_284;
    auVar55._4_4_ = fVar279 * fStack_63c;
    auVar55._0_4_ = fVar259 * local_640;
    auVar55._8_4_ = fVar296 * fStack_638;
    auVar55._12_4_ = fVar137 * fStack_634;
    auVar55._16_4_ = fVar301 * fStack_630;
    auVar55._20_4_ = fVar138 * fStack_62c;
    auVar55._24_4_ = fVar139 * fStack_628;
    auVar55._28_4_ = local_200._28_4_;
    auVar128 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = fVar286 * auVar30._4_4_;
    auVar56._0_4_ = fVar264 * auVar30._0_4_;
    auVar56._8_4_ = fVar177 * auVar30._8_4_;
    auVar56._12_4_ = fVar258 * auVar30._12_4_;
    auVar56._16_4_ = fVar278 * auVar30._16_4_;
    auVar56._20_4_ = fVar295 * auVar30._20_4_;
    auVar56._24_4_ = fVar214 * auVar30._24_4_;
    auVar56._28_4_ = auVar37._28_4_ + auVar36._28_4_;
    auVar57._4_4_ = auVar29._4_4_ * fVar279;
    auVar57._0_4_ = auVar29._0_4_ * fVar259;
    auVar57._8_4_ = auVar29._8_4_ * fVar296;
    auVar57._12_4_ = auVar29._12_4_ * fVar137;
    auVar57._16_4_ = auVar29._16_4_ * fVar301;
    auVar57._20_4_ = auVar29._20_4_ * fVar138;
    auVar57._24_4_ = auVar29._24_4_ * fVar139;
    auVar57._28_4_ = auVar122._28_4_ + auVar26._28_4_;
    auVar36 = vsubps_avx(auVar56,auVar57);
    auVar24 = vminps_avx(auVar123,auVar27);
    auVar124 = vmaxps_avx(auVar123,auVar27);
    auVar25 = vminps_avx(auVar125,auVar126);
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar125,auVar126);
    auVar124 = vmaxps_avx(auVar124,auVar24);
    auVar26 = vminps_avx(auVar127,auVar31);
    auVar24 = vmaxps_avx(auVar127,auVar31);
    auVar27 = vminps_avx(auVar128,auVar36);
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar27 = vminps_avx(auVar25,auVar27);
    auVar25 = vmaxps_avx(auVar128,auVar36);
    auVar24 = vmaxps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar124,auVar24);
    auVar124 = vcmpps_avx(auVar27,local_1c0,2);
    auVar24 = vcmpps_avx(auVar24,local_1e0,5);
    auVar124 = vandps_avx(auVar24,auVar124);
    auVar24 = local_2e0 & auVar124;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar24 = vsubps_avx(auVar28,local_220);
      auVar25 = vsubps_avx(auVar29,auVar311);
      fVar286 = auVar24._0_4_ + auVar25._0_4_;
      fVar177 = auVar24._4_4_ + auVar25._4_4_;
      fVar258 = auVar24._8_4_ + auVar25._8_4_;
      fVar278 = auVar24._12_4_ + auVar25._12_4_;
      fVar295 = auVar24._16_4_ + auVar25._16_4_;
      fVar214 = auVar24._20_4_ + auVar25._20_4_;
      fVar259 = auVar24._24_4_ + auVar25._24_4_;
      auVar27 = vsubps_avx(local_240,auVar231);
      auVar31 = vsubps_avx(auVar30,auVar344);
      fVar279 = auVar27._0_4_ + auVar31._0_4_;
      fVar296 = auVar27._4_4_ + auVar31._4_4_;
      fVar137 = auVar27._8_4_ + auVar31._8_4_;
      fVar301 = auVar27._12_4_ + auVar31._12_4_;
      fVar138 = auVar27._16_4_ + auVar31._16_4_;
      fVar139 = auVar27._20_4_ + auVar31._20_4_;
      fVar140 = auVar27._24_4_ + auVar31._24_4_;
      fVar264 = auVar31._28_4_;
      auVar58._4_4_ = auVar231._4_4_ * fVar177;
      auVar58._0_4_ = auVar231._0_4_ * fVar286;
      auVar58._8_4_ = auVar231._8_4_ * fVar258;
      auVar58._12_4_ = auVar231._12_4_ * fVar278;
      auVar58._16_4_ = auVar231._16_4_ * fVar295;
      auVar58._20_4_ = auVar231._20_4_ * fVar214;
      auVar58._24_4_ = auVar231._24_4_ * fVar259;
      auVar58._28_4_ = auVar231._28_4_;
      auVar59._4_4_ = local_220._4_4_ * fVar296;
      auVar59._0_4_ = local_220._0_4_ * fVar279;
      auVar59._8_4_ = local_220._8_4_ * fVar137;
      auVar59._12_4_ = local_220._12_4_ * fVar301;
      auVar59._16_4_ = local_220._16_4_ * fVar138;
      auVar59._20_4_ = local_220._20_4_ * fVar139;
      auVar59._24_4_ = local_220._24_4_ * fVar140;
      auVar59._28_4_ = local_220._28_4_;
      auVar31 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = fVar177 * fStack_27c;
      auVar60._0_4_ = fVar286 * local_280;
      auVar60._8_4_ = fVar258 * fStack_278;
      auVar60._12_4_ = fVar278 * fStack_274;
      auVar60._16_4_ = fVar295 * fStack_270;
      auVar60._20_4_ = fVar214 * fStack_26c;
      auVar60._24_4_ = fVar259 * fStack_268;
      auVar60._28_4_ = auVar231._28_4_;
      auVar61._4_4_ = fVar296 * fStack_25c;
      auVar61._0_4_ = fVar279 * local_260;
      auVar61._8_4_ = fVar137 * fStack_258;
      auVar61._12_4_ = fVar301 * fStack_254;
      auVar61._16_4_ = fVar138 * fStack_250;
      auVar61._20_4_ = fVar139 * fStack_24c;
      auVar61._24_4_ = fVar140 * fStack_248;
      auVar61._28_4_ = fVar264;
      auVar36 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar177 * fStack_69c;
      auVar62._0_4_ = fVar286 * local_6a0;
      auVar62._8_4_ = fVar258 * fStack_698;
      auVar62._12_4_ = fVar278 * fStack_694;
      auVar62._16_4_ = fVar295 * fStack_690;
      auVar62._20_4_ = fVar214 * fStack_68c;
      auVar62._24_4_ = fVar259 * fStack_688;
      auVar62._28_4_ = fVar264;
      auVar63._4_4_ = fVar296 * (float)local_720._4_4_;
      auVar63._0_4_ = fVar279 * (float)local_720._0_4_;
      auVar63._8_4_ = fVar137 * fStack_718;
      auVar63._12_4_ = fVar301 * fStack_714;
      auVar63._16_4_ = fVar138 * fStack_710;
      auVar63._20_4_ = fVar139 * fStack_70c;
      auVar63._24_4_ = fVar140 * fStack_708;
      auVar63._28_4_ = auVar26._28_4_;
      auVar37 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = local_240._4_4_ * fVar177;
      auVar64._0_4_ = local_240._0_4_ * fVar286;
      auVar64._8_4_ = local_240._8_4_ * fVar258;
      auVar64._12_4_ = local_240._12_4_ * fVar278;
      auVar64._16_4_ = local_240._16_4_ * fVar295;
      auVar64._20_4_ = local_240._20_4_ * fVar214;
      auVar64._24_4_ = local_240._24_4_ * fVar259;
      auVar64._28_4_ = auVar26._28_4_;
      auVar65._4_4_ = auVar28._4_4_ * fVar296;
      auVar65._0_4_ = auVar28._0_4_ * fVar279;
      auVar65._8_4_ = auVar28._8_4_ * fVar137;
      auVar65._12_4_ = auVar28._12_4_ * fVar301;
      auVar65._16_4_ = auVar28._16_4_ * fVar138;
      auVar65._20_4_ = auVar28._20_4_ * fVar139;
      uVar93 = auVar28._28_4_;
      auVar65._24_4_ = auVar28._24_4_ * fVar140;
      auVar65._28_4_ = uVar93;
      auVar28 = vsubps_avx(auVar64,auVar65);
      auVar66._4_4_ = auVar344._4_4_ * fVar177;
      auVar66._0_4_ = auVar344._0_4_ * fVar286;
      auVar66._8_4_ = auVar344._8_4_ * fVar258;
      auVar66._12_4_ = auVar344._12_4_ * fVar278;
      auVar66._16_4_ = auVar344._16_4_ * fVar295;
      auVar66._20_4_ = auVar344._20_4_ * fVar214;
      auVar66._24_4_ = auVar344._24_4_ * fVar259;
      auVar66._28_4_ = uVar93;
      auVar67._4_4_ = auVar311._4_4_ * fVar296;
      auVar67._0_4_ = auVar311._0_4_ * fVar279;
      auVar67._8_4_ = auVar311._8_4_ * fVar137;
      auVar67._12_4_ = auVar311._12_4_ * fVar301;
      auVar67._16_4_ = auVar311._16_4_ * fVar138;
      auVar67._20_4_ = auVar311._20_4_ * fVar139;
      auVar67._24_4_ = auVar311._24_4_ * fVar140;
      auVar67._28_4_ = auVar311._28_4_;
      auVar122 = vsubps_avx(auVar66,auVar67);
      auVar68._4_4_ = fVar177 * fStack_2bc;
      auVar68._0_4_ = fVar286 * local_2c0;
      auVar68._8_4_ = fVar258 * fStack_2b8;
      auVar68._12_4_ = fVar278 * fStack_2b4;
      auVar68._16_4_ = fVar295 * fStack_2b0;
      auVar68._20_4_ = fVar214 * fStack_2ac;
      auVar68._24_4_ = fVar259 * fStack_2a8;
      auVar68._28_4_ = uVar93;
      auVar69._4_4_ = fVar296 * fStack_29c;
      auVar69._0_4_ = fVar279 * local_2a0;
      auVar69._8_4_ = fVar137 * fStack_298;
      auVar69._12_4_ = fVar301 * fStack_294;
      auVar69._16_4_ = fVar138 * fStack_290;
      auVar69._20_4_ = fVar139 * fStack_28c;
      auVar69._24_4_ = fVar140 * fStack_288;
      auVar69._28_4_ = auVar344._28_4_;
      auVar123 = vsubps_avx(auVar68,auVar69);
      auVar70._4_4_ = fVar177 * local_200._4_4_;
      auVar70._0_4_ = fVar286 * local_200._0_4_;
      auVar70._8_4_ = fVar258 * local_200._8_4_;
      auVar70._12_4_ = fVar278 * local_200._12_4_;
      auVar70._16_4_ = fVar295 * local_200._16_4_;
      auVar70._20_4_ = fVar214 * local_200._20_4_;
      auVar70._24_4_ = fVar259 * local_200._24_4_;
      auVar70._28_4_ = auVar344._28_4_;
      auVar71._4_4_ = fStack_63c * fVar296;
      auVar71._0_4_ = local_640 * fVar279;
      auVar71._8_4_ = fStack_638 * fVar137;
      auVar71._12_4_ = fStack_634 * fVar301;
      auVar71._16_4_ = fStack_630 * fVar138;
      auVar71._20_4_ = fStack_62c * fVar139;
      auVar71._24_4_ = fStack_628 * fVar140;
      auVar71._28_4_ = local_240._28_4_;
      auVar125 = vsubps_avx(auVar70,auVar71);
      auVar72._4_4_ = fVar177 * auVar30._4_4_;
      auVar72._0_4_ = fVar286 * auVar30._0_4_;
      auVar72._8_4_ = fVar258 * auVar30._8_4_;
      auVar72._12_4_ = fVar278 * auVar30._12_4_;
      auVar72._16_4_ = fVar295 * auVar30._16_4_;
      auVar72._20_4_ = fVar214 * auVar30._20_4_;
      auVar72._24_4_ = fVar259 * auVar30._24_4_;
      auVar72._28_4_ = auVar24._28_4_ + auVar25._28_4_;
      auVar73._4_4_ = auVar29._4_4_ * fVar296;
      auVar73._0_4_ = auVar29._0_4_ * fVar279;
      auVar73._8_4_ = auVar29._8_4_ * fVar137;
      auVar73._12_4_ = auVar29._12_4_ * fVar301;
      auVar73._16_4_ = auVar29._16_4_ * fVar138;
      auVar73._20_4_ = auVar29._20_4_ * fVar139;
      auVar73._24_4_ = auVar29._24_4_ * fVar140;
      auVar73._28_4_ = auVar27._28_4_ + fVar264;
      auVar29 = vsubps_avx(auVar72,auVar73);
      auVar25 = vminps_avx(auVar31,auVar36);
      auVar24 = vmaxps_avx(auVar31,auVar36);
      auVar26 = vminps_avx(auVar37,auVar28);
      auVar26 = vminps_avx(auVar25,auVar26);
      auVar25 = vmaxps_avx(auVar37,auVar28);
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar27 = vminps_avx(auVar122,auVar123);
      auVar25 = vmaxps_avx(auVar122,auVar123);
      auVar28 = vminps_avx(auVar125,auVar29);
      auVar27 = vminps_avx(auVar27,auVar28);
      auVar27 = vminps_avx(auVar26,auVar27);
      auVar26 = vmaxps_avx(auVar125,auVar29);
      auVar25 = vmaxps_avx(auVar25,auVar26);
      auVar25 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vcmpps_avx(auVar27,local_1c0,2);
      auVar25 = vcmpps_avx(auVar25,local_1e0,5);
      auVar24 = vandps_avx(auVar25,auVar24);
      auVar124 = vandps_avx(local_2e0,auVar124);
      auVar25 = auVar124 & auVar24;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar124 = vandps_avx(auVar24,auVar124);
        uVar83 = vmovmskps_avx(auVar124);
        if (uVar83 != 0) {
          auStack_4a0[uVar86] = uVar83 & 0xff;
          uVar5 = vmovlps_avx(local_440);
          *(undefined8 *)(afStack_360 + uVar86 * 2) = uVar5;
          uVar6 = vmovlps_avx(auVar364);
          auStack_1a0[uVar86] = uVar6;
          uVar86 = (ulong)((int)uVar86 + 1);
        }
      }
    }
LAB_00af696c:
    do {
      do {
        do {
          do {
            if ((int)uVar86 == 0) {
              uVar93 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar136._4_4_ = uVar93;
              auVar136._0_4_ = uVar93;
              auVar136._8_4_ = uVar93;
              auVar136._12_4_ = uVar93;
              auVar136._16_4_ = uVar93;
              auVar136._20_4_ = uVar93;
              auVar136._24_4_ = uVar93;
              auVar136._28_4_ = uVar93;
              auVar124 = vcmpps_avx(local_300,auVar136,2);
              uVar84 = vmovmskps_avx(auVar124);
              uVar85 = (ulong)((uint)uVar85 & (uint)uVar85 + 0xff & uVar84);
              auVar111 = ZEXT816(0) << 0x40;
              goto LAB_00af5627;
            }
            uVar87 = (int)uVar86 - 1;
            uVar89 = (ulong)uVar87;
            uVar83 = auStack_4a0[uVar89];
            fVar264 = afStack_360[uVar89 * 2];
            fVar286 = afStack_360[uVar89 * 2 + 1];
            auVar365._8_8_ = 0;
            auVar365._0_8_ = auStack_1a0[uVar89];
            auVar375 = ZEXT1664(auVar365);
            uVar6 = 0;
            if (uVar83 != 0) {
              for (; (uVar83 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar83 = uVar83 - 1 & uVar83;
            auStack_4a0[uVar89] = uVar83;
            if (uVar83 == 0) {
              uVar86 = (ulong)uVar87;
            }
            fVar258 = (float)(uVar6 + 1) * 0.14285715;
            fVar177 = (1.0 - (float)uVar6 * 0.14285715) * fVar264 +
                      fVar286 * (float)uVar6 * 0.14285715;
            fVar264 = (1.0 - fVar258) * fVar264 + fVar286 * fVar258;
            fVar286 = fVar264 - fVar177;
            if (0.16666667 <= fVar286) {
              auVar111 = vinsertps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar264),0x10);
              auVar410 = ZEXT1664(auVar111);
              goto LAB_00af62fd;
            }
            auVar111 = vshufps_avx(auVar365,auVar365,0x50);
            auVar150._8_4_ = 0x3f800000;
            auVar150._0_8_ = 0x3f8000003f800000;
            auVar150._12_4_ = 0x3f800000;
            auVar237 = vsubps_avx(auVar150,auVar111);
            fVar258 = auVar111._0_4_;
            fVar278 = auVar111._4_4_;
            fVar295 = auVar111._8_4_;
            fVar214 = auVar111._12_4_;
            fVar259 = auVar237._0_4_;
            fVar279 = auVar237._4_4_;
            fVar296 = auVar237._8_4_;
            fVar137 = auVar237._12_4_;
            auVar190._0_4_ = fVar258 * auVar322._0_4_ + fVar259 * auVar399._0_4_;
            auVar190._4_4_ = fVar278 * auVar322._4_4_ + fVar279 * auVar399._4_4_;
            auVar190._8_4_ = fVar295 * auVar322._0_4_ + fVar296 * auVar399._0_4_;
            auVar190._12_4_ = fVar214 * auVar322._4_4_ + fVar137 * auVar399._4_4_;
            auVar244._0_4_ = auVar336._0_4_ * fVar258 + auVar394._0_4_ * fVar259;
            auVar244._4_4_ = auVar336._4_4_ * fVar278 + auVar394._4_4_ * fVar279;
            auVar244._8_4_ = auVar336._0_4_ * fVar295 + auVar394._0_4_ * fVar296;
            auVar244._12_4_ = auVar336._4_4_ * fVar214 + auVar394._4_4_ * fVar137;
            auVar269._0_4_ = auVar352._0_4_ * fVar258 + auVar223._0_4_ * fVar259;
            auVar269._4_4_ = auVar352._4_4_ * fVar278 + auVar223._4_4_ * fVar279;
            auVar269._8_4_ = auVar352._0_4_ * fVar295 + auVar223._0_4_ * fVar296;
            auVar269._12_4_ = auVar352._4_4_ * fVar214 + auVar223._4_4_ * fVar137;
            auVar108._0_4_ = auVar106._0_4_ * fVar258 + auVar149._0_4_ * fVar259;
            auVar108._4_4_ = auVar106._4_4_ * fVar278 + auVar149._4_4_ * fVar279;
            auVar108._8_4_ = auVar106._0_4_ * fVar295 + auVar149._0_4_ * fVar296;
            auVar108._12_4_ = auVar106._4_4_ * fVar214 + auVar149._4_4_ * fVar137;
            auVar174._16_16_ = auVar190;
            auVar174._0_16_ = auVar190;
            auVar211._16_16_ = auVar244;
            auVar211._0_16_ = auVar244;
            auVar257._16_16_ = auVar269;
            auVar257._0_16_ = auVar269;
            auVar124 = ZEXT2032(CONCAT416(fVar264,ZEXT416((uint)fVar177)));
            auVar124 = vshufps_avx(auVar124,auVar124,0);
            auVar24 = vsubps_avx(auVar211,auVar174);
            fVar258 = auVar124._0_4_;
            fVar278 = auVar124._4_4_;
            fVar295 = auVar124._8_4_;
            fVar214 = auVar124._12_4_;
            fVar259 = auVar124._16_4_;
            fVar279 = auVar124._20_4_;
            fVar296 = auVar124._24_4_;
            auVar175._0_4_ = auVar190._0_4_ + auVar24._0_4_ * fVar258;
            auVar175._4_4_ = auVar190._4_4_ + auVar24._4_4_ * fVar278;
            auVar175._8_4_ = auVar190._8_4_ + auVar24._8_4_ * fVar295;
            auVar175._12_4_ = auVar190._12_4_ + auVar24._12_4_ * fVar214;
            auVar175._16_4_ = auVar190._0_4_ + auVar24._16_4_ * fVar259;
            auVar175._20_4_ = auVar190._4_4_ + auVar24._20_4_ * fVar279;
            auVar175._24_4_ = auVar190._8_4_ + auVar24._24_4_ * fVar296;
            auVar175._28_4_ = auVar190._12_4_ + auVar24._28_4_;
            auVar124 = vsubps_avx(auVar257,auVar211);
            auVar212._0_4_ = auVar244._0_4_ + auVar124._0_4_ * fVar258;
            auVar212._4_4_ = auVar244._4_4_ + auVar124._4_4_ * fVar278;
            auVar212._8_4_ = auVar244._8_4_ + auVar124._8_4_ * fVar295;
            auVar212._12_4_ = auVar244._12_4_ + auVar124._12_4_ * fVar214;
            auVar212._16_4_ = auVar244._0_4_ + auVar124._16_4_ * fVar259;
            auVar212._20_4_ = auVar244._4_4_ + auVar124._20_4_ * fVar279;
            auVar212._24_4_ = auVar244._8_4_ + auVar124._24_4_ * fVar296;
            auVar212._28_4_ = auVar244._12_4_ + auVar124._28_4_;
            auVar111 = vsubps_avx(auVar108,auVar269);
            auVar132._0_4_ = auVar269._0_4_ + auVar111._0_4_ * fVar258;
            auVar132._4_4_ = auVar269._4_4_ + auVar111._4_4_ * fVar278;
            auVar132._8_4_ = auVar269._8_4_ + auVar111._8_4_ * fVar295;
            auVar132._12_4_ = auVar269._12_4_ + auVar111._12_4_ * fVar214;
            auVar132._16_4_ = auVar269._0_4_ + auVar111._0_4_ * fVar259;
            auVar132._20_4_ = auVar269._4_4_ + auVar111._4_4_ * fVar279;
            auVar132._24_4_ = auVar269._8_4_ + auVar111._8_4_ * fVar296;
            auVar132._28_4_ = auVar269._12_4_ + auVar111._12_4_;
            auVar124 = vsubps_avx(auVar212,auVar175);
            auVar176._0_4_ = auVar175._0_4_ + fVar258 * auVar124._0_4_;
            auVar176._4_4_ = auVar175._4_4_ + fVar278 * auVar124._4_4_;
            auVar176._8_4_ = auVar175._8_4_ + fVar295 * auVar124._8_4_;
            auVar176._12_4_ = auVar175._12_4_ + fVar214 * auVar124._12_4_;
            auVar176._16_4_ = auVar175._16_4_ + fVar259 * auVar124._16_4_;
            auVar176._20_4_ = auVar175._20_4_ + fVar279 * auVar124._20_4_;
            auVar176._24_4_ = auVar175._24_4_ + fVar296 * auVar124._24_4_;
            auVar176._28_4_ = auVar175._28_4_ + auVar124._28_4_;
            auVar124 = vsubps_avx(auVar132,auVar212);
            auVar133._0_4_ = auVar212._0_4_ + fVar258 * auVar124._0_4_;
            auVar133._4_4_ = auVar212._4_4_ + fVar278 * auVar124._4_4_;
            auVar133._8_4_ = auVar212._8_4_ + fVar295 * auVar124._8_4_;
            auVar133._12_4_ = auVar212._12_4_ + fVar214 * auVar124._12_4_;
            auVar133._16_4_ = auVar212._16_4_ + fVar259 * auVar124._16_4_;
            auVar133._20_4_ = auVar212._20_4_ + fVar279 * auVar124._20_4_;
            auVar133._24_4_ = auVar212._24_4_ + fVar296 * auVar124._24_4_;
            auVar133._28_4_ = auVar212._28_4_ + auVar124._28_4_;
            auVar124 = vsubps_avx(auVar133,auVar176);
            auVar291._0_4_ = auVar176._0_4_ + fVar258 * auVar124._0_4_;
            auVar291._4_4_ = auVar176._4_4_ + fVar278 * auVar124._4_4_;
            auVar291._8_4_ = auVar176._8_4_ + fVar295 * auVar124._8_4_;
            auVar291._12_4_ = auVar176._12_4_ + fVar214 * auVar124._12_4_;
            auVar294._16_4_ = auVar176._16_4_ + fVar259 * auVar124._16_4_;
            auVar294._0_16_ = auVar291;
            auVar294._20_4_ = auVar176._20_4_ + fVar279 * auVar124._20_4_;
            auVar294._24_4_ = auVar176._24_4_ + fVar296 * auVar124._24_4_;
            auVar294._28_4_ = auVar176._28_4_ + auVar212._28_4_;
            auVar299 = auVar294._16_16_;
            auVar152 = vshufps_avx(ZEXT416((uint)(fVar286 * 0.33333334)),
                                   ZEXT416((uint)(fVar286 * 0.33333334)),0);
            auVar245._0_4_ = auVar291._0_4_ + auVar152._0_4_ * auVar124._0_4_ * 3.0;
            auVar245._4_4_ = auVar291._4_4_ + auVar152._4_4_ * auVar124._4_4_ * 3.0;
            auVar245._8_4_ = auVar291._8_4_ + auVar152._8_4_ * auVar124._8_4_ * 3.0;
            auVar245._12_4_ = auVar291._12_4_ + auVar152._12_4_ * auVar124._12_4_ * 3.0;
            auVar206 = vshufpd_avx(auVar291,auVar291,3);
            auVar164 = vshufpd_avx(auVar299,auVar299,3);
            auVar111 = vsubps_avx(auVar206,auVar291);
            auVar237 = vsubps_avx(auVar164,auVar299);
            auVar109._0_4_ = auVar111._0_4_ + auVar237._0_4_;
            auVar109._4_4_ = auVar111._4_4_ + auVar237._4_4_;
            auVar109._8_4_ = auVar111._8_4_ + auVar237._8_4_;
            auVar109._12_4_ = auVar111._12_4_ + auVar237._12_4_;
            auVar111 = vmovshdup_avx(auVar291);
            auVar237 = vmovshdup_avx(auVar245);
            auVar192 = vshufps_avx(auVar109,auVar109,0);
            auVar153 = vshufps_avx(auVar109,auVar109,0x55);
            fVar258 = auVar153._0_4_;
            fVar278 = auVar153._4_4_;
            fVar295 = auVar153._8_4_;
            fVar214 = auVar153._12_4_;
            fVar259 = auVar192._0_4_;
            fVar279 = auVar192._4_4_;
            fVar296 = auVar192._8_4_;
            fVar137 = auVar192._12_4_;
            auVar110._0_4_ = fVar259 * auVar291._0_4_ + auVar111._0_4_ * fVar258;
            auVar110._4_4_ = fVar279 * auVar291._4_4_ + auVar111._4_4_ * fVar278;
            auVar110._8_4_ = fVar296 * auVar291._8_4_ + auVar111._8_4_ * fVar295;
            auVar110._12_4_ = fVar137 * auVar291._12_4_ + auVar111._12_4_ * fVar214;
            auVar366._0_4_ = fVar259 * auVar245._0_4_ + auVar237._0_4_ * fVar258;
            auVar366._4_4_ = fVar279 * auVar245._4_4_ + auVar237._4_4_ * fVar278;
            auVar366._8_4_ = fVar296 * auVar245._8_4_ + auVar237._8_4_ * fVar295;
            auVar366._12_4_ = fVar137 * auVar245._12_4_ + auVar237._12_4_ * fVar214;
            auVar237 = vshufps_avx(auVar110,auVar110,0xe8);
            auVar192 = vshufps_avx(auVar366,auVar366,0xe8);
            auVar111 = vcmpps_avx(auVar237,auVar192,1);
            uVar83 = vextractps_avx(auVar111,0);
            auVar153 = auVar366;
            if ((uVar83 & 1) == 0) {
              auVar153 = auVar110;
            }
            auVar151._0_4_ = auVar152._0_4_ * auVar124._16_4_ * 3.0;
            auVar151._4_4_ = auVar152._4_4_ * auVar124._20_4_ * 3.0;
            auVar151._8_4_ = auVar152._8_4_ * auVar124._24_4_ * 3.0;
            auVar151._12_4_ = auVar152._12_4_ * 0.0;
            auVar35 = vsubps_avx(auVar299,auVar151);
            auVar152 = vmovshdup_avx(auVar35);
            auVar299 = vmovshdup_avx(auVar299);
            fVar301 = auVar35._0_4_;
            fVar138 = auVar35._4_4_;
            auVar270._0_4_ = fVar301 * fVar259 + auVar152._0_4_ * fVar258;
            auVar270._4_4_ = fVar138 * fVar279 + auVar152._4_4_ * fVar278;
            auVar270._8_4_ = auVar35._8_4_ * fVar296 + auVar152._8_4_ * fVar295;
            auVar270._12_4_ = auVar35._12_4_ * fVar137 + auVar152._12_4_ * fVar214;
            auVar407._0_4_ = fVar259 * auVar294._16_4_ + auVar299._0_4_ * fVar258;
            auVar407._4_4_ = fVar279 * auVar294._20_4_ + auVar299._4_4_ * fVar278;
            auVar407._8_4_ = fVar296 * auVar294._24_4_ + auVar299._8_4_ * fVar295;
            auVar407._12_4_ = fVar137 * auVar294._28_4_ + auVar299._12_4_ * fVar214;
            auVar299 = vshufps_avx(auVar270,auVar270,0xe8);
            auVar34 = vshufps_avx(auVar407,auVar407,0xe8);
            auVar152 = vcmpps_avx(auVar299,auVar34,1);
            uVar83 = vextractps_avx(auVar152,0);
            auVar364 = auVar407;
            if ((uVar83 & 1) == 0) {
              auVar364 = auVar270;
            }
            auVar153 = vmaxss_avx(auVar364,auVar153);
            auVar237 = vminps_avx(auVar237,auVar192);
            auVar192 = vminps_avx(auVar299,auVar34);
            auVar192 = vminps_avx(auVar237,auVar192);
            auVar111 = vshufps_avx(auVar111,auVar111,0x55);
            auVar111 = vblendps_avx(auVar111,auVar152,2);
            auVar152 = vpslld_avx(auVar111,0x1f);
            auVar111 = vshufpd_avx(auVar366,auVar366,1);
            auVar111 = vinsertps_avx(auVar111,auVar407,0x9c);
            auVar237 = vshufpd_avx(auVar110,auVar110,1);
            auVar237 = vinsertps_avx(auVar237,auVar270,0x9c);
            auVar111 = vblendvps_avx(auVar237,auVar111,auVar152);
            auVar237 = vmovshdup_avx(auVar111);
            auVar111 = vmaxss_avx(auVar237,auVar111);
            fVar295 = auVar192._0_4_;
            auVar237 = vmovshdup_avx(auVar192);
            fVar278 = auVar111._0_4_;
            fVar214 = auVar237._0_4_;
            fVar258 = auVar153._0_4_;
            if ((fVar295 < 0.0001) && (-0.0001 < fVar278)) break;
            if ((fVar214 < 0.0001 && -0.0001 < fVar258) || (fVar295 < 0.0001 && -0.0001 < fVar258))
            break;
            auVar152 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar111,1);
            auVar237 = vcmpps_avx(auVar237,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar237 = vandps_avx(auVar237,auVar152);
          } while ((auVar237 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar152 = vcmpps_avx(auVar192,_DAT_01f45a50,1);
          auVar237 = vcmpss_avx(auVar153,ZEXT416(0) << 0x20,1);
          auVar191._8_4_ = 0x3f800000;
          auVar191._0_8_ = 0x3f8000003f800000;
          auVar191._12_4_ = 0x3f800000;
          auVar246._8_4_ = 0xbf800000;
          auVar246._0_8_ = 0xbf800000bf800000;
          auVar246._12_4_ = 0xbf800000;
          auVar237 = vblendvps_avx(auVar191,auVar246,auVar237);
          auVar152 = vblendvps_avx(auVar191,auVar246,auVar152);
          auVar192 = vcmpss_avx(auVar152,auVar237,4);
          auVar192 = vpshufd_avx(ZEXT416(auVar192._0_4_ & 1),0x50);
          auVar192 = vpslld_avx(auVar192,0x1f);
          auVar192 = vpsrad_avx(auVar192,0x1f);
          auVar192 = vpandn_avx(auVar192,_DAT_01f7afb0);
          auVar153 = vmovshdup_avx(auVar152);
          fVar259 = auVar153._0_4_;
          if ((auVar152._0_4_ != fVar259) || (NAN(auVar152._0_4_) || NAN(fVar259))) {
            if ((fVar214 != fVar295) || (NAN(fVar214) || NAN(fVar295))) {
              fVar295 = -fVar295 / (fVar214 - fVar295);
              auVar152 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar295) * 0.0 + fVar295)));
            }
            else {
              auVar152 = ZEXT816(0x3f80000000000000);
              if ((fVar295 != 0.0) || (NAN(fVar295))) {
                auVar152 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar299 = vcmpps_avx(auVar192,auVar152,1);
            auVar153 = vblendps_avx(auVar192,auVar152,2);
            auVar152 = vblendps_avx(auVar152,auVar192,2);
            auVar192 = vblendvps_avx(auVar152,auVar153,auVar299);
          }
          auVar111 = vcmpss_avx(auVar111,ZEXT416(0) << 0x20,1);
          auVar193._8_4_ = 0x3f800000;
          auVar193._0_8_ = 0x3f8000003f800000;
          auVar193._12_4_ = 0x3f800000;
          auVar247._8_4_ = 0xbf800000;
          auVar247._0_8_ = 0xbf800000bf800000;
          auVar247._12_4_ = 0xbf800000;
          auVar111 = vblendvps_avx(auVar193,auVar247,auVar111);
          fVar295 = auVar111._0_4_;
          if ((auVar237._0_4_ != fVar295) || (NAN(auVar237._0_4_) || NAN(fVar295))) {
            if ((fVar278 != fVar258) || (NAN(fVar278) || NAN(fVar258))) {
              fVar258 = -fVar258 / (fVar278 - fVar258);
              auVar111 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar258) * 0.0 + fVar258)));
            }
            else {
              auVar111 = ZEXT816(0x3f80000000000000);
              if ((fVar258 != 0.0) || (NAN(fVar258))) {
                auVar111 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar152 = vcmpps_avx(auVar192,auVar111,1);
            auVar237 = vblendps_avx(auVar192,auVar111,2);
            auVar111 = vblendps_avx(auVar111,auVar192,2);
            auVar192 = vblendvps_avx(auVar111,auVar237,auVar152);
          }
          if ((fVar259 != fVar295) || (NAN(fVar259) || NAN(fVar295))) {
            auVar112._8_4_ = 0x3f800000;
            auVar112._0_8_ = 0x3f8000003f800000;
            auVar112._12_4_ = 0x3f800000;
            auVar111 = vcmpps_avx(auVar192,auVar112,1);
            auVar237 = vinsertps_avx(auVar192,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar194._4_12_ = auVar192._4_12_;
            auVar194._0_4_ = 0x3f800000;
            auVar192 = vblendvps_avx(auVar194,auVar237,auVar111);
          }
          auVar111 = vcmpps_avx(auVar192,_DAT_01f46740,1);
          auVar75._12_4_ = 0;
          auVar75._0_12_ = auVar192._4_12_;
          auVar237 = vinsertps_avx(auVar192,ZEXT416(0x3f800000),0x10);
          auVar111 = vblendvps_avx(auVar237,auVar75 << 0x20,auVar111);
          auVar237 = vmovshdup_avx(auVar111);
        } while (auVar237._0_4_ < auVar111._0_4_);
        auVar113._0_4_ = auVar111._0_4_ + -0.1;
        auVar113._4_4_ = auVar111._4_4_ + 0.1;
        auVar113._8_4_ = auVar111._8_4_ + 0.0;
        auVar113._12_4_ = auVar111._12_4_ + 0.0;
        auVar152 = vshufpd_avx(auVar245,auVar245,3);
        auVar292._8_8_ = 0x3f80000000000000;
        auVar292._0_8_ = 0x3f80000000000000;
        auVar111 = vcmpps_avx(auVar113,auVar292,1);
        auVar74._12_4_ = 0;
        auVar74._0_12_ = auVar113._4_12_;
        auVar237 = vinsertps_avx(auVar113,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar111 = vblendvps_avx(auVar237,auVar74 << 0x20,auVar111);
        auVar237 = vshufpd_avx(auVar35,auVar35,3);
        auVar192 = vshufps_avx(auVar111,auVar111,0x50);
        auVar401._8_4_ = 0x3f800000;
        auVar401._0_8_ = 0x3f8000003f800000;
        auVar401._12_4_ = 0x3f800000;
        auVar153 = vsubps_avx(auVar401,auVar192);
        local_620 = auVar206._0_4_;
        fStack_61c = auVar206._4_4_;
        fStack_618 = auVar206._8_4_;
        fStack_614 = auVar206._12_4_;
        fVar258 = auVar192._0_4_;
        fVar278 = auVar192._4_4_;
        fVar295 = auVar192._8_4_;
        fVar214 = auVar192._12_4_;
        local_680 = auVar164._0_4_;
        fStack_67c = auVar164._4_4_;
        fStack_678 = auVar164._8_4_;
        fStack_674 = auVar164._12_4_;
        fVar259 = auVar153._0_4_;
        fVar279 = auVar153._4_4_;
        fVar296 = auVar153._8_4_;
        fVar137 = auVar153._12_4_;
        auVar114._0_4_ = fVar258 * local_620 + fVar259 * auVar291._0_4_;
        auVar114._4_4_ = fVar278 * fStack_61c + fVar279 * auVar291._4_4_;
        auVar114._8_4_ = fVar295 * fStack_618 + fVar296 * auVar291._0_4_;
        auVar114._12_4_ = fVar214 * fStack_614 + fVar137 * auVar291._4_4_;
        auVar271._0_4_ = auVar152._0_4_ * fVar258 + fVar259 * auVar245._0_4_;
        auVar271._4_4_ = auVar152._4_4_ * fVar278 + fVar279 * auVar245._4_4_;
        auVar271._8_4_ = auVar152._8_4_ * fVar295 + fVar296 * auVar245._0_4_;
        auVar271._12_4_ = auVar152._12_4_ * fVar214 + fVar137 * auVar245._4_4_;
        auVar307._0_4_ = auVar237._0_4_ * fVar258 + fVar259 * fVar301;
        auVar307._4_4_ = auVar237._4_4_ * fVar278 + fVar279 * fVar138;
        auVar307._8_4_ = auVar237._8_4_ * fVar295 + fVar296 * fVar301;
        auVar307._12_4_ = auVar237._12_4_ * fVar214 + fVar137 * fVar138;
        auVar353._0_4_ = fVar258 * local_680 + fVar259 * auVar294._16_4_;
        auVar353._4_4_ = fVar278 * fStack_67c + fVar279 * auVar294._20_4_;
        auVar353._8_4_ = fVar295 * fStack_678 + fVar296 * auVar294._16_4_;
        auVar353._12_4_ = fVar214 * fStack_674 + fVar137 * auVar294._20_4_;
        auVar164 = vsubps_avx(auVar401,auVar111);
        auVar237 = vmovshdup_avx(auVar365);
        auVar206 = vmovsldup_avx(auVar365);
        auVar408._0_4_ = auVar164._0_4_ * auVar206._0_4_ + auVar111._0_4_ * auVar237._0_4_;
        auVar408._4_4_ = auVar164._4_4_ * auVar206._4_4_ + auVar111._4_4_ * auVar237._4_4_;
        auVar408._8_4_ = auVar164._8_4_ * auVar206._8_4_ + auVar111._8_4_ * auVar237._8_4_;
        auVar408._12_4_ = auVar164._12_4_ * auVar206._12_4_ + auVar111._12_4_ * auVar237._12_4_;
        auVar35 = vmovshdup_avx(auVar408);
        auVar111 = vsubps_avx(auVar271,auVar114);
        auVar195._0_4_ = auVar111._0_4_ * 3.0;
        auVar195._4_4_ = auVar111._4_4_ * 3.0;
        auVar195._8_4_ = auVar111._8_4_ * 3.0;
        auVar195._12_4_ = auVar111._12_4_ * 3.0;
        auVar111 = vsubps_avx(auVar307,auVar271);
        auVar225._0_4_ = auVar111._0_4_ * 3.0;
        auVar225._4_4_ = auVar111._4_4_ * 3.0;
        auVar225._8_4_ = auVar111._8_4_ * 3.0;
        auVar225._12_4_ = auVar111._12_4_ * 3.0;
        auVar111 = vsubps_avx(auVar353,auVar307);
        auVar323._0_4_ = auVar111._0_4_ * 3.0;
        auVar323._4_4_ = auVar111._4_4_ * 3.0;
        auVar323._8_4_ = auVar111._8_4_ * 3.0;
        auVar323._12_4_ = auVar111._12_4_ * 3.0;
        auVar237 = vminps_avx(auVar225,auVar323);
        auVar111 = vmaxps_avx(auVar225,auVar323);
        auVar237 = vminps_avx(auVar195,auVar237);
        auVar111 = vmaxps_avx(auVar195,auVar111);
        auVar206 = vshufpd_avx(auVar237,auVar237,3);
        auVar164 = vshufpd_avx(auVar111,auVar111,3);
        auVar237 = vminps_avx(auVar237,auVar206);
        auVar111 = vmaxps_avx(auVar111,auVar164);
        auVar206 = vshufps_avx(ZEXT416((uint)(1.0 / fVar286)),ZEXT416((uint)(1.0 / fVar286)),0);
        auVar324._0_4_ = auVar206._0_4_ * auVar237._0_4_;
        auVar324._4_4_ = auVar206._4_4_ * auVar237._4_4_;
        auVar324._8_4_ = auVar206._8_4_ * auVar237._8_4_;
        auVar324._12_4_ = auVar206._12_4_ * auVar237._12_4_;
        auVar337._0_4_ = auVar206._0_4_ * auVar111._0_4_;
        auVar337._4_4_ = auVar206._4_4_ * auVar111._4_4_;
        auVar337._8_4_ = auVar206._8_4_ * auVar111._8_4_;
        auVar337._12_4_ = auVar206._12_4_ * auVar111._12_4_;
        auVar153 = ZEXT416((uint)(1.0 / (auVar35._0_4_ - auVar408._0_4_)));
        auVar111 = vshufpd_avx(auVar114,auVar114,3);
        auVar237 = vshufpd_avx(auVar271,auVar271,3);
        auVar206 = vshufpd_avx(auVar307,auVar307,3);
        auVar164 = vshufpd_avx(auVar353,auVar353,3);
        auVar111 = vsubps_avx(auVar111,auVar114);
        auVar152 = vsubps_avx(auVar237,auVar271);
        auVar192 = vsubps_avx(auVar206,auVar307);
        auVar164 = vsubps_avx(auVar164,auVar353);
        auVar237 = vminps_avx(auVar111,auVar152);
        auVar111 = vmaxps_avx(auVar111,auVar152);
        auVar206 = vminps_avx(auVar192,auVar164);
        auVar206 = vminps_avx(auVar237,auVar206);
        auVar237 = vmaxps_avx(auVar192,auVar164);
        auVar111 = vmaxps_avx(auVar111,auVar237);
        auVar237 = vshufps_avx(auVar153,auVar153,0);
        auVar395._0_4_ = auVar237._0_4_ * auVar206._0_4_;
        auVar395._4_4_ = auVar237._4_4_ * auVar206._4_4_;
        auVar395._8_4_ = auVar237._8_4_ * auVar206._8_4_;
        auVar395._12_4_ = auVar237._12_4_ * auVar206._12_4_;
        auVar402._0_4_ = auVar237._0_4_ * auVar111._0_4_;
        auVar402._4_4_ = auVar237._4_4_ * auVar111._4_4_;
        auVar402._8_4_ = auVar237._8_4_ * auVar111._8_4_;
        auVar402._12_4_ = auVar237._12_4_ * auVar111._12_4_;
        auVar111 = vmovsldup_avx(auVar408);
        auVar354._4_12_ = auVar111._4_12_;
        auVar354._0_4_ = fVar177;
        auVar367._4_12_ = auVar408._4_12_;
        auVar367._0_4_ = fVar264;
        auVar226._0_4_ = (fVar177 + fVar264) * 0.5;
        auVar226._4_4_ = (auVar111._4_4_ + auVar408._4_4_) * 0.5;
        auVar226._8_4_ = (auVar111._8_4_ + auVar408._8_4_) * 0.5;
        auVar226._12_4_ = (auVar111._12_4_ + auVar408._12_4_) * 0.5;
        auVar111 = vshufps_avx(auVar226,auVar226,0);
        fVar258 = auVar111._0_4_;
        fVar278 = auVar111._4_4_;
        fVar295 = auVar111._8_4_;
        fVar214 = auVar111._12_4_;
        local_6d0._0_4_ = auVar316._0_4_;
        local_6d0._4_4_ = auVar316._4_4_;
        fStack_6c8 = auVar316._8_4_;
        fStack_6c4 = auVar316._12_4_;
        auVar154._0_4_ = fVar258 * (float)local_370._0_4_ + (float)local_6d0._0_4_;
        auVar154._4_4_ = fVar278 * (float)local_370._4_4_ + (float)local_6d0._4_4_;
        auVar154._8_4_ = fVar295 * fStack_368 + fStack_6c8;
        auVar154._12_4_ = fVar214 * fStack_364 + fStack_6c4;
        local_650 = auVar32._0_4_;
        fStack_64c = auVar32._4_4_;
        fStack_648 = auVar32._8_4_;
        fStack_644 = auVar32._12_4_;
        auVar196._0_4_ = fVar258 * (float)local_380._0_4_ + local_650;
        auVar196._4_4_ = fVar278 * (float)local_380._4_4_ + fStack_64c;
        auVar196._8_4_ = fVar295 * fStack_378 + fStack_648;
        auVar196._12_4_ = fVar214 * fStack_374 + fStack_644;
        local_660 = auVar33._0_4_;
        fStack_65c = auVar33._4_4_;
        fStack_658 = auVar33._8_4_;
        fStack_654 = auVar33._12_4_;
        auVar272._0_4_ = fVar258 * (float)local_390._0_4_ + local_660;
        auVar272._4_4_ = fVar278 * (float)local_390._4_4_ + fStack_65c;
        auVar272._8_4_ = fVar295 * fStack_388 + fStack_658;
        auVar272._12_4_ = fVar214 * fStack_384 + fStack_654;
        auVar111 = vsubps_avx(auVar196,auVar154);
        auVar155._0_4_ = auVar154._0_4_ + fVar258 * auVar111._0_4_;
        auVar155._4_4_ = auVar154._4_4_ + fVar278 * auVar111._4_4_;
        auVar155._8_4_ = auVar154._8_4_ + fVar295 * auVar111._8_4_;
        auVar155._12_4_ = auVar154._12_4_ + fVar214 * auVar111._12_4_;
        auVar111 = vsubps_avx(auVar272,auVar196);
        auVar197._0_4_ = auVar196._0_4_ + fVar258 * auVar111._0_4_;
        auVar197._4_4_ = auVar196._4_4_ + fVar278 * auVar111._4_4_;
        auVar197._8_4_ = auVar196._8_4_ + fVar295 * auVar111._8_4_;
        auVar197._12_4_ = auVar196._12_4_ + fVar214 * auVar111._12_4_;
        auVar111 = vsubps_avx(auVar197,auVar155);
        fVar258 = auVar155._0_4_ + fVar258 * auVar111._0_4_;
        fVar278 = auVar155._4_4_ + fVar278 * auVar111._4_4_;
        auVar115._0_8_ = CONCAT44(fVar278,fVar258);
        auVar115._8_4_ = auVar155._8_4_ + fVar295 * auVar111._8_4_;
        auVar115._12_4_ = auVar155._12_4_ + fVar214 * auVar111._12_4_;
        fVar295 = auVar111._0_4_ * 3.0;
        fVar214 = auVar111._4_4_ * 3.0;
        auVar156._0_8_ = CONCAT44(fVar214,fVar295);
        auVar156._8_4_ = auVar111._8_4_ * 3.0;
        auVar156._12_4_ = auVar111._12_4_ * 3.0;
        auVar198._8_8_ = auVar115._0_8_;
        auVar198._0_8_ = auVar115._0_8_;
        auVar111 = vshufpd_avx(auVar115,auVar115,3);
        auVar237 = vshufps_avx(auVar226,auVar226,0x55);
        auVar192 = vsubps_avx(auVar111,auVar198);
        auVar381._0_4_ = auVar192._0_4_ * auVar237._0_4_ + fVar258;
        auVar381._4_4_ = auVar192._4_4_ * auVar237._4_4_ + fVar278;
        auVar381._8_4_ = auVar192._8_4_ * auVar237._8_4_ + fVar258;
        auVar381._12_4_ = auVar192._12_4_ * auVar237._12_4_ + fVar278;
        auVar199._8_8_ = auVar156._0_8_;
        auVar199._0_8_ = auVar156._0_8_;
        auVar111 = vshufpd_avx(auVar156,auVar156,1);
        auVar111 = vsubps_avx(auVar111,auVar199);
        auVar157._0_4_ = auVar111._0_4_ * auVar237._0_4_ + fVar295;
        auVar157._4_4_ = auVar111._4_4_ * auVar237._4_4_ + fVar214;
        auVar157._8_4_ = auVar111._8_4_ * auVar237._8_4_ + fVar295;
        auVar157._12_4_ = auVar111._12_4_ * auVar237._12_4_ + fVar214;
        auVar237 = vmovshdup_avx(auVar157);
        auVar273._0_8_ = auVar237._0_8_ ^ 0x8000000080000000;
        auVar273._8_4_ = auVar237._8_4_ ^ 0x80000000;
        auVar273._12_4_ = auVar237._12_4_ ^ 0x80000000;
        auVar206 = vmovshdup_avx(auVar192);
        auVar111 = vunpcklps_avx(auVar206,auVar273);
        auVar164 = vshufps_avx(auVar111,auVar273,4);
        auVar116._0_8_ = auVar192._0_8_ ^ 0x8000000080000000;
        auVar116._8_4_ = -auVar192._8_4_;
        auVar116._12_4_ = -auVar192._12_4_;
        auVar111 = vmovlhps_avx(auVar116,auVar157);
        auVar152 = vshufps_avx(auVar111,auVar157,8);
        auVar111 = ZEXT416((uint)(auVar157._0_4_ * auVar206._0_4_ - auVar192._0_4_ * auVar237._0_4_)
                          );
        auVar237 = vshufps_avx(auVar111,auVar111,0);
        auVar111 = vdivps_avx(auVar164,auVar237);
        auVar237 = vdivps_avx(auVar152,auVar237);
        auVar152 = vinsertps_avx(auVar324,auVar395,0x1c);
        auVar192 = vinsertps_avx(auVar337,auVar402,0x1c);
        auVar153 = vinsertps_avx(auVar395,auVar324,0x4c);
        auVar299 = vinsertps_avx(auVar402,auVar337,0x4c);
        auVar206 = vmovsldup_avx(auVar111);
        auVar200._0_4_ = auVar206._0_4_ * auVar152._0_4_;
        auVar200._4_4_ = auVar206._4_4_ * auVar152._4_4_;
        auVar200._8_4_ = auVar206._8_4_ * auVar152._8_4_;
        auVar200._12_4_ = auVar206._12_4_ * auVar152._12_4_;
        auVar158._0_4_ = auVar192._0_4_ * auVar206._0_4_;
        auVar158._4_4_ = auVar192._4_4_ * auVar206._4_4_;
        auVar158._8_4_ = auVar192._8_4_ * auVar206._8_4_;
        auVar158._12_4_ = auVar192._12_4_ * auVar206._12_4_;
        auVar164 = vminps_avx(auVar200,auVar158);
        auVar206 = vmaxps_avx(auVar158,auVar200);
        auVar34 = vmovsldup_avx(auVar237);
        auVar403._0_4_ = auVar153._0_4_ * auVar34._0_4_;
        auVar403._4_4_ = auVar153._4_4_ * auVar34._4_4_;
        auVar403._8_4_ = auVar153._8_4_ * auVar34._8_4_;
        auVar403._12_4_ = auVar153._12_4_ * auVar34._12_4_;
        auVar201._0_4_ = auVar299._0_4_ * auVar34._0_4_;
        auVar201._4_4_ = auVar299._4_4_ * auVar34._4_4_;
        auVar201._8_4_ = auVar299._8_4_ * auVar34._8_4_;
        auVar201._12_4_ = auVar299._12_4_ * auVar34._12_4_;
        auVar34 = vminps_avx(auVar403,auVar201);
        auVar248._0_4_ = auVar164._0_4_ + auVar34._0_4_;
        auVar248._4_4_ = auVar164._4_4_ + auVar34._4_4_;
        auVar248._8_4_ = auVar164._8_4_ + auVar34._8_4_;
        auVar248._12_4_ = auVar164._12_4_ + auVar34._12_4_;
        auVar164 = vmaxps_avx(auVar201,auVar403);
        auVar34 = vsubps_avx(auVar354,auVar226);
        auVar364 = vsubps_avx(auVar367,auVar226);
        auVar159._0_4_ = auVar206._0_4_ + auVar164._0_4_;
        auVar159._4_4_ = auVar206._4_4_ + auVar164._4_4_;
        auVar159._8_4_ = auVar206._8_4_ + auVar164._8_4_;
        auVar159._12_4_ = auVar206._12_4_ + auVar164._12_4_;
        auVar202._8_8_ = 0x3f800000;
        auVar202._0_8_ = 0x3f800000;
        auVar206 = vsubps_avx(auVar202,auVar159);
        auVar164 = vsubps_avx(auVar202,auVar248);
        fVar296 = auVar34._0_4_;
        auVar249._0_4_ = fVar296 * auVar206._0_4_;
        fVar137 = auVar34._4_4_;
        auVar249._4_4_ = fVar137 * auVar206._4_4_;
        fVar301 = auVar34._8_4_;
        auVar249._8_4_ = fVar301 * auVar206._8_4_;
        fVar138 = auVar34._12_4_;
        auVar249._12_4_ = fVar138 * auVar206._12_4_;
        fVar295 = auVar364._0_4_;
        auVar160._0_4_ = fVar295 * auVar206._0_4_;
        fVar214 = auVar364._4_4_;
        auVar160._4_4_ = fVar214 * auVar206._4_4_;
        fVar259 = auVar364._8_4_;
        auVar160._8_4_ = fVar259 * auVar206._8_4_;
        fVar279 = auVar364._12_4_;
        auVar160._12_4_ = fVar279 * auVar206._12_4_;
        auVar368._0_4_ = fVar296 * auVar164._0_4_;
        auVar368._4_4_ = fVar137 * auVar164._4_4_;
        auVar368._8_4_ = fVar301 * auVar164._8_4_;
        auVar368._12_4_ = fVar138 * auVar164._12_4_;
        auVar203._0_4_ = fVar295 * auVar164._0_4_;
        auVar203._4_4_ = fVar214 * auVar164._4_4_;
        auVar203._8_4_ = fVar259 * auVar164._8_4_;
        auVar203._12_4_ = fVar279 * auVar164._12_4_;
        auVar206 = vminps_avx(auVar249,auVar368);
        auVar164 = vminps_avx(auVar160,auVar203);
        auVar34 = vminps_avx(auVar206,auVar164);
        auVar206 = vmaxps_avx(auVar368,auVar249);
        auVar164 = vmaxps_avx(auVar203,auVar160);
        auVar364 = vshufps_avx(auVar226,auVar226,0x54);
        auVar164 = vmaxps_avx(auVar164,auVar206);
        auVar241 = vshufps_avx(auVar381,auVar381,0);
        auVar7 = vshufps_avx(auVar381,auVar381,0x55);
        auVar206 = vhaddps_avx(auVar34,auVar34);
        auVar164 = vhaddps_avx(auVar164,auVar164);
        auVar227._0_4_ = auVar241._0_4_ * auVar111._0_4_ + auVar7._0_4_ * auVar237._0_4_;
        auVar227._4_4_ = auVar241._4_4_ * auVar111._4_4_ + auVar7._4_4_ * auVar237._4_4_;
        auVar227._8_4_ = auVar241._8_4_ * auVar111._8_4_ + auVar7._8_4_ * auVar237._8_4_;
        auVar227._12_4_ = auVar241._12_4_ * auVar111._12_4_ + auVar7._12_4_ * auVar237._12_4_;
        auVar34 = vsubps_avx(auVar364,auVar227);
        fVar258 = auVar34._0_4_ + auVar206._0_4_;
        fVar278 = auVar34._0_4_ + auVar164._0_4_;
        auVar206 = vmaxss_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar258));
        auVar164 = vminss_avx(ZEXT416((uint)fVar278),ZEXT416((uint)fVar264));
      } while (auVar164._0_4_ < auVar206._0_4_);
      auVar206 = vmovshdup_avx(auVar111);
      auVar117._0_4_ = auVar206._0_4_ * auVar152._0_4_;
      auVar117._4_4_ = auVar206._4_4_ * auVar152._4_4_;
      auVar117._8_4_ = auVar206._8_4_ * auVar152._8_4_;
      auVar117._12_4_ = auVar206._12_4_ * auVar152._12_4_;
      auVar161._0_4_ = auVar192._0_4_ * auVar206._0_4_;
      auVar161._4_4_ = auVar192._4_4_ * auVar206._4_4_;
      auVar161._8_4_ = auVar192._8_4_ * auVar206._8_4_;
      auVar161._12_4_ = auVar192._12_4_ * auVar206._12_4_;
      auVar164 = vminps_avx(auVar117,auVar161);
      auVar206 = vmaxps_avx(auVar161,auVar117);
      auVar152 = vmovshdup_avx(auVar237);
      auVar250._0_4_ = auVar153._0_4_ * auVar152._0_4_;
      auVar250._4_4_ = auVar153._4_4_ * auVar152._4_4_;
      auVar250._8_4_ = auVar153._8_4_ * auVar152._8_4_;
      auVar250._12_4_ = auVar153._12_4_ * auVar152._12_4_;
      auVar162._0_4_ = auVar299._0_4_ * auVar152._0_4_;
      auVar162._4_4_ = auVar299._4_4_ * auVar152._4_4_;
      auVar162._8_4_ = auVar299._8_4_ * auVar152._8_4_;
      auVar162._12_4_ = auVar299._12_4_ * auVar152._12_4_;
      auVar152 = vminps_avx(auVar250,auVar162);
      auVar204._0_4_ = auVar164._0_4_ + auVar152._0_4_;
      auVar204._4_4_ = auVar164._4_4_ + auVar152._4_4_;
      auVar204._8_4_ = auVar164._8_4_ + auVar152._8_4_;
      auVar204._12_4_ = auVar164._12_4_ + auVar152._12_4_;
      auVar164 = vmaxps_avx(auVar162,auVar250);
      auVar118._0_4_ = auVar206._0_4_ + auVar164._0_4_;
      auVar118._4_4_ = auVar206._4_4_ + auVar164._4_4_;
      auVar118._8_4_ = auVar206._8_4_ + auVar164._8_4_;
      auVar118._12_4_ = auVar206._12_4_ + auVar164._12_4_;
      auVar206 = vsubps_avx(auVar292,auVar118);
      auVar164 = vsubps_avx(auVar292,auVar204);
      auVar205._0_4_ = fVar296 * auVar206._0_4_;
      auVar205._4_4_ = fVar137 * auVar206._4_4_;
      auVar205._8_4_ = fVar301 * auVar206._8_4_;
      auVar205._12_4_ = fVar138 * auVar206._12_4_;
      auVar251._0_4_ = fVar296 * auVar164._0_4_;
      auVar251._4_4_ = fVar137 * auVar164._4_4_;
      auVar251._8_4_ = fVar301 * auVar164._8_4_;
      auVar251._12_4_ = fVar138 * auVar164._12_4_;
      auVar119._0_4_ = fVar295 * auVar206._0_4_;
      auVar119._4_4_ = fVar214 * auVar206._4_4_;
      auVar119._8_4_ = fVar259 * auVar206._8_4_;
      auVar119._12_4_ = fVar279 * auVar206._12_4_;
      auVar163._0_4_ = fVar295 * auVar164._0_4_;
      auVar163._4_4_ = fVar214 * auVar164._4_4_;
      auVar163._8_4_ = fVar259 * auVar164._8_4_;
      auVar163._12_4_ = fVar279 * auVar164._12_4_;
      auVar206 = vminps_avx(auVar205,auVar251);
      auVar164 = vminps_avx(auVar119,auVar163);
      auVar206 = vminps_avx(auVar206,auVar164);
      auVar164 = vmaxps_avx(auVar251,auVar205);
      auVar152 = vmaxps_avx(auVar163,auVar119);
      auVar206 = vhaddps_avx(auVar206,auVar206);
      auVar164 = vmaxps_avx(auVar152,auVar164);
      auVar164 = vhaddps_avx(auVar164,auVar164);
      auVar152 = vmovshdup_avx(auVar34);
      auVar192 = ZEXT416((uint)(auVar152._0_4_ + auVar206._0_4_));
      auVar206 = vmaxss_avx(auVar408,auVar192);
      auVar152 = ZEXT416((uint)(auVar152._0_4_ + auVar164._0_4_));
      auVar164 = vminss_avx(auVar152,auVar35);
    } while (auVar164._0_4_ < auVar206._0_4_);
    bVar90 = 0;
    if ((fVar177 < fVar258) && (fVar278 < fVar264)) {
      auVar206 = vcmpps_avx(auVar152,auVar35,1);
      auVar164 = vcmpps_avx(auVar408,auVar192,1);
      auVar206 = vandps_avx(auVar164,auVar206);
      bVar90 = auVar206[0];
    }
    auVar338._8_4_ = 0x7fffffff;
    auVar338._0_8_ = 0x7fffffff7fffffff;
    auVar338._12_4_ = 0x7fffffff;
    if ((3 < (uint)uVar86 || fVar286 < 0.001) || (bVar90 & 1) != 0) {
      lVar88 = 0xc9;
      do {
        lVar88 = lVar88 + -1;
        if (lVar88 == 0) goto LAB_00af696c;
        fVar286 = auVar34._0_4_;
        fVar264 = 1.0 - fVar286;
        auVar206 = ZEXT416((uint)(fVar264 * fVar264 * fVar264));
        auVar206 = vshufps_avx(auVar206,auVar206,0);
        auVar164 = ZEXT416((uint)(fVar286 * 3.0 * fVar264 * fVar264));
        auVar164 = vshufps_avx(auVar164,auVar164,0);
        auVar152 = ZEXT416((uint)(fVar264 * fVar286 * fVar286 * 3.0));
        auVar152 = vshufps_avx(auVar152,auVar152,0);
        auVar192 = ZEXT416((uint)(fVar286 * fVar286 * fVar286));
        auVar192 = vshufps_avx(auVar192,auVar192,0);
        fVar264 = (float)local_6d0._0_4_ * auVar206._0_4_ +
                  local_650 * auVar164._0_4_ +
                  (float)local_3a0._0_4_ * auVar192._0_4_ + local_660 * auVar152._0_4_;
        fVar286 = (float)local_6d0._4_4_ * auVar206._4_4_ +
                  fStack_64c * auVar164._4_4_ +
                  (float)local_3a0._4_4_ * auVar192._4_4_ + fStack_65c * auVar152._4_4_;
        auVar120._0_8_ = CONCAT44(fVar286,fVar264);
        auVar120._8_4_ =
             fStack_6c8 * auVar206._8_4_ +
             fStack_648 * auVar164._8_4_ + fStack_398 * auVar192._8_4_ + fStack_658 * auVar152._8_4_
        ;
        auVar120._12_4_ =
             fStack_6c4 * auVar206._12_4_ +
             fStack_644 * auVar164._12_4_ +
             fStack_394 * auVar192._12_4_ + fStack_654 * auVar152._12_4_;
        auVar165._8_8_ = auVar120._0_8_;
        auVar165._0_8_ = auVar120._0_8_;
        auVar164 = vshufpd_avx(auVar120,auVar120,1);
        auVar206 = vmovshdup_avx(auVar34);
        auVar164 = vsubps_avx(auVar164,auVar165);
        auVar121._0_4_ = auVar206._0_4_ * auVar164._0_4_ + fVar264;
        auVar121._4_4_ = auVar206._4_4_ * auVar164._4_4_ + fVar286;
        auVar121._8_4_ = auVar206._8_4_ * auVar164._8_4_ + fVar264;
        auVar121._12_4_ = auVar206._12_4_ * auVar164._12_4_ + fVar286;
        auVar206 = vshufps_avx(auVar121,auVar121,0);
        auVar164 = vshufps_avx(auVar121,auVar121,0x55);
        auVar166._0_4_ = auVar111._0_4_ * auVar206._0_4_ + auVar237._0_4_ * auVar164._0_4_;
        auVar166._4_4_ = auVar111._4_4_ * auVar206._4_4_ + auVar237._4_4_ * auVar164._4_4_;
        auVar166._8_4_ = auVar111._8_4_ * auVar206._8_4_ + auVar237._8_4_ * auVar164._8_4_;
        auVar166._12_4_ = auVar111._12_4_ * auVar206._12_4_ + auVar237._12_4_ * auVar164._12_4_;
        auVar34 = vsubps_avx(auVar34,auVar166);
        auVar206 = vandps_avx(auVar338,auVar121);
        auVar164 = vshufps_avx(auVar206,auVar206,0xf5);
        auVar206 = vmaxss_avx(auVar164,auVar206);
      } while ((float)local_3b0._0_4_ <= auVar206._0_4_);
      fVar264 = auVar34._0_4_;
      if ((0.0 <= fVar264) && (fVar264 <= 1.0)) {
        auVar111 = vmovshdup_avx(auVar34);
        fVar286 = auVar111._0_4_;
        if ((0.0 <= fVar286) && (fVar286 <= 1.0)) {
          auVar111 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar299 = vinsertps_avx(auVar111,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                  );
          auVar111 = vdpps_avx(auVar299,local_3c0,0x7f);
          auVar237 = vdpps_avx(auVar299,local_3d0,0x7f);
          auVar206 = vdpps_avx(auVar299,local_3e0,0x7f);
          auVar164 = vdpps_avx(auVar299,local_3f0,0x7f);
          auVar152 = vdpps_avx(auVar299,local_400,0x7f);
          auVar192 = vdpps_avx(auVar299,local_410,0x7f);
          auVar153 = vdpps_avx(auVar299,local_420,0x7f);
          auVar299 = vdpps_avx(auVar299,local_430,0x7f);
          fVar214 = 1.0 - fVar286;
          fVar259 = 1.0 - fVar264;
          fVar177 = auVar34._4_4_;
          fVar258 = auVar34._8_4_;
          fVar278 = auVar34._12_4_;
          fVar295 = fVar259 * fVar264 * fVar264 * 3.0;
          auVar308._0_4_ = fVar264 * fVar264 * fVar264;
          auVar308._4_4_ = fVar177 * fVar177 * fVar177;
          auVar308._8_4_ = fVar258 * fVar258 * fVar258;
          auVar308._12_4_ = fVar278 * fVar278 * fVar278;
          fVar258 = fVar259 * fVar259 * fVar264 * 3.0;
          fVar278 = fVar259 * fVar259 * fVar259;
          fVar177 = fVar278 * (fVar214 * auVar111._0_4_ + fVar286 * auVar152._0_4_) +
                    (fVar214 * auVar237._0_4_ + auVar192._0_4_ * fVar286) * fVar258 +
                    fVar295 * (auVar153._0_4_ * fVar286 + fVar214 * auVar206._0_4_) +
                    auVar308._0_4_ * (fVar214 * auVar164._0_4_ + fVar286 * auVar299._0_4_);
          if (((fVar285 <= fVar177) &&
              (fVar214 = *(float *)(ray + k * 4 + 0x100), fVar177 <= fVar214)) &&
             (pGVar18 = (context->scene->geometries).items[uVar84].ptr,
             (pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
            auStack_f0 = vshufps_avx(auVar34,auVar34,0x55);
            auVar339._8_4_ = 0x3f800000;
            auVar339._0_8_ = 0x3f8000003f800000;
            auVar339._12_4_ = 0x3f800000;
            auVar111 = vsubps_avx(auVar339,auStack_f0);
            fVar279 = auStack_f0._0_4_;
            fVar296 = auStack_f0._4_4_;
            fVar137 = auStack_f0._8_4_;
            fVar301 = auStack_f0._12_4_;
            fVar138 = auVar111._0_4_;
            fVar139 = auVar111._4_4_;
            fVar140 = auVar111._8_4_;
            fVar233 = auVar111._12_4_;
            auVar355._0_4_ = fVar279 * (float)local_4d0._0_4_ + fVar138 * (float)local_4b0._0_4_;
            auVar355._4_4_ = fVar296 * (float)local_4d0._4_4_ + fVar139 * (float)local_4b0._4_4_;
            auVar355._8_4_ = fVar137 * fStack_4c8 + fVar140 * fStack_4a8;
            auVar355._12_4_ = fVar301 * fStack_4c4 + fVar233 * fStack_4a4;
            auVar369._0_4_ = fVar279 * (float)local_4e0._0_4_ + fVar138 * fVar282;
            auVar369._4_4_ = fVar296 * (float)local_4e0._4_4_ + fVar139 * fVar300;
            auVar369._8_4_ = fVar137 * fStack_4d8 + fVar140 * fVar263;
            auVar369._12_4_ = fVar301 * fStack_4d4 + fVar233 * fVar283;
            auVar382._0_4_ = fVar279 * fVar280 + fVar138 * (float)local_4c0._0_4_;
            auVar382._4_4_ = fVar296 * fVar232 + fVar139 * (float)local_4c0._4_4_;
            auVar382._8_4_ = fVar137 * fVar281 + fVar140 * fStack_4b8;
            auVar382._12_4_ = fVar301 * fVar262 + fVar233 * fStack_4b4;
            auVar340._0_4_ = fVar279 * (float)local_450._0_4_ + fVar138 * fVar260;
            auVar340._4_4_ = fVar296 * (float)local_450._4_4_ + fVar139 * fVar297;
            auVar340._8_4_ = fVar137 * fStack_448 + fVar140 * fVar261;
            auVar340._12_4_ = fVar301 * fStack_444 + fVar233 * fVar298;
            auVar164 = vsubps_avx(auVar369,auVar355);
            auVar152 = vsubps_avx(auVar382,auVar369);
            auVar192 = vsubps_avx(auVar340,auVar382);
            auStack_110 = vshufps_avx(auVar34,auVar34,0);
            fVar301 = auStack_110._0_4_;
            fVar138 = auStack_110._4_4_;
            fVar139 = auStack_110._8_4_;
            fVar140 = auStack_110._12_4_;
            auVar111 = vshufps_avx(ZEXT416((uint)fVar259),ZEXT416((uint)fVar259),0);
            fVar259 = auVar111._0_4_;
            fVar279 = auVar111._4_4_;
            fVar296 = auVar111._8_4_;
            fVar137 = auVar111._12_4_;
            auVar111 = vshufps_avx(auVar308,auVar308,0);
            auVar237 = vshufps_avx(ZEXT416((uint)fVar295),ZEXT416((uint)fVar295),0);
            auVar206 = vshufps_avx(ZEXT416((uint)fVar258),ZEXT416((uint)fVar258),0);
            auVar293._0_4_ =
                 (fVar259 * (fVar259 * auVar164._0_4_ + fVar301 * auVar152._0_4_) +
                 fVar301 * (fVar259 * auVar152._0_4_ + fVar301 * auVar192._0_4_)) * 3.0;
            auVar293._4_4_ =
                 (fVar279 * (fVar279 * auVar164._4_4_ + fVar138 * auVar152._4_4_) +
                 fVar138 * (fVar279 * auVar152._4_4_ + fVar138 * auVar192._4_4_)) * 3.0;
            auVar293._8_4_ =
                 (fVar296 * (fVar296 * auVar164._8_4_ + fVar139 * auVar152._8_4_) +
                 fVar139 * (fVar296 * auVar152._8_4_ + fVar139 * auVar192._8_4_)) * 3.0;
            auVar293._12_4_ =
                 (fVar137 * (fVar137 * auVar164._12_4_ + fVar140 * auVar152._12_4_) +
                 fVar140 * (fVar137 * auVar152._12_4_ + fVar140 * auVar192._12_4_)) * 3.0;
            auVar164 = vshufps_avx(ZEXT416((uint)fVar278),ZEXT416((uint)fVar278),0);
            auVar252._0_4_ =
                 auVar164._0_4_ * (float)local_460._0_4_ +
                 auVar206._0_4_ * (float)local_470._0_4_ +
                 auVar111._0_4_ * (float)local_490._0_4_ + auVar237._0_4_ * (float)local_480._0_4_;
            auVar252._4_4_ =
                 auVar164._4_4_ * (float)local_460._4_4_ +
                 auVar206._4_4_ * (float)local_470._4_4_ +
                 auVar111._4_4_ * (float)local_490._4_4_ + auVar237._4_4_ * (float)local_480._4_4_;
            auVar252._8_4_ =
                 auVar164._8_4_ * fStack_458 +
                 auVar206._8_4_ * fStack_468 +
                 auVar111._8_4_ * fStack_488 + auVar237._8_4_ * fStack_478;
            auVar252._12_4_ =
                 auVar164._12_4_ * fStack_454 +
                 auVar206._12_4_ * fStack_464 +
                 auVar111._12_4_ * fStack_484 + auVar237._12_4_ * fStack_474;
            auVar111 = vshufps_avx(auVar293,auVar293,0xc9);
            auVar274._0_4_ = auVar252._0_4_ * auVar111._0_4_;
            auVar274._4_4_ = auVar252._4_4_ * auVar111._4_4_;
            auVar274._8_4_ = auVar252._8_4_ * auVar111._8_4_;
            auVar274._12_4_ = auVar252._12_4_ * auVar111._12_4_;
            auVar111 = vshufps_avx(auVar252,auVar252,0xc9);
            auVar253._0_4_ = auVar293._0_4_ * auVar111._0_4_;
            auVar253._4_4_ = auVar293._4_4_ * auVar111._4_4_;
            auVar253._8_4_ = auVar293._8_4_ * auVar111._8_4_;
            auVar253._12_4_ = auVar293._12_4_ * auVar111._12_4_;
            auVar111 = vsubps_avx(auVar253,auVar274);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              auStack_170 = vshufps_avx(auVar111,auVar111,0x55);
              auStack_150 = vshufps_avx(auVar111,auVar111,0xaa);
              auStack_130 = vshufps_avx(auVar111,auVar111,0);
              local_180[0] = (RTCHitN)auStack_170[0];
              local_180[1] = (RTCHitN)auStack_170[1];
              local_180[2] = (RTCHitN)auStack_170[2];
              local_180[3] = (RTCHitN)auStack_170[3];
              local_180[4] = (RTCHitN)auStack_170[4];
              local_180[5] = (RTCHitN)auStack_170[5];
              local_180[6] = (RTCHitN)auStack_170[6];
              local_180[7] = (RTCHitN)auStack_170[7];
              local_180[8] = (RTCHitN)auStack_170[8];
              local_180[9] = (RTCHitN)auStack_170[9];
              local_180[10] = (RTCHitN)auStack_170[10];
              local_180[0xb] = (RTCHitN)auStack_170[0xb];
              local_180[0xc] = (RTCHitN)auStack_170[0xc];
              local_180[0xd] = (RTCHitN)auStack_170[0xd];
              local_180[0xe] = (RTCHitN)auStack_170[0xe];
              local_180[0xf] = (RTCHitN)auStack_170[0xf];
              local_160 = auStack_150;
              local_140 = auStack_130;
              local_120 = auStack_110;
              local_100 = auStack_f0;
              local_e0 = local_340._0_8_;
              uStack_d8 = local_340._8_8_;
              uStack_d0 = local_340._16_8_;
              uStack_c8 = local_340._24_8_;
              local_c0 = local_320;
              vcmpps_avx(local_320,local_320,0xf);
              uStack_9c = context->user->instID[0];
              local_a0 = uStack_9c;
              uStack_98 = uStack_9c;
              uStack_94 = uStack_9c;
              uStack_90 = uStack_9c;
              uStack_8c = uStack_9c;
              uStack_88 = uStack_9c;
              uStack_84 = uStack_9c;
              uStack_7c = context->user->instPrimID[0];
              local_80 = uStack_7c;
              uStack_78 = uStack_7c;
              uStack_74 = uStack_7c;
              uStack_70 = uStack_7c;
              uStack_6c = uStack_7c;
              uStack_68 = uStack_7c;
              uStack_64 = uStack_7c;
              *(float *)(ray + k * 4 + 0x100) = fVar177;
              local_540 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar91 & 0xf) << 4));
              local_530 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar91 >> 4) * 0x10)
              ;
              local_510.valid = (int *)local_540;
              local_510.geometryUserPtr = pGVar18->userPtr;
              local_510.context = context->user;
              local_510.hit = local_180;
              local_510.N = 8;
              local_510.ray = (RTCRayN *)ray;
              if (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar18->intersectionFilterN)(&local_510);
              }
              auVar111 = vpcmpeqd_avx(local_540,ZEXT816(0) << 0x40);
              auVar237 = vpcmpeqd_avx(local_530,ZEXT816(0) << 0x40);
              auVar213._16_16_ = auVar237;
              auVar213._0_16_ = auVar111;
              auVar124 = _DAT_01f7b020 & ~auVar213;
              if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar124 >> 0x7f,0) != '\0') ||
                    (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar124 >> 0xbf,0) != '\0') ||
                  (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar124[0x1f] < '\0') {
                p_Var23 = context->args->filter;
                if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar18->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var23)(&local_510);
                }
                auVar111 = vpcmpeqd_avx(local_540,ZEXT816(0) << 0x40);
                auVar237 = vpcmpeqd_avx(local_530,ZEXT816(0) << 0x40);
                auVar134._16_16_ = auVar237;
                auVar134._0_16_ = auVar111;
                auVar124 = _DAT_01f7b020 & ~auVar134;
                if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar124 >> 0x7f,0) != '\0') ||
                      (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar124 >> 0xbf,0) != '\0') ||
                    (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar124[0x1f] < '\0') {
                  auVar135._0_8_ = auVar111._0_8_ ^ 0xffffffffffffffff;
                  auVar135._8_4_ = auVar111._8_4_ ^ 0xffffffff;
                  auVar135._12_4_ = auVar111._12_4_ ^ 0xffffffff;
                  auVar135._16_4_ = auVar237._0_4_ ^ 0xffffffff;
                  auVar135._20_4_ = auVar237._4_4_ ^ 0xffffffff;
                  auVar135._24_4_ = auVar237._8_4_ ^ 0xffffffff;
                  auVar135._28_4_ = auVar237._12_4_ ^ 0xffffffff;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])local_510.hit);
                  *(undefined1 (*) [32])(local_510.ray + 0x180) = auVar124;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_510.hit + 0x20));
                  *(undefined1 (*) [32])(local_510.ray + 0x1a0) = auVar124;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_510.hit + 0x40));
                  *(undefined1 (*) [32])(local_510.ray + 0x1c0) = auVar124;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_510.hit + 0x60));
                  *(undefined1 (*) [32])(local_510.ray + 0x1e0) = auVar124;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_510.hit + 0x80));
                  *(undefined1 (*) [32])(local_510.ray + 0x200) = auVar124;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_510.hit + 0xa0));
                  *(undefined1 (*) [32])(local_510.ray + 0x220) = auVar124;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_510.hit + 0xc0));
                  *(undefined1 (*) [32])(local_510.ray + 0x240) = auVar124;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_510.hit + 0xe0));
                  *(undefined1 (*) [32])(local_510.ray + 0x260) = auVar124;
                  auVar124 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(local_510.hit + 0x100));
                  *(undefined1 (*) [32])(local_510.ray + 0x280) = auVar124;
                  goto LAB_00af696c;
                }
              }
              *(float *)(ray + k * 4 + 0x100) = fVar214;
              goto LAB_00af696c;
            }
            *(float *)(ray + k * 4 + 0x100) = fVar177;
            uVar93 = vextractps_avx(auVar111,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar93;
            uVar93 = vextractps_avx(auVar111,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar93;
            *(int *)(ray + k * 4 + 0x1c0) = auVar111._0_4_;
            *(float *)(ray + k * 4 + 0x1e0) = fVar264;
            *(float *)(ray + k * 4 + 0x200) = fVar286;
            *(uint *)(ray + k * 4 + 0x220) = uVar17;
            *(uint *)(ray + k * 4 + 0x240) = uVar84;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
        }
      }
      goto LAB_00af696c;
    }
    auVar111 = vinsertps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar264),0x10);
    auVar410 = ZEXT1664(auVar111);
    auVar375 = ZEXT1664(auVar408);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }